

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxweightst.hpp
# Opt level: O2

void __thiscall
soplex::
SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::setupWeights(SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this,SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *base)

{
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  pointer pnVar1;
  type_conflict5 tVar2;
  double *pdVar3;
  bool *pbVar4;
  uint *puVar5;
  long lVar6;
  long lVar7;
  undefined8 uVar8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg_00;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg_01;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg_02;
  cpp_dec_float<200U,_int,_void> *pcVar9;
  undefined4 *puVar10;
  type *ptVar11;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar12;
  cpp_dec_float<200U,_int,_void> *pcVar13;
  multiprecision *pmVar14;
  uint *puVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  byte bVar19;
  long lStack_15f0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_9;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_7;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  n;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_5;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_4;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_55;
  cpp_dec_float<200U,_int,_void> local_11b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  ax;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  bx;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_53;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_32;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_17;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_6;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  nne;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  r_free;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  r_fixed;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  c_fixed;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  r_bounded;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  c_bounded;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  r_dbl_bounded;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  c_dbl_bounded;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  eps;
  multiprecision local_9b0 [112];
  int local_940;
  undefined1 local_93c;
  fpclass_type local_938;
  int32_t iStack_934;
  multiprecision local_930 [112];
  int local_8c0;
  undefined1 local_8bc;
  fpclass_type local_8b8;
  int32_t iStack_8b4;
  multiprecision local_8b0 [112];
  int local_840;
  undefined1 local_83c;
  fpclass_type local_838;
  int32_t iStack_834;
  multiprecision local_830 [112];
  int local_7c0;
  undefined1 local_7bc;
  fpclass_type local_7b8;
  int32_t iStack_7b4;
  multiprecision local_7b0 [112];
  int local_740;
  undefined1 local_73c;
  fpclass_type local_738;
  int32_t iStack_734;
  multiprecision local_730 [112];
  int local_6c0;
  undefined1 local_6bc;
  fpclass_type local_6b8;
  int32_t iStack_6b4;
  multiprecision local_6b0 [112];
  int local_640;
  undefined1 local_63c;
  fpclass_type local_638;
  int32_t iStack_634;
  multiprecision local_630 [112];
  int local_5c0;
  undefined1 local_5bc;
  fpclass_type local_5b8;
  int32_t iStack_5b4;
  multiprecision local_5b0 [112];
  int local_540;
  undefined1 local_53c;
  fpclass_type local_538;
  int32_t iStack_534;
  multiprecision local_530 [112];
  int local_4c0;
  undefined1 local_4bc;
  fpclass_type local_4b8;
  int32_t iStack_4b4;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  c_free;
  multiprecision local_430 [112];
  undefined4 local_3c0;
  undefined1 local_3bc;
  undefined8 local_3b8;
  multiprecision local_3b0 [112];
  undefined4 local_340;
  undefined1 local_33c;
  undefined8 local_338;
  multiprecision local_330 [112];
  undefined4 local_2c0;
  undefined1 local_2bc;
  undefined8 local_2b8;
  multiprecision local_2b0 [112];
  undefined4 local_240;
  undefined1 local_23c;
  undefined8 local_238;
  multiprecision local_230 [112];
  undefined4 local_1c0;
  undefined1 local_1bc;
  undefined8 local_1b8;
  multiprecision local_1b0 [112];
  undefined4 local_140;
  undefined1 local_13c;
  undefined8 local_138;
  multiprecision local_130 [112];
  undefined4 local_c0;
  undefined1 local_bc;
  undefined8 local_b8;
  multiprecision local_b0 [112];
  undefined4 local_40;
  undefined1 local_3c;
  undefined8 local_38;
  
  bVar19 = 0;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::epsilon(&eps,base);
  lVar18 = 0;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (&local_11b8,1.0,(type *)0x0);
  for (lVar17 = 0;
      lVar17 < (base->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum; lVar17 = lVar17 + 1) {
    pnVar1 = (base->
             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .up.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pdVar3 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (&ax.m_backend,*pdVar3,(type *)0x0);
    tVar2 = boost::multiprecision::operator<
                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)((long)&(pnVar1->m_backend).data + lVar18),
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&ax.m_backend);
    if (tVar2) {
      pnVar1 = (base->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .up.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar10 = (undefined4 *)((long)&(pnVar1->m_backend).data + lVar18);
      pmVar14 = local_b0;
      for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
        *(undefined4 *)pmVar14 = *puVar10;
        puVar10 = puVar10 + (ulong)bVar19 * -2 + 1;
        pmVar14 = pmVar14 + (ulong)bVar19 * -8 + 4;
      }
      local_40 = *(undefined4 *)((long)&(pnVar1->m_backend).data + lVar18 + 0x70);
      local_3c = *(undefined1 *)((long)&(pnVar1->m_backend).data + lVar18 + 0x74);
      local_38 = *(undefined8 *)((long)&(pnVar1->m_backend).data + lVar18 + 0x78);
      boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&bx,local_b0,
                 (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)local_b0);
      tVar2 = boost::multiprecision::operator>
                        (&bx,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_11b8);
      if (tVar2) {
        pnVar1 = (base->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .up.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar6 = 0x1c;
        puVar10 = (undefined4 *)((long)&(pnVar1->m_backend).data + lVar18);
        pmVar14 = local_130;
        for (lVar7 = lVar6; lVar7 != 0; lVar7 = lVar7 + -1) {
          *(undefined4 *)pmVar14 = *puVar10;
          puVar10 = puVar10 + (ulong)bVar19 * -2 + 1;
          pmVar14 = pmVar14 + (ulong)bVar19 * -8 + 4;
        }
        local_c0 = *(undefined4 *)((long)&(pnVar1->m_backend).data + lVar18 + 0x70);
        local_bc = *(undefined1 *)((long)&(pnVar1->m_backend).data + lVar18 + 0x74);
        local_b8 = *(undefined8 *)((long)&(pnVar1->m_backend).data + lVar18 + 0x78);
        boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  ((type *)&ax.m_backend,local_130,
                   (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)local_130);
        pcVar9 = &ax.m_backend;
        pcVar13 = &local_11b8;
        for (; lVar6 != 0; lVar6 = lVar6 + -1) {
          (pcVar13->data)._M_elems[0] = (pcVar9->data)._M_elems[0];
          pcVar9 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar9 + (ulong)bVar19 * -8 + 4);
          pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + ((ulong)bVar19 * -2 + 1) * 4)
          ;
        }
        local_11b8.exp = ax.m_backend.exp;
        local_11b8.neg = ax.m_backend.neg;
        local_11b8.fpclass = ax.m_backend.fpclass;
        local_11b8.prec_elem = ax.m_backend.prec_elem;
      }
    }
    pnVar1 = (base->
             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .low.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pdVar3 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (&ax.m_backend,-*pdVar3,(type *)0x0);
    tVar2 = boost::multiprecision::operator>
                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)((long)&(pnVar1->m_backend).data + lVar18),
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&ax.m_backend);
    if (tVar2) {
      pnVar1 = (base->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .low.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar10 = (undefined4 *)((long)&(pnVar1->m_backend).data + lVar18);
      pmVar14 = local_1b0;
      for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
        *(undefined4 *)pmVar14 = *puVar10;
        puVar10 = puVar10 + (ulong)bVar19 * -2 + 1;
        pmVar14 = pmVar14 + (ulong)bVar19 * -8 + 4;
      }
      local_140 = *(undefined4 *)((long)&(pnVar1->m_backend).data + lVar18 + 0x70);
      local_13c = *(undefined1 *)((long)&(pnVar1->m_backend).data + lVar18 + 0x74);
      local_138 = *(undefined8 *)((long)&(pnVar1->m_backend).data + lVar18 + 0x78);
      boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&bx,local_1b0,
                 (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)local_1b0);
      tVar2 = boost::multiprecision::operator>
                        (&bx,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_11b8);
      if (tVar2) {
        pnVar1 = (base->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .low.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar6 = 0x1c;
        puVar10 = (undefined4 *)((long)&(pnVar1->m_backend).data + lVar18);
        pmVar14 = local_230;
        for (lVar7 = lVar6; lVar7 != 0; lVar7 = lVar7 + -1) {
          *(undefined4 *)pmVar14 = *puVar10;
          puVar10 = puVar10 + (ulong)bVar19 * -2 + 1;
          pmVar14 = pmVar14 + (ulong)bVar19 * -8 + 4;
        }
        local_1c0 = *(undefined4 *)((long)&(pnVar1->m_backend).data + lVar18 + 0x70);
        local_1bc = *(undefined1 *)((long)&(pnVar1->m_backend).data + lVar18 + 0x74);
        local_1b8 = *(undefined8 *)((long)&(pnVar1->m_backend).data + lVar18 + 0x78);
        boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  ((type *)&ax.m_backend,local_230,
                   (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)local_230);
        pcVar9 = &ax.m_backend;
        pcVar13 = &local_11b8;
        for (; lVar6 != 0; lVar6 = lVar6 + -1) {
          (pcVar13->data)._M_elems[0] = (pcVar9->data)._M_elems[0];
          pcVar9 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar9 + (ulong)bVar19 * -8 + 4);
          pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + ((ulong)bVar19 * -2 + 1) * 4)
          ;
        }
        local_11b8.exp = ax.m_backend.exp;
        local_11b8.neg = ax.m_backend.neg;
        local_11b8.fpclass = ax.m_backend.fpclass;
        local_11b8.prec_elem = ax.m_backend.prec_elem;
      }
    }
    lVar18 = lVar18 + 0x80;
  }
  lVar18 = 0;
  for (lVar17 = 0;
      lVar17 < (base->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum; lVar17 = lVar17 + 1) {
    pnVar1 = (base->
             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .right.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pdVar3 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (&ax.m_backend,*pdVar3,(type *)0x0);
    tVar2 = boost::multiprecision::operator<
                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)((long)&(pnVar1->m_backend).data + lVar18),
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&ax.m_backend);
    if (tVar2) {
      pnVar1 = (base->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .right.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar10 = (undefined4 *)((long)&(pnVar1->m_backend).data + lVar18);
      pmVar14 = local_2b0;
      for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
        *(undefined4 *)pmVar14 = *puVar10;
        puVar10 = puVar10 + (ulong)bVar19 * -2 + 1;
        pmVar14 = pmVar14 + (ulong)bVar19 * -8 + 4;
      }
      local_240 = *(undefined4 *)((long)&(pnVar1->m_backend).data + lVar18 + 0x70);
      local_23c = *(undefined1 *)((long)&(pnVar1->m_backend).data + lVar18 + 0x74);
      local_238 = *(undefined8 *)((long)&(pnVar1->m_backend).data + lVar18 + 0x78);
      boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&bx,local_2b0,
                 (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)local_2b0);
      tVar2 = boost::multiprecision::operator>
                        (&bx,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_11b8);
      if (tVar2) {
        pnVar1 = (base->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .right.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar6 = 0x1c;
        puVar10 = (undefined4 *)((long)&(pnVar1->m_backend).data + lVar18);
        pmVar14 = local_330;
        for (lVar7 = lVar6; lVar7 != 0; lVar7 = lVar7 + -1) {
          *(undefined4 *)pmVar14 = *puVar10;
          puVar10 = puVar10 + (ulong)bVar19 * -2 + 1;
          pmVar14 = pmVar14 + (ulong)bVar19 * -8 + 4;
        }
        local_2c0 = *(undefined4 *)((long)&(pnVar1->m_backend).data + lVar18 + 0x70);
        local_2bc = *(undefined1 *)((long)&(pnVar1->m_backend).data + lVar18 + 0x74);
        local_2b8 = *(undefined8 *)((long)&(pnVar1->m_backend).data + lVar18 + 0x78);
        boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  ((type *)&ax.m_backend,local_330,
                   (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)local_330);
        pcVar9 = &ax.m_backend;
        pcVar13 = &local_11b8;
        for (; lVar6 != 0; lVar6 = lVar6 + -1) {
          (pcVar13->data)._M_elems[0] = (pcVar9->data)._M_elems[0];
          pcVar9 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar9 + (ulong)bVar19 * -8 + 4);
          pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + ((ulong)bVar19 * -2 + 1) * 4)
          ;
        }
        local_11b8.exp = ax.m_backend.exp;
        local_11b8.neg = ax.m_backend.neg;
        local_11b8.fpclass = ax.m_backend.fpclass;
        local_11b8.prec_elem = ax.m_backend.prec_elem;
      }
    }
    pnVar1 = (base->
             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .left.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pdVar3 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (&ax.m_backend,-*pdVar3,(type *)0x0);
    tVar2 = boost::multiprecision::operator>
                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)((long)&(pnVar1->m_backend).data + lVar18),
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&ax.m_backend);
    if (tVar2) {
      pnVar1 = (base->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .left.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar10 = (undefined4 *)((long)&(pnVar1->m_backend).data + lVar18);
      pmVar14 = local_3b0;
      for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
        *(undefined4 *)pmVar14 = *puVar10;
        puVar10 = puVar10 + (ulong)bVar19 * -2 + 1;
        pmVar14 = pmVar14 + (ulong)bVar19 * -8 + 4;
      }
      local_340 = *(undefined4 *)((long)&(pnVar1->m_backend).data + lVar18 + 0x70);
      local_33c = *(undefined1 *)((long)&(pnVar1->m_backend).data + lVar18 + 0x74);
      local_338 = *(undefined8 *)((long)&(pnVar1->m_backend).data + lVar18 + 0x78);
      boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&bx,local_3b0,
                 (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)local_3b0);
      tVar2 = boost::multiprecision::operator>
                        (&bx,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_11b8);
      if (tVar2) {
        pnVar1 = (base->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .left.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar6 = 0x1c;
        puVar10 = (undefined4 *)((long)&(pnVar1->m_backend).data + lVar18);
        pmVar14 = local_430;
        for (lVar7 = lVar6; lVar7 != 0; lVar7 = lVar7 + -1) {
          *(undefined4 *)pmVar14 = *puVar10;
          puVar10 = puVar10 + (ulong)bVar19 * -2 + 1;
          pmVar14 = pmVar14 + (ulong)bVar19 * -8 + 4;
        }
        local_3c0 = *(undefined4 *)((long)&(pnVar1->m_backend).data + lVar18 + 0x70);
        local_3bc = *(undefined1 *)((long)&(pnVar1->m_backend).data + lVar18 + 0x74);
        local_3b8 = *(undefined8 *)((long)&(pnVar1->m_backend).data + lVar18 + 0x78);
        boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  ((type *)&ax.m_backend,local_430,
                   (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)local_430);
        pcVar9 = &ax.m_backend;
        pcVar13 = &local_11b8;
        for (; lVar6 != 0; lVar6 = lVar6 + -1) {
          (pcVar13->data)._M_elems[0] = (pcVar9->data)._M_elems[0];
          pcVar9 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar9 + (ulong)bVar19 * -8 + 4);
          pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + ((ulong)bVar19 * -2 + 1) * 4)
          ;
        }
        local_11b8.exp = ax.m_backend.exp;
        local_11b8.neg = ax.m_backend.neg;
        local_11b8.fpclass = ax.m_backend.fpclass;
        local_11b8.prec_elem = ax.m_backend.prec_elem;
      }
    }
    lVar18 = lVar18 + 0x80;
  }
  this_00 = &(base->
             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .object;
  if (base->theType * base->theRep < 1) {
    nne.m_backend.data._M_elems[0] = 0;
    nne.m_backend.data._M_elems[1] = 0x3ff00000;
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::maxAbs((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)&bx.m_backend,this_00);
    ax.m_backend.fpclass = cpp_dec_float_finite;
    ax.m_backend.prec_elem = 0x1c;
    ax.m_backend.data._M_elems[0] = 0;
    ax.m_backend.data._M_elems[1] = 0;
    ax.m_backend.data._M_elems[2] = 0;
    ax.m_backend.data._M_elems[3] = 0;
    ax.m_backend.data._M_elems[4] = 0;
    ax.m_backend.data._M_elems[5] = 0;
    ax.m_backend.data._M_elems[6] = 0;
    ax.m_backend.data._M_elems[7] = 0;
    ax.m_backend.data._M_elems[8] = 0;
    ax.m_backend.data._M_elems[9] = 0;
    ax.m_backend.data._M_elems[10] = 0;
    ax.m_backend.data._M_elems[0xb] = 0;
    ax.m_backend.data._M_elems[0xc] = 0;
    ax.m_backend.data._M_elems[0xd] = 0;
    ax.m_backend.data._M_elems[0xe] = 0;
    ax.m_backend.data._M_elems[0xf] = 0;
    ax.m_backend.data._M_elems[0x10] = 0;
    ax.m_backend.data._M_elems[0x11] = 0;
    ax.m_backend.data._M_elems[0x12] = 0;
    ax.m_backend.data._M_elems[0x13] = 0;
    ax.m_backend.data._M_elems[0x14] = 0;
    ax.m_backend.data._M_elems[0x15] = 0;
    ax.m_backend.data._M_elems[0x16] = 0;
    ax.m_backend.data._M_elems[0x17] = 0;
    ax.m_backend.data._M_elems[0x18] = 0;
    ax.m_backend.data._M_elems[0x19] = 0;
    ax.m_backend.data._M_elems._104_5_ = 0;
    ax.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    ax.m_backend.exp = 0;
    ax.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,double>
              (&ax.m_backend,(double *)&nne,&bx.m_backend);
    nne.m_backend.data._M_elems[0] = 0x47ae147b;
    nne.m_backend.data._M_elems[1] = 0x3f847ae1;
    bx.m_backend.fpclass = cpp_dec_float_finite;
    bx.m_backend.prec_elem = 0x1c;
    bx.m_backend.data._M_elems[0] = 0;
    bx.m_backend.data._M_elems[1] = 0;
    bx.m_backend.data._M_elems[2] = 0;
    bx.m_backend.data._M_elems[3] = 0;
    bx.m_backend.data._M_elems[4] = 0;
    bx.m_backend.data._M_elems[5] = 0;
    bx.m_backend.data._M_elems[6] = 0;
    bx.m_backend.data._M_elems[7] = 0;
    bx.m_backend.data._M_elems[8] = 0;
    bx.m_backend.data._M_elems[9] = 0;
    bx.m_backend.data._M_elems[10] = 0;
    bx.m_backend.data._M_elems[0xb] = 0;
    bx.m_backend.data._M_elems[0xc] = 0;
    bx.m_backend.data._M_elems[0xd] = 0;
    bx.m_backend.data._M_elems[0xe] = 0;
    bx.m_backend.data._M_elems[0xf] = 0;
    bx.m_backend.data._M_elems[0x10] = 0;
    bx.m_backend.data._M_elems[0x11] = 0;
    bx.m_backend.data._M_elems[0x12] = 0;
    bx.m_backend.data._M_elems[0x13] = 0;
    bx.m_backend.data._M_elems[0x14] = 0;
    bx.m_backend.data._M_elems[0x15] = 0;
    bx.m_backend.data._M_elems[0x16] = 0;
    bx.m_backend.data._M_elems[0x17] = 0;
    bx.m_backend.data._M_elems[0x18] = 0;
    bx.m_backend.data._M_elems[0x19] = 0;
    bx.m_backend.data._M_elems._104_5_ = 0;
    bx.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    bx.m_backend.exp = 0;
    bx.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,double>
              (&bx.m_backend,(double *)&nne,&local_11b8);
    c_fixed.m_backend.data._M_elems[0] = 0xeb1c432d;
    c_fixed.m_backend.data._M_elems[1] = 0x3f1a36e2;
    nne.m_backend.fpclass = cpp_dec_float_finite;
    nne.m_backend.prec_elem = 0x1c;
    nne.m_backend.data._M_elems[0] = 0;
    nne.m_backend.data._M_elems[1] = 0;
    nne.m_backend.data._M_elems[2] = 0;
    nne.m_backend.data._M_elems[3] = 0;
    nne.m_backend.data._M_elems[4] = 0;
    nne.m_backend.data._M_elems[5] = 0;
    nne.m_backend.data._M_elems[6] = 0;
    nne.m_backend.data._M_elems[7] = 0;
    nne.m_backend.data._M_elems[8] = 0;
    nne.m_backend.data._M_elems[9] = 0;
    nne.m_backend.data._M_elems[10] = 0;
    nne.m_backend.data._M_elems[0xb] = 0;
    nne.m_backend.data._M_elems[0xc] = 0;
    nne.m_backend.data._M_elems[0xd] = 0;
    nne.m_backend.data._M_elems[0xe] = 0;
    nne.m_backend.data._M_elems[0xf] = 0;
    nne.m_backend.data._M_elems[0x10] = 0;
    nne.m_backend.data._M_elems[0x11] = 0;
    nne.m_backend.data._M_elems[0x12] = 0;
    nne.m_backend.data._M_elems[0x13] = 0;
    nne.m_backend.data._M_elems[0x14] = 0;
    nne.m_backend.data._M_elems[0x15] = 0;
    nne.m_backend.data._M_elems[0x16] = 0;
    nne.m_backend.data._M_elems[0x17] = 0;
    nne.m_backend.data._M_elems[0x18] = 0;
    nne.m_backend.data._M_elems[0x19] = 0;
    nne.m_backend.data._M_elems._104_5_ = 0;
    nne.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    nne.m_backend.exp = 0;
    nne.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,double>
              (&nne.m_backend,&bx.m_backend,(double *)&c_fixed);
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (&c_fixed.m_backend,100000.0,(type *)0x0);
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (&r_fixed.m_backend,10000.0,(type *)0x0);
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
              (&c_dbl_bounded.m_backend,1,(type *)0x0);
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
              (&r_dbl_bounded.m_backend,0,(type *)0x0);
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
              (&c_bounded.m_backend,0,(type *)0x0);
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
              (&r_bounded.m_backend,0,(type *)0x0);
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (&c_free.m_backend,-10000.0,(type *)0x0);
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (&r_free.m_backend,-100000.0,(type *)0x0);
    uVar16 = (ulong)(uint)(base->
                          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .
                          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .set.thenum;
    lVar17 = uVar16 << 7;
    for (; 0 < (int)uVar16; uVar16 = uVar16 - 1) {
      x.m_backend.data._M_elems._0_8_ =
           (long)(base->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.theitem
                 [(base->
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .set.thekey[uVar16 - 1].idx].data.
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .memused + -1;
      n.m_backend.fpclass = cpp_dec_float_finite;
      n.m_backend.prec_elem = 0x1c;
      n.m_backend.data._M_elems[0] = 0;
      n.m_backend.data._M_elems[1] = 0;
      n.m_backend.data._M_elems[2] = 0;
      n.m_backend.data._M_elems[3] = 0;
      n.m_backend.data._M_elems[4] = 0;
      n.m_backend.data._M_elems[5] = 0;
      n.m_backend.data._M_elems[6] = 0;
      n.m_backend.data._M_elems[7] = 0;
      n.m_backend.data._M_elems[8] = 0;
      n.m_backend.data._M_elems[9] = 0;
      n.m_backend.data._M_elems[10] = 0;
      n.m_backend.data._M_elems[0xb] = 0;
      n.m_backend.data._M_elems[0xc] = 0;
      n.m_backend.data._M_elems[0xd] = 0;
      n.m_backend.data._M_elems[0xe] = 0;
      n.m_backend.data._M_elems[0xf] = 0;
      n.m_backend.data._M_elems[0x10] = 0;
      n.m_backend.data._M_elems[0x11] = 0;
      n.m_backend.data._M_elems[0x12] = 0;
      n.m_backend.data._M_elems[0x13] = 0;
      n.m_backend.data._M_elems[0x14] = 0;
      n.m_backend.data._M_elems[0x15] = 0;
      n.m_backend.data._M_elems[0x16] = 0;
      n.m_backend.data._M_elems[0x17] = 0;
      n.m_backend.data._M_elems[0x18] = 0;
      n.m_backend.data._M_elems[0x19] = 0;
      n.m_backend.data._M_elems._104_5_ = 0;
      n.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      n.m_backend.exp = 0;
      n.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,long_long>
                (&n.m_backend,&nne.m_backend,(longlong *)&x.m_backend);
      x.m_backend.fpclass = cpp_dec_float_finite;
      x.m_backend.prec_elem = 0x1c;
      x.m_backend.data._M_elems[0] = 0;
      x.m_backend.data._M_elems[1] = 0;
      x.m_backend.data._M_elems[2] = 0;
      x.m_backend.data._M_elems[3] = 0;
      x.m_backend.data._M_elems[4] = 0;
      x.m_backend.data._M_elems[5] = 0;
      x.m_backend.data._M_elems[6] = 0;
      x.m_backend.data._M_elems[7] = 0;
      x.m_backend.data._M_elems[8] = 0;
      x.m_backend.data._M_elems[9] = 0;
      x.m_backend.data._M_elems[10] = 0;
      x.m_backend.data._M_elems[0xb] = 0;
      x.m_backend.data._M_elems[0xc] = 0;
      x.m_backend.data._M_elems[0xd] = 0;
      x.m_backend.data._M_elems[0xe] = 0;
      x.m_backend.data._M_elems[0xf] = 0;
      x.m_backend.data._M_elems[0x10] = 0;
      x.m_backend.data._M_elems[0x11] = 0;
      x.m_backend.data._M_elems[0x12] = 0;
      x.m_backend.data._M_elems[0x13] = 0;
      x.m_backend.data._M_elems[0x14] = 0;
      x.m_backend.data._M_elems[0x15] = 0;
      x.m_backend.data._M_elems[0x16] = 0;
      x.m_backend.data._M_elems[0x17] = 0;
      x.m_backend.data._M_elems[0x18] = 0;
      x.m_backend.data._M_elems[0x19] = 0;
      x.m_backend.data._M_elems._104_5_ = 0;
      x.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      x.m_backend.exp = 0;
      x.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&x.m_backend,&ax.m_backend,
                 (cpp_dec_float<200U,_int,_void> *)
                 ((long)&(base->
                         super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).
                         super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .object.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar17));
      result_4.m_backend.fpclass = cpp_dec_float_finite;
      result_4.m_backend.prec_elem = 0x1c;
      result_4.m_backend.data._M_elems[0] = 0;
      result_4.m_backend.data._M_elems[1] = 0;
      result_4.m_backend.data._M_elems[2] = 0;
      result_4.m_backend.data._M_elems[3] = 0;
      result_4.m_backend.data._M_elems[4] = 0;
      result_4.m_backend.data._M_elems[5] = 0;
      result_4.m_backend.data._M_elems[6] = 0;
      result_4.m_backend.data._M_elems[7] = 0;
      result_4.m_backend.data._M_elems[8] = 0;
      result_4.m_backend.data._M_elems[9] = 0;
      result_4.m_backend.data._M_elems[10] = 0;
      result_4.m_backend.data._M_elems[0xb] = 0;
      result_4.m_backend.data._M_elems[0xc] = 0;
      result_4.m_backend.data._M_elems[0xd] = 0;
      result_4.m_backend.data._M_elems[0xe] = 0;
      result_4.m_backend.data._M_elems[0xf] = 0;
      result_4.m_backend.data._M_elems[0x10] = 0;
      result_4.m_backend.data._M_elems[0x11] = 0;
      result_4.m_backend.data._M_elems[0x12] = 0;
      result_4.m_backend.data._M_elems[0x13] = 0;
      result_4.m_backend.data._M_elems[0x14] = 0;
      result_4.m_backend.data._M_elems[0x15] = 0;
      result_4.m_backend.data._M_elems[0x16] = 0;
      result_4.m_backend.data._M_elems[0x17] = 0;
      result_4.m_backend.data._M_elems[0x18] = 0;
      result_4.m_backend.data._M_elems[0x19] = 0;
      result_4.m_backend.data._M_elems._104_5_ = 0;
      result_4.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      result_4.m_backend.exp = 0;
      result_4.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&result_4.m_backend,&bx.m_backend,
                 (cpp_dec_float<200U,_int,_void> *)
                 ((long)&(base->
                         super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).
                         super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .up.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar17));
      result_5.m_backend.fpclass = cpp_dec_float_finite;
      result_5.m_backend.prec_elem = 0x1c;
      result_5.m_backend.data._M_elems[0] = 0;
      result_5.m_backend.data._M_elems[1] = 0;
      result_5.m_backend.data._M_elems[2] = 0;
      result_5.m_backend.data._M_elems[3] = 0;
      result_5.m_backend.data._M_elems[4] = 0;
      result_5.m_backend.data._M_elems[5] = 0;
      result_5.m_backend.data._M_elems[6] = 0;
      result_5.m_backend.data._M_elems[7] = 0;
      result_5.m_backend.data._M_elems[8] = 0;
      result_5.m_backend.data._M_elems[9] = 0;
      result_5.m_backend.data._M_elems[10] = 0;
      result_5.m_backend.data._M_elems[0xb] = 0;
      result_5.m_backend.data._M_elems[0xc] = 0;
      result_5.m_backend.data._M_elems[0xd] = 0;
      result_5.m_backend.data._M_elems[0xe] = 0;
      result_5.m_backend.data._M_elems[0xf] = 0;
      result_5.m_backend.data._M_elems[0x10] = 0;
      result_5.m_backend.data._M_elems[0x11] = 0;
      result_5.m_backend.data._M_elems[0x12] = 0;
      result_5.m_backend.data._M_elems[0x13] = 0;
      result_5.m_backend.data._M_elems[0x14] = 0;
      result_5.m_backend.data._M_elems[0x15] = 0;
      result_5.m_backend.data._M_elems[0x16] = 0;
      result_5.m_backend.data._M_elems[0x17] = 0;
      result_5.m_backend.data._M_elems[0x18] = 0;
      result_5.m_backend.data._M_elems[0x19] = 0;
      result_5.m_backend.data._M_elems._104_5_ = 0;
      result_5.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      result_5.m_backend.exp = 0;
      result_5.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&result_5.m_backend,&bx.m_backend,
                 (cpp_dec_float<200U,_int,_void> *)
                 ((long)&(base->
                         super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).
                         super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .low.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar17));
      pnVar1 = (base->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .up.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pdVar3 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                (&result_7.m_backend,*pdVar3,(type *)0x0);
      tVar2 = boost::multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)((long)&pnVar1[-1].m_backend.data + lVar17),
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&result_7.m_backend);
      if (tVar2) {
        result_32.m_backend.fpclass = cpp_dec_float_finite;
        result_32.m_backend.prec_elem = 0x1c;
        result_32.m_backend.data._M_elems[0] = 0;
        result_32.m_backend.data._M_elems[1] = 0;
        result_32.m_backend.data._M_elems[2] = 0;
        result_32.m_backend.data._M_elems[3] = 0;
        result_32.m_backend.data._M_elems[4] = 0;
        result_32.m_backend.data._M_elems[5] = 0;
        result_32.m_backend.data._M_elems[6] = 0;
        result_32.m_backend.data._M_elems[7] = 0;
        result_32.m_backend.data._M_elems[8] = 0;
        result_32.m_backend.data._M_elems[9] = 0;
        result_32.m_backend.data._M_elems[10] = 0;
        result_32.m_backend.data._M_elems[0xb] = 0;
        result_32.m_backend.data._M_elems[0xc] = 0;
        result_32.m_backend.data._M_elems[0xd] = 0;
        result_32.m_backend.data._M_elems[0xe] = 0;
        result_32.m_backend.data._M_elems[0xf] = 0;
        result_32.m_backend.data._M_elems[0x10] = 0;
        result_32.m_backend.data._M_elems[0x11] = 0;
        result_32.m_backend.data._M_elems[0x12] = 0;
        result_32.m_backend.data._M_elems[0x13] = 0;
        result_32.m_backend.data._M_elems[0x14] = 0;
        result_32.m_backend.data._M_elems[0x15] = 0;
        result_32.m_backend.data._M_elems[0x16] = 0;
        result_32.m_backend.data._M_elems[0x17] = 0;
        result_32.m_backend.data._M_elems[0x18] = 0;
        result_32.m_backend.data._M_elems[0x19] = 0;
        result_32.m_backend.data._M_elems._104_5_ = 0;
        result_32.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        result_32.m_backend.exp = 0;
        result_32.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (&result_32.m_backend,
                   (cpp_dec_float<200U,_int,_void> *)
                   ((long)&(base->
                           super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).
                           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .low.val.
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar17),
                   (cpp_dec_float<200U,_int,_void> *)
                   ((long)&(base->
                           super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).
                           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .up.val.
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar17));
        boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  ((type *)&result_7.m_backend,(multiprecision *)&result_32.m_backend,arg_01);
        tVar2 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&result_7.m_backend,&eps);
        if (tVar2) {
          result_9.m_backend.fpclass = cpp_dec_float_finite;
          result_9.m_backend.prec_elem = 0x1c;
          result_9.m_backend.data._M_elems[0] = 0;
          result_9.m_backend.data._M_elems[1] = 0;
          result_9.m_backend.data._M_elems[2] = 0;
          result_9.m_backend.data._M_elems[3] = 0;
          result_9.m_backend.data._M_elems[4] = 0;
          result_9.m_backend.data._M_elems[5] = 0;
          result_9.m_backend.data._M_elems[6] = 0;
          result_9.m_backend.data._M_elems[7] = 0;
          result_9.m_backend.data._M_elems[8] = 0;
          result_9.m_backend.data._M_elems[9] = 0;
          result_9.m_backend.data._M_elems[10] = 0;
          result_9.m_backend.data._M_elems[0xb] = 0;
          result_9.m_backend.data._M_elems[0xc] = 0;
          result_9.m_backend.data._M_elems[0xd] = 0;
          result_9.m_backend.data._M_elems[0xe] = 0;
          result_9.m_backend.data._M_elems[0xf] = 0;
          result_9.m_backend.data._M_elems[0x10] = 0;
          result_9.m_backend.data._M_elems[0x11] = 0;
          result_9.m_backend.data._M_elems[0x12] = 0;
          result_9.m_backend.data._M_elems[0x13] = 0;
          result_9.m_backend.data._M_elems[0x14] = 0;
          result_9.m_backend.data._M_elems[0x15] = 0;
          result_9.m_backend.data._M_elems[0x16] = 0;
          result_9.m_backend.data._M_elems[0x17] = 0;
          result_9.m_backend.data._M_elems[0x18] = 0;
          result_9.m_backend.data._M_elems[0x19] = 0;
          result_9.m_backend.data._M_elems._104_5_ = 0;
          result_9.m_backend.data._M_elems[0x1b]._1_3_ = 0;
          result_9.m_backend.exp = 0;
          result_9.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_add_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    (&result_9.m_backend,&c_fixed.m_backend,&n.m_backend);
          pcVar9 = &x.m_backend;
          pmVar14 = local_830;
          for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
            *(uint *)pmVar14 = (pcVar9->data)._M_elems[0];
            pcVar9 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar9 + (ulong)bVar19 * -8 + 4);
            pmVar14 = pmVar14 + (ulong)bVar19 * -8 + 4;
          }
          local_7c0 = x.m_backend.exp;
          local_7bc = x.m_backend.neg;
          local_7b8 = x.m_backend.fpclass;
          iStack_7b4 = x.m_backend.prec_elem;
          boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    ((type *)&result_8.m_backend,local_830,
                     (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)local_830);
          result_7.m_backend.fpclass = cpp_dec_float_finite;
          result_7.m_backend.prec_elem = 0x1c;
          result_7.m_backend.data._M_elems[0] = 0;
          result_7.m_backend.data._M_elems[1] = 0;
          result_7.m_backend.data._M_elems[2] = 0;
          result_7.m_backend.data._M_elems[3] = 0;
          result_7.m_backend.data._M_elems[4] = 0;
          result_7.m_backend.data._M_elems[5] = 0;
          result_7.m_backend.data._M_elems[6] = 0;
          result_7.m_backend.data._M_elems[7] = 0;
          result_7.m_backend.data._M_elems[8] = 0;
          result_7.m_backend.data._M_elems[9] = 0;
          result_7.m_backend.data._M_elems[10] = 0;
          result_7.m_backend.data._M_elems[0xb] = 0;
          result_7.m_backend.data._M_elems[0xc] = 0;
          result_7.m_backend.data._M_elems[0xd] = 0;
          result_7.m_backend.data._M_elems[0xe] = 0;
          result_7.m_backend.data._M_elems[0xf] = 0;
          result_7.m_backend.data._M_elems[0x10] = 0;
          result_7.m_backend.data._M_elems[0x11] = 0;
          result_7.m_backend.data._M_elems[0x12] = 0;
          result_7.m_backend.data._M_elems[0x13] = 0;
          result_7.m_backend.data._M_elems[0x14] = 0;
          result_7.m_backend.data._M_elems[0x15] = 0;
          result_7.m_backend.data._M_elems[0x16] = 0;
          result_7.m_backend.data._M_elems[0x17] = 0;
          result_7.m_backend.data._M_elems[0x18] = 0;
          result_7.m_backend.data._M_elems[0x19] = 0;
          result_7.m_backend.data._M_elems._104_5_ = 0;
          result_7.m_backend.data._M_elems[0x1b]._1_3_ = 0;
          result_7.m_backend.exp = 0;
          result_7.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_add_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    (&result_7.m_backend,&result_9.m_backend,&result_8.m_backend);
LAB_00434c94:
          pnVar1 = (this->colWeight).data.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pcVar9 = &result_7.m_backend;
          puVar15 = (uint *)((long)&pnVar1[-1].m_backend.data + lVar17);
          for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
            *puVar15 = (pcVar9->data)._M_elems[0];
            pcVar9 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar9 + (ulong)bVar19 * -8 + 4);
            puVar15 = puVar15 + (ulong)bVar19 * -2 + 1;
          }
          *(int *)((long)&(pnVar1->m_backend).data + lVar17 + -0x10) = result_7.m_backend.exp;
          *(bool *)((long)&(pnVar1->m_backend).data + lVar17 + -0xc) = result_7.m_backend.neg;
          *(undefined8 *)((long)&(pnVar1->m_backend).data + lVar17 + -8) =
               result_7.m_backend._120_8_;
        }
        else {
          pnVar1 = (base->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .low.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pdVar3 = (double *)infinity();
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                    (&result_7.m_backend,-*pdVar3,(type *)0x0);
          tVar2 = boost::multiprecision::operator>
                            ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)((long)&pnVar1[-1].m_backend.data + lVar17),
                             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&result_7.m_backend);
          if (tVar2) {
            result_7.m_backend.data._M_elems._0_8_ =
                 result_7.m_backend.data._M_elems._0_8_ & 0xffffffff00000000;
            tVar2 = boost::multiprecision::operator>
                              ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)&x.m_backend,(int *)&result_7.m_backend);
            if (!tVar2) {
              result_8.m_backend.fpclass = cpp_dec_float_finite;
              result_8.m_backend.prec_elem = 0x1c;
              result_8.m_backend.data._M_elems[0] = 0;
              result_8.m_backend.data._M_elems[1] = 0;
              result_8.m_backend.data._M_elems[2] = 0;
              result_8.m_backend.data._M_elems[3] = 0;
              result_8.m_backend.data._M_elems[4] = 0;
              result_8.m_backend.data._M_elems[5] = 0;
              result_8.m_backend.data._M_elems[6] = 0;
              result_8.m_backend.data._M_elems[7] = 0;
              result_8.m_backend.data._M_elems[8] = 0;
              result_8.m_backend.data._M_elems[9] = 0;
              result_8.m_backend.data._M_elems[10] = 0;
              result_8.m_backend.data._M_elems[0xb] = 0;
              result_8.m_backend.data._M_elems[0xc] = 0;
              result_8.m_backend.data._M_elems[0xd] = 0;
              result_8.m_backend.data._M_elems[0xe] = 0;
              result_8.m_backend.data._M_elems[0xf] = 0;
              result_8.m_backend.data._M_elems[0x10] = 0;
              result_8.m_backend.data._M_elems[0x11] = 0;
              result_8.m_backend.data._M_elems[0x12] = 0;
              result_8.m_backend.data._M_elems[0x13] = 0;
              result_8.m_backend.data._M_elems[0x14] = 0;
              result_8.m_backend.data._M_elems[0x15] = 0;
              result_8.m_backend.data._M_elems[0x16] = 0;
              result_8.m_backend.data._M_elems[0x17] = 0;
              result_8.m_backend.data._M_elems[0x18] = 0;
              result_8.m_backend.data._M_elems[0x19] = 0;
              result_8.m_backend.data._M_elems._104_5_ = 0;
              result_8.m_backend.data._M_elems[0x1b]._1_3_ = 0;
              result_8.m_backend.exp = 0;
              result_8.m_backend.neg = false;
              boost::multiprecision::default_ops::
              eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                        (&result_8.m_backend,&c_dbl_bounded.m_backend,&x.m_backend);
              result_9.m_backend.fpclass = cpp_dec_float_finite;
              result_9.m_backend.prec_elem = 0x1c;
              result_9.m_backend.data._M_elems[0] = 0;
              result_9.m_backend.data._M_elems[1] = 0;
              result_9.m_backend.data._M_elems[2] = 0;
              result_9.m_backend.data._M_elems[3] = 0;
              result_9.m_backend.data._M_elems[4] = 0;
              result_9.m_backend.data._M_elems[5] = 0;
              result_9.m_backend.data._M_elems[6] = 0;
              result_9.m_backend.data._M_elems[7] = 0;
              result_9.m_backend.data._M_elems[8] = 0;
              result_9.m_backend.data._M_elems[9] = 0;
              result_9.m_backend.data._M_elems[10] = 0;
              result_9.m_backend.data._M_elems[0xb] = 0;
              result_9.m_backend.data._M_elems[0xc] = 0;
              result_9.m_backend.data._M_elems[0xd] = 0;
              result_9.m_backend.data._M_elems[0xe] = 0;
              result_9.m_backend.data._M_elems[0xf] = 0;
              result_9.m_backend.data._M_elems[0x10] = 0;
              result_9.m_backend.data._M_elems[0x11] = 0;
              result_9.m_backend.data._M_elems[0x12] = 0;
              result_9.m_backend.data._M_elems[0x13] = 0;
              result_9.m_backend.data._M_elems[0x14] = 0;
              result_9.m_backend.data._M_elems[0x15] = 0;
              result_9.m_backend.data._M_elems[0x16] = 0;
              result_9.m_backend.data._M_elems[0x17] = 0;
              result_9.m_backend.data._M_elems[0x18] = 0;
              result_9.m_backend.data._M_elems[0x19] = 0;
              result_9.m_backend.data._M_elems._104_5_ = 0;
              result_9.m_backend.data._M_elems[0x1b]._1_3_ = 0;
              result_9.m_backend.exp = 0;
              result_9.m_backend.neg = false;
              boost::multiprecision::default_ops::
              eval_add_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                        (&result_9.m_backend,&result_8.m_backend,&result_5.m_backend);
              result_7.m_backend.fpclass = cpp_dec_float_finite;
              result_7.m_backend.prec_elem = 0x1c;
              result_7.m_backend.data._M_elems[0] = 0;
              result_7.m_backend.data._M_elems[1] = 0;
              result_7.m_backend.data._M_elems[2] = 0;
              result_7.m_backend.data._M_elems[3] = 0;
              result_7.m_backend.data._M_elems[4] = 0;
              result_7.m_backend.data._M_elems[5] = 0;
              result_7.m_backend.data._M_elems[6] = 0;
              result_7.m_backend.data._M_elems[7] = 0;
              result_7.m_backend.data._M_elems[8] = 0;
              result_7.m_backend.data._M_elems[9] = 0;
              result_7.m_backend.data._M_elems[10] = 0;
              result_7.m_backend.data._M_elems[0xb] = 0;
              result_7.m_backend.data._M_elems[0xc] = 0;
              result_7.m_backend.data._M_elems[0xd] = 0;
              result_7.m_backend.data._M_elems[0xe] = 0;
              result_7.m_backend.data._M_elems[0xf] = 0;
              result_7.m_backend.data._M_elems[0x10] = 0;
              result_7.m_backend.data._M_elems[0x11] = 0;
              result_7.m_backend.data._M_elems[0x12] = 0;
              result_7.m_backend.data._M_elems[0x13] = 0;
              result_7.m_backend.data._M_elems[0x14] = 0;
              result_7.m_backend.data._M_elems[0x15] = 0;
              result_7.m_backend.data._M_elems[0x16] = 0;
              result_7.m_backend.data._M_elems[0x17] = 0;
              result_7.m_backend.data._M_elems[0x18] = 0;
              result_7.m_backend.data._M_elems[0x19] = 0;
              result_7.m_backend.data._M_elems._104_5_ = 0;
              result_7.m_backend.data._M_elems[0x1b]._1_3_ = 0;
              result_7.m_backend.exp = 0;
              result_7.m_backend.neg = false;
              boost::multiprecision::default_ops::
              eval_add_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                        (&result_7.m_backend,&result_9.m_backend,&n.m_backend);
              pnVar1 = (this->colWeight).data.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pcVar9 = &result_7.m_backend;
              puVar15 = (uint *)((long)&pnVar1[-1].m_backend.data + lVar17);
              for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
                *puVar15 = (pcVar9->data)._M_elems[0];
                pcVar9 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar9 + (ulong)bVar19 * -8 + 4);
                puVar15 = puVar15 + (ulong)bVar19 * -2 + 1;
              }
              *(int *)((long)&(pnVar1->m_backend).data + lVar17 + -0x10) = result_7.m_backend.exp;
              *(bool *)((long)&(pnVar1->m_backend).data + lVar17 + -0xc) = result_7.m_backend.neg;
              *(undefined8 *)((long)&(pnVar1->m_backend).data + lVar17 + -8) =
                   result_7.m_backend._120_8_;
              pbVar4 = (this->colUp).data;
              goto LAB_004349cf;
            }
            result_8.m_backend.fpclass = cpp_dec_float_finite;
            result_8.m_backend.prec_elem = 0x1c;
            result_8.m_backend.data._M_elems[0] = 0;
            result_8.m_backend.data._M_elems[1] = 0;
            result_8.m_backend.data._M_elems[2] = 0;
            result_8.m_backend.data._M_elems[3] = 0;
            result_8.m_backend.data._M_elems[4] = 0;
            result_8.m_backend.data._M_elems[5] = 0;
            result_8.m_backend.data._M_elems[6] = 0;
            result_8.m_backend.data._M_elems[7] = 0;
            result_8.m_backend.data._M_elems[8] = 0;
            result_8.m_backend.data._M_elems[9] = 0;
            result_8.m_backend.data._M_elems[10] = 0;
            result_8.m_backend.data._M_elems[0xb] = 0;
            result_8.m_backend.data._M_elems[0xc] = 0;
            result_8.m_backend.data._M_elems[0xd] = 0;
            result_8.m_backend.data._M_elems[0xe] = 0;
            result_8.m_backend.data._M_elems[0xf] = 0;
            result_8.m_backend.data._M_elems[0x10] = 0;
            result_8.m_backend.data._M_elems[0x11] = 0;
            result_8.m_backend.data._M_elems[0x12] = 0;
            result_8.m_backend.data._M_elems[0x13] = 0;
            result_8.m_backend.data._M_elems[0x14] = 0;
            result_8.m_backend.data._M_elems[0x15] = 0;
            result_8.m_backend.data._M_elems[0x16] = 0;
            result_8.m_backend.data._M_elems[0x17] = 0;
            result_8.m_backend.data._M_elems[0x18] = 0;
            result_8.m_backend.data._M_elems[0x19] = 0;
            result_8.m_backend.data._M_elems._104_5_ = 0;
            result_8.m_backend.data._M_elems[0x1b]._1_3_ = 0;
            result_8.m_backend.exp = 0;
            result_8.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_add_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                      (&result_8.m_backend,&c_dbl_bounded.m_backend,&x.m_backend);
            result_9.m_backend.fpclass = cpp_dec_float_finite;
            result_9.m_backend.prec_elem = 0x1c;
            result_9.m_backend.data._M_elems[0] = 0;
            result_9.m_backend.data._M_elems[1] = 0;
            result_9.m_backend.data._M_elems[2] = 0;
            result_9.m_backend.data._M_elems[3] = 0;
            result_9.m_backend.data._M_elems[4] = 0;
            result_9.m_backend.data._M_elems[5] = 0;
            result_9.m_backend.data._M_elems[6] = 0;
            result_9.m_backend.data._M_elems[7] = 0;
            result_9.m_backend.data._M_elems[8] = 0;
            result_9.m_backend.data._M_elems[9] = 0;
            result_9.m_backend.data._M_elems[10] = 0;
            result_9.m_backend.data._M_elems[0xb] = 0;
            result_9.m_backend.data._M_elems[0xc] = 0;
            result_9.m_backend.data._M_elems[0xd] = 0;
            result_9.m_backend.data._M_elems[0xe] = 0;
            result_9.m_backend.data._M_elems[0xf] = 0;
            result_9.m_backend.data._M_elems[0x10] = 0;
            result_9.m_backend.data._M_elems[0x11] = 0;
            result_9.m_backend.data._M_elems[0x12] = 0;
            result_9.m_backend.data._M_elems[0x13] = 0;
            result_9.m_backend.data._M_elems[0x14] = 0;
            result_9.m_backend.data._M_elems[0x15] = 0;
            result_9.m_backend.data._M_elems[0x16] = 0;
            result_9.m_backend.data._M_elems[0x17] = 0;
            result_9.m_backend.data._M_elems[0x18] = 0;
            result_9.m_backend.data._M_elems[0x19] = 0;
            result_9.m_backend.data._M_elems._104_5_ = 0;
            result_9.m_backend.data._M_elems[0x1b]._1_3_ = 0;
            result_9.m_backend.exp = 0;
            result_9.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                      (&result_9.m_backend,&result_8.m_backend,&result_4.m_backend);
            result_7.m_backend.fpclass = cpp_dec_float_finite;
            result_7.m_backend.prec_elem = 0x1c;
            result_7.m_backend.data._M_elems[0] = 0;
            result_7.m_backend.data._M_elems[1] = 0;
            result_7.m_backend.data._M_elems[2] = 0;
            result_7.m_backend.data._M_elems[3] = 0;
            result_7.m_backend.data._M_elems[4] = 0;
            result_7.m_backend.data._M_elems[5] = 0;
            result_7.m_backend.data._M_elems[6] = 0;
            result_7.m_backend.data._M_elems[7] = 0;
            result_7.m_backend.data._M_elems[8] = 0;
            result_7.m_backend.data._M_elems[9] = 0;
            result_7.m_backend.data._M_elems[10] = 0;
            result_7.m_backend.data._M_elems[0xb] = 0;
            result_7.m_backend.data._M_elems[0xc] = 0;
            result_7.m_backend.data._M_elems[0xd] = 0;
            result_7.m_backend.data._M_elems[0xe] = 0;
            result_7.m_backend.data._M_elems[0xf] = 0;
            result_7.m_backend.data._M_elems[0x10] = 0;
            result_7.m_backend.data._M_elems[0x11] = 0;
            result_7.m_backend.data._M_elems[0x12] = 0;
            result_7.m_backend.data._M_elems[0x13] = 0;
            result_7.m_backend.data._M_elems[0x14] = 0;
            result_7.m_backend.data._M_elems[0x15] = 0;
            result_7.m_backend.data._M_elems[0x16] = 0;
            result_7.m_backend.data._M_elems[0x17] = 0;
            result_7.m_backend.data._M_elems[0x18] = 0;
            result_7.m_backend.data._M_elems[0x19] = 0;
            result_7.m_backend.data._M_elems._104_5_ = 0;
            result_7.m_backend.data._M_elems[0x1b]._1_3_ = 0;
            result_7.m_backend.exp = 0;
            result_7.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_add_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                      (&result_7.m_backend,&result_9.m_backend,&n.m_backend);
            pnVar1 = (this->colWeight).data.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pcVar9 = &result_7.m_backend;
            puVar15 = (uint *)((long)&pnVar1[-1].m_backend.data + lVar17);
            for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
              *puVar15 = (pcVar9->data)._M_elems[0];
              pcVar9 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar9 + (ulong)bVar19 * -8 + 4);
              puVar15 = puVar15 + (ulong)bVar19 * -2 + 1;
            }
            *(int *)((long)&(pnVar1->m_backend).data + lVar17 + -0x10) = result_7.m_backend.exp;
            *(bool *)((long)&(pnVar1->m_backend).data + lVar17 + -0xc) = result_7.m_backend.neg;
            *(undefined8 *)((long)&(pnVar1->m_backend).data + lVar17 + -8) =
                 result_7.m_backend._120_8_;
            pbVar4 = (this->colUp).data;
          }
          else {
            result_8.m_backend.fpclass = cpp_dec_float_finite;
            result_8.m_backend.prec_elem = 0x1c;
            result_8.m_backend.data._M_elems[0] = 0;
            result_8.m_backend.data._M_elems[1] = 0;
            result_8.m_backend.data._M_elems[2] = 0;
            result_8.m_backend.data._M_elems[3] = 0;
            result_8.m_backend.data._M_elems[4] = 0;
            result_8.m_backend.data._M_elems[5] = 0;
            result_8.m_backend.data._M_elems[6] = 0;
            result_8.m_backend.data._M_elems[7] = 0;
            result_8.m_backend.data._M_elems[8] = 0;
            result_8.m_backend.data._M_elems[9] = 0;
            result_8.m_backend.data._M_elems[10] = 0;
            result_8.m_backend.data._M_elems[0xb] = 0;
            result_8.m_backend.data._M_elems[0xc] = 0;
            result_8.m_backend.data._M_elems[0xd] = 0;
            result_8.m_backend.data._M_elems[0xe] = 0;
            result_8.m_backend.data._M_elems[0xf] = 0;
            result_8.m_backend.data._M_elems[0x10] = 0;
            result_8.m_backend.data._M_elems[0x11] = 0;
            result_8.m_backend.data._M_elems[0x12] = 0;
            result_8.m_backend.data._M_elems[0x13] = 0;
            result_8.m_backend.data._M_elems[0x14] = 0;
            result_8.m_backend.data._M_elems[0x15] = 0;
            result_8.m_backend.data._M_elems[0x16] = 0;
            result_8.m_backend.data._M_elems[0x17] = 0;
            result_8.m_backend.data._M_elems[0x18] = 0;
            result_8.m_backend.data._M_elems[0x19] = 0;
            result_8.m_backend.data._M_elems._104_5_ = 0;
            result_8.m_backend.data._M_elems[0x1b]._1_3_ = 0;
            result_8.m_backend.exp = 0;
            result_8.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                      (&result_8.m_backend,&c_bounded.m_backend,&result_4.m_backend);
            result_9.m_backend.fpclass = cpp_dec_float_finite;
            result_9.m_backend.prec_elem = 0x1c;
            result_9.m_backend.data._M_elems[0] = 0;
            result_9.m_backend.data._M_elems[1] = 0;
            result_9.m_backend.data._M_elems[2] = 0;
            result_9.m_backend.data._M_elems[3] = 0;
            result_9.m_backend.data._M_elems[4] = 0;
            result_9.m_backend.data._M_elems[5] = 0;
            result_9.m_backend.data._M_elems[6] = 0;
            result_9.m_backend.data._M_elems[7] = 0;
            result_9.m_backend.data._M_elems[8] = 0;
            result_9.m_backend.data._M_elems[9] = 0;
            result_9.m_backend.data._M_elems[10] = 0;
            result_9.m_backend.data._M_elems[0xb] = 0;
            result_9.m_backend.data._M_elems[0xc] = 0;
            result_9.m_backend.data._M_elems[0xd] = 0;
            result_9.m_backend.data._M_elems[0xe] = 0;
            result_9.m_backend.data._M_elems[0xf] = 0;
            result_9.m_backend.data._M_elems[0x10] = 0;
            result_9.m_backend.data._M_elems[0x11] = 0;
            result_9.m_backend.data._M_elems[0x12] = 0;
            result_9.m_backend.data._M_elems[0x13] = 0;
            result_9.m_backend.data._M_elems[0x14] = 0;
            result_9.m_backend.data._M_elems[0x15] = 0;
            result_9.m_backend.data._M_elems[0x16] = 0;
            result_9.m_backend.data._M_elems[0x17] = 0;
            result_9.m_backend.data._M_elems[0x18] = 0;
            result_9.m_backend.data._M_elems[0x19] = 0;
            result_9.m_backend.data._M_elems._104_5_ = 0;
            result_9.m_backend.data._M_elems[0x1b]._1_3_ = 0;
            result_9.m_backend.exp = 0;
            result_9.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_add_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                      (&result_9.m_backend,&result_8.m_backend,&x.m_backend);
            result_7.m_backend.fpclass = cpp_dec_float_finite;
            result_7.m_backend.prec_elem = 0x1c;
            result_7.m_backend.data._M_elems[0] = 0;
            result_7.m_backend.data._M_elems[1] = 0;
            result_7.m_backend.data._M_elems[2] = 0;
            result_7.m_backend.data._M_elems[3] = 0;
            result_7.m_backend.data._M_elems[4] = 0;
            result_7.m_backend.data._M_elems[5] = 0;
            result_7.m_backend.data._M_elems[6] = 0;
            result_7.m_backend.data._M_elems[7] = 0;
            result_7.m_backend.data._M_elems[8] = 0;
            result_7.m_backend.data._M_elems[9] = 0;
            result_7.m_backend.data._M_elems[10] = 0;
            result_7.m_backend.data._M_elems[0xb] = 0;
            result_7.m_backend.data._M_elems[0xc] = 0;
            result_7.m_backend.data._M_elems[0xd] = 0;
            result_7.m_backend.data._M_elems[0xe] = 0;
            result_7.m_backend.data._M_elems[0xf] = 0;
            result_7.m_backend.data._M_elems[0x10] = 0;
            result_7.m_backend.data._M_elems[0x11] = 0;
            result_7.m_backend.data._M_elems[0x12] = 0;
            result_7.m_backend.data._M_elems[0x13] = 0;
            result_7.m_backend.data._M_elems[0x14] = 0;
            result_7.m_backend.data._M_elems[0x15] = 0;
            result_7.m_backend.data._M_elems[0x16] = 0;
            result_7.m_backend.data._M_elems[0x17] = 0;
            result_7.m_backend.data._M_elems[0x18] = 0;
            result_7.m_backend.data._M_elems[0x19] = 0;
            result_7.m_backend.data._M_elems._104_5_ = 0;
            result_7.m_backend.data._M_elems[0x1b]._1_3_ = 0;
            result_7.m_backend.exp = 0;
            result_7.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_add_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                      (&result_7.m_backend,&result_9.m_backend,&n.m_backend);
            pnVar1 = (this->colWeight).data.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pcVar9 = &result_7.m_backend;
            puVar15 = (uint *)((long)&pnVar1[-1].m_backend.data + lVar17);
            for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
              *puVar15 = (pcVar9->data)._M_elems[0];
              pcVar9 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar9 + (ulong)bVar19 * -8 + 4);
              puVar15 = puVar15 + (ulong)bVar19 * -2 + 1;
            }
            *(int *)((long)&(pnVar1->m_backend).data + lVar17 + -0x10) = result_7.m_backend.exp;
            *(bool *)((long)&(pnVar1->m_backend).data + lVar17 + -0xc) = result_7.m_backend.neg;
            *(undefined8 *)((long)&(pnVar1->m_backend).data + lVar17 + -8) =
                 result_7.m_backend._120_8_;
            pbVar4 = (this->colUp).data;
          }
          pbVar4[uVar16 - 1] = true;
        }
      }
      else {
        pnVar1 = (base->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .low.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pdVar3 = (double *)infinity();
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                  (&result_7.m_backend,-*pdVar3,(type *)0x0);
        tVar2 = boost::multiprecision::operator>
                          ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)((long)&pnVar1[-1].m_backend.data + lVar17),
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&result_7.m_backend);
        if (!tVar2) {
          result_9.m_backend.fpclass = cpp_dec_float_finite;
          result_9.m_backend.prec_elem = 0x1c;
          result_9.m_backend.data._M_elems[0] = 0;
          result_9.m_backend.data._M_elems[1] = 0;
          result_9.m_backend.data._M_elems[2] = 0;
          result_9.m_backend.data._M_elems[3] = 0;
          result_9.m_backend.data._M_elems[4] = 0;
          result_9.m_backend.data._M_elems[5] = 0;
          result_9.m_backend.data._M_elems[6] = 0;
          result_9.m_backend.data._M_elems[7] = 0;
          result_9.m_backend.data._M_elems[8] = 0;
          result_9.m_backend.data._M_elems[9] = 0;
          result_9.m_backend.data._M_elems[10] = 0;
          result_9.m_backend.data._M_elems[0xb] = 0;
          result_9.m_backend.data._M_elems[0xc] = 0;
          result_9.m_backend.data._M_elems[0xd] = 0;
          result_9.m_backend.data._M_elems[0xe] = 0;
          result_9.m_backend.data._M_elems[0xf] = 0;
          result_9.m_backend.data._M_elems[0x10] = 0;
          result_9.m_backend.data._M_elems[0x11] = 0;
          result_9.m_backend.data._M_elems[0x12] = 0;
          result_9.m_backend.data._M_elems[0x13] = 0;
          result_9.m_backend.data._M_elems[0x14] = 0;
          result_9.m_backend.data._M_elems[0x15] = 0;
          result_9.m_backend.data._M_elems[0x16] = 0;
          result_9.m_backend.data._M_elems[0x17] = 0;
          result_9.m_backend.data._M_elems[0x18] = 0;
          result_9.m_backend.data._M_elems[0x19] = 0;
          result_9.m_backend.data._M_elems._104_5_ = 0;
          result_9.m_backend.data._M_elems[0x1b]._1_3_ = 0;
          result_9.m_backend.exp = 0;
          result_9.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_add_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    (&result_9.m_backend,&c_free.m_backend,&n.m_backend);
          pcVar9 = &x.m_backend;
          pmVar14 = local_8b0;
          for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
            *(uint *)pmVar14 = (pcVar9->data)._M_elems[0];
            pcVar9 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar9 + (ulong)bVar19 * -8 + 4);
            pmVar14 = pmVar14 + (ulong)bVar19 * -8 + 4;
          }
          local_840 = x.m_backend.exp;
          local_83c = x.m_backend.neg;
          local_838 = x.m_backend.fpclass;
          iStack_834 = x.m_backend.prec_elem;
          boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    ((type *)&result_8.m_backend,local_8b0,
                     (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)local_8b0);
          result_7.m_backend.fpclass = cpp_dec_float_finite;
          result_7.m_backend.prec_elem = 0x1c;
          result_7.m_backend.data._M_elems[0] = 0;
          result_7.m_backend.data._M_elems[1] = 0;
          result_7.m_backend.data._M_elems[2] = 0;
          result_7.m_backend.data._M_elems[3] = 0;
          result_7.m_backend.data._M_elems[4] = 0;
          result_7.m_backend.data._M_elems[5] = 0;
          result_7.m_backend.data._M_elems[6] = 0;
          result_7.m_backend.data._M_elems[7] = 0;
          result_7.m_backend.data._M_elems[8] = 0;
          result_7.m_backend.data._M_elems[9] = 0;
          result_7.m_backend.data._M_elems[10] = 0;
          result_7.m_backend.data._M_elems[0xb] = 0;
          result_7.m_backend.data._M_elems[0xc] = 0;
          result_7.m_backend.data._M_elems[0xd] = 0;
          result_7.m_backend.data._M_elems[0xe] = 0;
          result_7.m_backend.data._M_elems[0xf] = 0;
          result_7.m_backend.data._M_elems[0x10] = 0;
          result_7.m_backend.data._M_elems[0x11] = 0;
          result_7.m_backend.data._M_elems[0x12] = 0;
          result_7.m_backend.data._M_elems[0x13] = 0;
          result_7.m_backend.data._M_elems[0x14] = 0;
          result_7.m_backend.data._M_elems[0x15] = 0;
          result_7.m_backend.data._M_elems[0x16] = 0;
          result_7.m_backend.data._M_elems[0x17] = 0;
          result_7.m_backend.data._M_elems[0x18] = 0;
          result_7.m_backend.data._M_elems[0x19] = 0;
          result_7.m_backend.data._M_elems._104_5_ = 0;
          result_7.m_backend.data._M_elems[0x1b]._1_3_ = 0;
          result_7.m_backend.exp = 0;
          result_7.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    (&result_7.m_backend,&result_9.m_backend,&result_8.m_backend);
          goto LAB_00434c94;
        }
        result_8.m_backend.fpclass = cpp_dec_float_finite;
        result_8.m_backend.prec_elem = 0x1c;
        result_8.m_backend.data._M_elems[0] = 0;
        result_8.m_backend.data._M_elems[1] = 0;
        result_8.m_backend.data._M_elems[2] = 0;
        result_8.m_backend.data._M_elems[3] = 0;
        result_8.m_backend.data._M_elems[4] = 0;
        result_8.m_backend.data._M_elems[5] = 0;
        result_8.m_backend.data._M_elems[6] = 0;
        result_8.m_backend.data._M_elems[7] = 0;
        result_8.m_backend.data._M_elems[8] = 0;
        result_8.m_backend.data._M_elems[9] = 0;
        result_8.m_backend.data._M_elems[10] = 0;
        result_8.m_backend.data._M_elems[0xb] = 0;
        result_8.m_backend.data._M_elems[0xc] = 0;
        result_8.m_backend.data._M_elems[0xd] = 0;
        result_8.m_backend.data._M_elems[0xe] = 0;
        result_8.m_backend.data._M_elems[0xf] = 0;
        result_8.m_backend.data._M_elems[0x10] = 0;
        result_8.m_backend.data._M_elems[0x11] = 0;
        result_8.m_backend.data._M_elems[0x12] = 0;
        result_8.m_backend.data._M_elems[0x13] = 0;
        result_8.m_backend.data._M_elems[0x14] = 0;
        result_8.m_backend.data._M_elems[0x15] = 0;
        result_8.m_backend.data._M_elems[0x16] = 0;
        result_8.m_backend.data._M_elems[0x17] = 0;
        result_8.m_backend.data._M_elems[0x18] = 0;
        result_8.m_backend.data._M_elems[0x19] = 0;
        result_8.m_backend.data._M_elems._104_5_ = 0;
        result_8.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        result_8.m_backend.exp = 0;
        result_8.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (&result_8.m_backend,&c_bounded.m_backend,&x.m_backend);
        result_9.m_backend.fpclass = cpp_dec_float_finite;
        result_9.m_backend.prec_elem = 0x1c;
        result_9.m_backend.data._M_elems[0] = 0;
        result_9.m_backend.data._M_elems[1] = 0;
        result_9.m_backend.data._M_elems[2] = 0;
        result_9.m_backend.data._M_elems[3] = 0;
        result_9.m_backend.data._M_elems[4] = 0;
        result_9.m_backend.data._M_elems[5] = 0;
        result_9.m_backend.data._M_elems[6] = 0;
        result_9.m_backend.data._M_elems[7] = 0;
        result_9.m_backend.data._M_elems[8] = 0;
        result_9.m_backend.data._M_elems[9] = 0;
        result_9.m_backend.data._M_elems[10] = 0;
        result_9.m_backend.data._M_elems[0xb] = 0;
        result_9.m_backend.data._M_elems[0xc] = 0;
        result_9.m_backend.data._M_elems[0xd] = 0;
        result_9.m_backend.data._M_elems[0xe] = 0;
        result_9.m_backend.data._M_elems[0xf] = 0;
        result_9.m_backend.data._M_elems[0x10] = 0;
        result_9.m_backend.data._M_elems[0x11] = 0;
        result_9.m_backend.data._M_elems[0x12] = 0;
        result_9.m_backend.data._M_elems[0x13] = 0;
        result_9.m_backend.data._M_elems[0x14] = 0;
        result_9.m_backend.data._M_elems[0x15] = 0;
        result_9.m_backend.data._M_elems[0x16] = 0;
        result_9.m_backend.data._M_elems[0x17] = 0;
        result_9.m_backend.data._M_elems[0x18] = 0;
        result_9.m_backend.data._M_elems[0x19] = 0;
        result_9.m_backend.data._M_elems._104_5_ = 0;
        result_9.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        result_9.m_backend.exp = 0;
        result_9.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_add_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (&result_9.m_backend,&result_8.m_backend,&result_5.m_backend);
        result_7.m_backend.fpclass = cpp_dec_float_finite;
        result_7.m_backend.prec_elem = 0x1c;
        result_7.m_backend.data._M_elems[0] = 0;
        result_7.m_backend.data._M_elems[1] = 0;
        result_7.m_backend.data._M_elems[2] = 0;
        result_7.m_backend.data._M_elems[3] = 0;
        result_7.m_backend.data._M_elems[4] = 0;
        result_7.m_backend.data._M_elems[5] = 0;
        result_7.m_backend.data._M_elems[6] = 0;
        result_7.m_backend.data._M_elems[7] = 0;
        result_7.m_backend.data._M_elems[8] = 0;
        result_7.m_backend.data._M_elems[9] = 0;
        result_7.m_backend.data._M_elems[10] = 0;
        result_7.m_backend.data._M_elems[0xb] = 0;
        result_7.m_backend.data._M_elems[0xc] = 0;
        result_7.m_backend.data._M_elems[0xd] = 0;
        result_7.m_backend.data._M_elems[0xe] = 0;
        result_7.m_backend.data._M_elems[0xf] = 0;
        result_7.m_backend.data._M_elems[0x10] = 0;
        result_7.m_backend.data._M_elems[0x11] = 0;
        result_7.m_backend.data._M_elems[0x12] = 0;
        result_7.m_backend.data._M_elems[0x13] = 0;
        result_7.m_backend.data._M_elems[0x14] = 0;
        result_7.m_backend.data._M_elems[0x15] = 0;
        result_7.m_backend.data._M_elems[0x16] = 0;
        result_7.m_backend.data._M_elems[0x17] = 0;
        result_7.m_backend.data._M_elems[0x18] = 0;
        result_7.m_backend.data._M_elems[0x19] = 0;
        result_7.m_backend.data._M_elems._104_5_ = 0;
        result_7.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        result_7.m_backend.exp = 0;
        result_7.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_add_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (&result_7.m_backend,&result_9.m_backend,&n.m_backend);
        pnVar1 = (this->colWeight).data.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pcVar9 = &result_7.m_backend;
        puVar15 = (uint *)((long)&pnVar1[-1].m_backend.data + lVar17);
        for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
          *puVar15 = (pcVar9->data)._M_elems[0];
          pcVar9 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar9 + (ulong)bVar19 * -8 + 4);
          puVar15 = puVar15 + (ulong)bVar19 * -2 + 1;
        }
        *(int *)((long)&(pnVar1->m_backend).data + lVar17 + -0x10) = result_7.m_backend.exp;
        *(bool *)((long)&(pnVar1->m_backend).data + lVar17 + -0xc) = result_7.m_backend.neg;
        *(undefined8 *)((long)&(pnVar1->m_backend).data + lVar17 + -8) = result_7.m_backend._120_8_;
        pbVar4 = (this->colUp).data;
LAB_004349cf:
        pbVar4[uVar16 - 1] = false;
      }
      lVar17 = lVar17 + -0x80;
    }
    uVar16 = (ulong)(uint)(base->
                          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .
                          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .set.thenum;
    lVar17 = uVar16 << 7;
    for (; 0 < (int)uVar16; uVar16 = uVar16 - 1) {
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                (&n.m_backend,1,(type *)0x0);
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                (&x.m_backend,0,(type *)0x0);
      result_5.m_backend.fpclass = cpp_dec_float_finite;
      result_5.m_backend.prec_elem = 0x1c;
      result_5.m_backend.data._M_elems[0] = 0;
      result_5.m_backend.data._M_elems[1] = 0;
      result_5.m_backend.data._M_elems[2] = 0;
      result_5.m_backend.data._M_elems[3] = 0;
      result_5.m_backend.data._M_elems[4] = 0;
      result_5.m_backend.data._M_elems[5] = 0;
      result_5.m_backend.data._M_elems[6] = 0;
      result_5.m_backend.data._M_elems[7] = 0;
      result_5.m_backend.data._M_elems[8] = 0;
      result_5.m_backend.data._M_elems[9] = 0;
      result_5.m_backend.data._M_elems[10] = 0;
      result_5.m_backend.data._M_elems[0xb] = 0;
      result_5.m_backend.data._M_elems[0xc] = 0;
      result_5.m_backend.data._M_elems[0xd] = 0;
      result_5.m_backend.data._M_elems[0xe] = 0;
      result_5.m_backend.data._M_elems[0xf] = 0;
      result_5.m_backend.data._M_elems[0x10] = 0;
      result_5.m_backend.data._M_elems[0x11] = 0;
      result_5.m_backend.data._M_elems[0x12] = 0;
      result_5.m_backend.data._M_elems[0x13] = 0;
      result_5.m_backend.data._M_elems[0x14] = 0;
      result_5.m_backend.data._M_elems[0x15] = 0;
      result_5.m_backend.data._M_elems[0x16] = 0;
      result_5.m_backend.data._M_elems[0x17] = 0;
      result_5.m_backend.data._M_elems[0x18] = 0;
      result_5.m_backend.data._M_elems[0x19] = 0;
      result_5.m_backend.data._M_elems._104_5_ = 0;
      result_5.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      result_5.m_backend.exp = 0;
      result_5.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&result_5.m_backend,&bx.m_backend,&n.m_backend);
      result_4.m_backend.fpclass = cpp_dec_float_finite;
      result_4.m_backend.prec_elem = 0x1c;
      result_4.m_backend.data._M_elems[0] = 0;
      result_4.m_backend.data._M_elems[1] = 0;
      result_4.m_backend.data._M_elems[2] = 0;
      result_4.m_backend.data._M_elems[3] = 0;
      result_4.m_backend.data._M_elems[4] = 0;
      result_4.m_backend.data._M_elems[5] = 0;
      result_4.m_backend.data._M_elems[6] = 0;
      result_4.m_backend.data._M_elems[7] = 0;
      result_4.m_backend.data._M_elems[8] = 0;
      result_4.m_backend.data._M_elems[9] = 0;
      result_4.m_backend.data._M_elems[10] = 0;
      result_4.m_backend.data._M_elems[0xb] = 0;
      result_4.m_backend.data._M_elems[0xc] = 0;
      result_4.m_backend.data._M_elems[0xd] = 0;
      result_4.m_backend.data._M_elems[0xe] = 0;
      result_4.m_backend.data._M_elems[0xf] = 0;
      result_4.m_backend.data._M_elems[0x10] = 0;
      result_4.m_backend.data._M_elems[0x11] = 0;
      result_4.m_backend.data._M_elems[0x12] = 0;
      result_4.m_backend.data._M_elems[0x13] = 0;
      result_4.m_backend.data._M_elems[0x14] = 0;
      result_4.m_backend.data._M_elems[0x15] = 0;
      result_4.m_backend.data._M_elems[0x16] = 0;
      result_4.m_backend.data._M_elems[0x17] = 0;
      result_4.m_backend.data._M_elems[0x18] = 0;
      result_4.m_backend.data._M_elems[0x19] = 0;
      result_4.m_backend.data._M_elems._104_5_ = 0;
      result_4.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      result_4.m_backend.exp = 0;
      result_4.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&result_4.m_backend,&result_5.m_backend,
                 (cpp_dec_float<200U,_int,_void> *)
                 ((long)&(base->
                         super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).
                         super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .right.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar17));
      result_7.m_backend.fpclass = cpp_dec_float_finite;
      result_7.m_backend.prec_elem = 0x1c;
      result_7.m_backend.data._M_elems[0] = 0;
      result_7.m_backend.data._M_elems[1] = 0;
      result_7.m_backend.data._M_elems[2] = 0;
      result_7.m_backend.data._M_elems[3] = 0;
      result_7.m_backend.data._M_elems[4] = 0;
      result_7.m_backend.data._M_elems[5] = 0;
      result_7.m_backend.data._M_elems[6] = 0;
      result_7.m_backend.data._M_elems[7] = 0;
      result_7.m_backend.data._M_elems[8] = 0;
      result_7.m_backend.data._M_elems[9] = 0;
      result_7.m_backend.data._M_elems[10] = 0;
      result_7.m_backend.data._M_elems[0xb] = 0;
      result_7.m_backend.data._M_elems[0xc] = 0;
      result_7.m_backend.data._M_elems[0xd] = 0;
      result_7.m_backend.data._M_elems[0xe] = 0;
      result_7.m_backend.data._M_elems[0xf] = 0;
      result_7.m_backend.data._M_elems[0x10] = 0;
      result_7.m_backend.data._M_elems[0x11] = 0;
      result_7.m_backend.data._M_elems[0x12] = 0;
      result_7.m_backend.data._M_elems[0x13] = 0;
      result_7.m_backend.data._M_elems[0x14] = 0;
      result_7.m_backend.data._M_elems[0x15] = 0;
      result_7.m_backend.data._M_elems[0x16] = 0;
      result_7.m_backend.data._M_elems[0x17] = 0;
      result_7.m_backend.data._M_elems[0x18] = 0;
      result_7.m_backend.data._M_elems[0x19] = 0;
      result_7.m_backend.data._M_elems._104_5_ = 0;
      result_7.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      result_7.m_backend.exp = 0;
      result_7.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&result_7.m_backend,&bx.m_backend,&n.m_backend);
      result_5.m_backend.fpclass = cpp_dec_float_finite;
      result_5.m_backend.prec_elem = 0x1c;
      result_5.m_backend.data._M_elems[0] = 0;
      result_5.m_backend.data._M_elems[1] = 0;
      result_5.m_backend.data._M_elems[2] = 0;
      result_5.m_backend.data._M_elems[3] = 0;
      result_5.m_backend.data._M_elems[4] = 0;
      result_5.m_backend.data._M_elems[5] = 0;
      result_5.m_backend.data._M_elems[6] = 0;
      result_5.m_backend.data._M_elems[7] = 0;
      result_5.m_backend.data._M_elems[8] = 0;
      result_5.m_backend.data._M_elems[9] = 0;
      result_5.m_backend.data._M_elems[10] = 0;
      result_5.m_backend.data._M_elems[0xb] = 0;
      result_5.m_backend.data._M_elems[0xc] = 0;
      result_5.m_backend.data._M_elems[0xd] = 0;
      result_5.m_backend.data._M_elems[0xe] = 0;
      result_5.m_backend.data._M_elems[0xf] = 0;
      result_5.m_backend.data._M_elems[0x10] = 0;
      result_5.m_backend.data._M_elems[0x11] = 0;
      result_5.m_backend.data._M_elems[0x12] = 0;
      result_5.m_backend.data._M_elems[0x13] = 0;
      result_5.m_backend.data._M_elems[0x14] = 0;
      result_5.m_backend.data._M_elems[0x15] = 0;
      result_5.m_backend.data._M_elems[0x16] = 0;
      result_5.m_backend.data._M_elems[0x17] = 0;
      result_5.m_backend.data._M_elems[0x18] = 0;
      result_5.m_backend.data._M_elems[0x19] = 0;
      result_5.m_backend.data._M_elems._104_5_ = 0;
      result_5.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      result_5.m_backend.exp = 0;
      result_5.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&result_5.m_backend,&result_7.m_backend,
                 (cpp_dec_float<200U,_int,_void> *)
                 ((long)&(base->
                         super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).
                         super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .left.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar17));
      result_9.m_backend.fpclass = cpp_dec_float_finite;
      result_9.m_backend.prec_elem = 0x1c;
      result_9.m_backend.data._M_elems[0] = 0;
      result_9.m_backend.data._M_elems[1] = 0;
      result_9.m_backend.data._M_elems[2] = 0;
      result_9.m_backend.data._M_elems[3] = 0;
      result_9.m_backend.data._M_elems[4] = 0;
      result_9.m_backend.data._M_elems[5] = 0;
      result_9.m_backend.data._M_elems[6] = 0;
      result_9.m_backend.data._M_elems[7] = 0;
      result_9.m_backend.data._M_elems[8] = 0;
      result_9.m_backend.data._M_elems[9] = 0;
      result_9.m_backend.data._M_elems[10] = 0;
      result_9.m_backend.data._M_elems[0xb] = 0;
      result_9.m_backend.data._M_elems[0xc] = 0;
      result_9.m_backend.data._M_elems[0xd] = 0;
      result_9.m_backend.data._M_elems[0xe] = 0;
      result_9.m_backend.data._M_elems[0xf] = 0;
      result_9.m_backend.data._M_elems[0x10] = 0;
      result_9.m_backend.data._M_elems[0x11] = 0;
      result_9.m_backend.data._M_elems[0x12] = 0;
      result_9.m_backend.data._M_elems[0x13] = 0;
      result_9.m_backend.data._M_elems[0x14] = 0;
      result_9.m_backend.data._M_elems[0x15] = 0;
      result_9.m_backend.data._M_elems[0x16] = 0;
      result_9.m_backend.data._M_elems[0x17] = 0;
      result_9.m_backend.data._M_elems[0x18] = 0;
      result_9.m_backend.data._M_elems[0x19] = 0;
      result_9.m_backend.data._M_elems._104_5_ = 0;
      result_9.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      result_9.m_backend.exp = 0;
      result_9.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&result_9.m_backend,&ax.m_backend,&n.m_backend);
      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::operator*((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)&result_8.m_backend,this_00,
                  (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)((base->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .set.theitem +
                     (base->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .set.thekey[uVar16 - 1].idx));
      result_7.m_backend.fpclass = cpp_dec_float_finite;
      result_7.m_backend.prec_elem = 0x1c;
      result_7.m_backend.data._M_elems[0] = 0;
      result_7.m_backend.data._M_elems[1] = 0;
      result_7.m_backend.data._M_elems[2] = 0;
      result_7.m_backend.data._M_elems[3] = 0;
      result_7.m_backend.data._M_elems[4] = 0;
      result_7.m_backend.data._M_elems[5] = 0;
      result_7.m_backend.data._M_elems[6] = 0;
      result_7.m_backend.data._M_elems[7] = 0;
      result_7.m_backend.data._M_elems[8] = 0;
      result_7.m_backend.data._M_elems[9] = 0;
      result_7.m_backend.data._M_elems[10] = 0;
      result_7.m_backend.data._M_elems[0xb] = 0;
      result_7.m_backend.data._M_elems[0xc] = 0;
      result_7.m_backend.data._M_elems[0xd] = 0;
      result_7.m_backend.data._M_elems[0xe] = 0;
      result_7.m_backend.data._M_elems[0xf] = 0;
      result_7.m_backend.data._M_elems[0x10] = 0;
      result_7.m_backend.data._M_elems[0x11] = 0;
      result_7.m_backend.data._M_elems[0x12] = 0;
      result_7.m_backend.data._M_elems[0x13] = 0;
      result_7.m_backend.data._M_elems[0x14] = 0;
      result_7.m_backend.data._M_elems[0x15] = 0;
      result_7.m_backend.data._M_elems[0x16] = 0;
      result_7.m_backend.data._M_elems[0x17] = 0;
      result_7.m_backend.data._M_elems[0x18] = 0;
      result_7.m_backend.data._M_elems[0x19] = 0;
      result_7.m_backend.data._M_elems._104_5_ = 0;
      result_7.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      result_7.m_backend.exp = 0;
      result_7.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&result_7.m_backend,&result_9.m_backend,&result_8.m_backend);
      pnVar1 = (base->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .right.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pdVar3 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                (&result_9.m_backend,*pdVar3,(type *)0x0);
      tVar2 = boost::multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)((long)&pnVar1[-1].m_backend.data + lVar17),
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&result_9.m_backend);
      if (tVar2) {
        result_53.m_backend.fpclass = cpp_dec_float_finite;
        result_53.m_backend.prec_elem = 0x1c;
        result_53.m_backend.data._M_elems[0] = 0;
        result_53.m_backend.data._M_elems[1] = 0;
        result_53.m_backend.data._M_elems[2] = 0;
        result_53.m_backend.data._M_elems[3] = 0;
        result_53.m_backend.data._M_elems[4] = 0;
        result_53.m_backend.data._M_elems[5] = 0;
        result_53.m_backend.data._M_elems[6] = 0;
        result_53.m_backend.data._M_elems[7] = 0;
        result_53.m_backend.data._M_elems[8] = 0;
        result_53.m_backend.data._M_elems[9] = 0;
        result_53.m_backend.data._M_elems[10] = 0;
        result_53.m_backend.data._M_elems[0xb] = 0;
        result_53.m_backend.data._M_elems[0xc] = 0;
        result_53.m_backend.data._M_elems[0xd] = 0;
        result_53.m_backend.data._M_elems[0xe] = 0;
        result_53.m_backend.data._M_elems[0xf] = 0;
        result_53.m_backend.data._M_elems[0x10] = 0;
        result_53.m_backend.data._M_elems[0x11] = 0;
        result_53.m_backend.data._M_elems[0x12] = 0;
        result_53.m_backend.data._M_elems[0x13] = 0;
        result_53.m_backend.data._M_elems[0x14] = 0;
        result_53.m_backend.data._M_elems[0x15] = 0;
        result_53.m_backend.data._M_elems[0x16] = 0;
        result_53.m_backend.data._M_elems[0x17] = 0;
        result_53.m_backend.data._M_elems[0x18] = 0;
        result_53.m_backend.data._M_elems[0x19] = 0;
        result_53.m_backend.data._M_elems._104_5_ = 0;
        result_53.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        result_53.m_backend.exp = 0;
        result_53.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (&result_53.m_backend,
                   (cpp_dec_float<200U,_int,_void> *)
                   ((long)&(base->
                           super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).
                           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .left.val.
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar17),
                   (cpp_dec_float<200U,_int,_void> *)
                   ((long)&(base->
                           super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).
                           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .right.val.
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar17));
        boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  ((type *)&result_9.m_backend,(multiprecision *)&result_53.m_backend,arg_02);
        tVar2 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&result_9.m_backend,&eps);
        if (tVar2) {
          result_8.m_backend.fpclass = cpp_dec_float_finite;
          result_8.m_backend.prec_elem = 0x1c;
          result_8.m_backend.data._M_elems[0] = 0;
          result_8.m_backend.data._M_elems[1] = 0;
          result_8.m_backend.data._M_elems[2] = 0;
          result_8.m_backend.data._M_elems[3] = 0;
          result_8.m_backend.data._M_elems[4] = 0;
          result_8.m_backend.data._M_elems[5] = 0;
          result_8.m_backend.data._M_elems[6] = 0;
          result_8.m_backend.data._M_elems[7] = 0;
          result_8.m_backend.data._M_elems[8] = 0;
          result_8.m_backend.data._M_elems[9] = 0;
          result_8.m_backend.data._M_elems[10] = 0;
          result_8.m_backend.data._M_elems[0xb] = 0;
          result_8.m_backend.data._M_elems[0xc] = 0;
          result_8.m_backend.data._M_elems[0xd] = 0;
          result_8.m_backend.data._M_elems[0xe] = 0;
          result_8.m_backend.data._M_elems[0xf] = 0;
          result_8.m_backend.data._M_elems[0x10] = 0;
          result_8.m_backend.data._M_elems[0x11] = 0;
          result_8.m_backend.data._M_elems[0x12] = 0;
          result_8.m_backend.data._M_elems[0x13] = 0;
          result_8.m_backend.data._M_elems[0x14] = 0;
          result_8.m_backend.data._M_elems[0x15] = 0;
          result_8.m_backend.data._M_elems[0x16] = 0;
          result_8.m_backend.data._M_elems[0x17] = 0;
          result_8.m_backend.data._M_elems[0x18] = 0;
          result_8.m_backend.data._M_elems[0x19] = 0;
          result_8.m_backend.data._M_elems._104_5_ = 0;
          result_8.m_backend.data._M_elems[0x1b]._1_3_ = 0;
          result_8.m_backend.exp = 0;
          result_8.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_add_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    (&result_8.m_backend,&r_fixed.m_backend,&x.m_backend);
          pnVar12 = &result_7;
          pmVar14 = local_930;
          for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
            *(uint *)pmVar14 = (pnVar12->m_backend).data._M_elems[0];
            pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar12 + ((ulong)bVar19 * -2 + 1) * 4);
            pmVar14 = pmVar14 + (ulong)bVar19 * -8 + 4;
          }
          local_8c0 = result_7.m_backend.exp;
          local_8bc = result_7.m_backend.neg;
          local_8b8 = result_7.m_backend.fpclass;
          iStack_8b4 = result_7.m_backend.prec_elem;
          boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    ((type *)&result_55.m_backend,local_930,
                     (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)local_930);
          result_9.m_backend.fpclass = cpp_dec_float_finite;
          result_9.m_backend.prec_elem = 0x1c;
          result_9.m_backend.data._M_elems[0] = 0;
          result_9.m_backend.data._M_elems[1] = 0;
          result_9.m_backend.data._M_elems[2] = 0;
          result_9.m_backend.data._M_elems[3] = 0;
          result_9.m_backend.data._M_elems[4] = 0;
          result_9.m_backend.data._M_elems[5] = 0;
          result_9.m_backend.data._M_elems[6] = 0;
          result_9.m_backend.data._M_elems[7] = 0;
          result_9.m_backend.data._M_elems[8] = 0;
          result_9.m_backend.data._M_elems[9] = 0;
          result_9.m_backend.data._M_elems[10] = 0;
          result_9.m_backend.data._M_elems[0xb] = 0;
          result_9.m_backend.data._M_elems[0xc] = 0;
          result_9.m_backend.data._M_elems[0xd] = 0;
          result_9.m_backend.data._M_elems[0xe] = 0;
          result_9.m_backend.data._M_elems[0xf] = 0;
          result_9.m_backend.data._M_elems[0x10] = 0;
          result_9.m_backend.data._M_elems[0x11] = 0;
          result_9.m_backend.data._M_elems[0x12] = 0;
          result_9.m_backend.data._M_elems[0x13] = 0;
          result_9.m_backend.data._M_elems[0x14] = 0;
          result_9.m_backend.data._M_elems[0x15] = 0;
          result_9.m_backend.data._M_elems[0x16] = 0;
          result_9.m_backend.data._M_elems[0x17] = 0;
          result_9.m_backend.data._M_elems[0x18] = 0;
          result_9.m_backend.data._M_elems[0x19] = 0;
          result_9.m_backend.data._M_elems._104_5_ = 0;
          result_9.m_backend.data._M_elems[0x1b]._1_3_ = 0;
          result_9.m_backend.exp = 0;
          result_9.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_add_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    (&result_9.m_backend,&result_8.m_backend,&result_55.m_backend);
LAB_00435872:
          pnVar1 = (this->rowWeight).data.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pnVar12 = &result_9;
          puVar15 = (uint *)((long)&pnVar1[-1].m_backend.data + lVar17);
          for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
            *puVar15 = (pnVar12->m_backend).data._M_elems[0];
            pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar12 + ((ulong)bVar19 * -2 + 1) * 4);
            puVar15 = puVar15 + (ulong)bVar19 * -2 + 1;
          }
          *(int *)((long)&(pnVar1->m_backend).data + lVar17 + -0x10) = result_9.m_backend.exp;
          *(bool *)((long)&(pnVar1->m_backend).data + lVar17 + -0xc) = result_9.m_backend.neg;
          *(undefined8 *)((long)&(pnVar1->m_backend).data + lVar17 + -8) =
               result_9.m_backend._120_8_;
        }
        else {
          pnVar1 = (base->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .left.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pdVar3 = (double *)infinity();
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                    (&result_9.m_backend,-*pdVar3,(type *)0x0);
          tVar2 = boost::multiprecision::operator>
                            ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)((long)&pnVar1[-1].m_backend.data + lVar17),
                             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&result_9.m_backend);
          if (tVar2) {
            result_9.m_backend.data._M_elems._0_8_ =
                 result_9.m_backend.data._M_elems._0_8_ & 0xffffffff00000000;
            tVar2 = boost::multiprecision::operator>(&result_7,(int *)&result_9.m_backend);
            if (!tVar2) {
              result_55.m_backend.fpclass = cpp_dec_float_finite;
              result_55.m_backend.prec_elem = 0x1c;
              result_55.m_backend.data._M_elems[0] = 0;
              result_55.m_backend.data._M_elems[1] = 0;
              result_55.m_backend.data._M_elems[2] = 0;
              result_55.m_backend.data._M_elems[3] = 0;
              result_55.m_backend.data._M_elems[4] = 0;
              result_55.m_backend.data._M_elems[5] = 0;
              result_55.m_backend.data._M_elems[6] = 0;
              result_55.m_backend.data._M_elems[7] = 0;
              result_55.m_backend.data._M_elems[8] = 0;
              result_55.m_backend.data._M_elems[9] = 0;
              result_55.m_backend.data._M_elems[10] = 0;
              result_55.m_backend.data._M_elems[0xb] = 0;
              result_55.m_backend.data._M_elems[0xc] = 0;
              result_55.m_backend.data._M_elems[0xd] = 0;
              result_55.m_backend.data._M_elems[0xe] = 0;
              result_55.m_backend.data._M_elems[0xf] = 0;
              result_55.m_backend.data._M_elems[0x10] = 0;
              result_55.m_backend.data._M_elems[0x11] = 0;
              result_55.m_backend.data._M_elems[0x12] = 0;
              result_55.m_backend.data._M_elems[0x13] = 0;
              result_55.m_backend.data._M_elems[0x14] = 0;
              result_55.m_backend.data._M_elems[0x15] = 0;
              result_55.m_backend.data._M_elems[0x16] = 0;
              result_55.m_backend.data._M_elems[0x17] = 0;
              result_55.m_backend.data._M_elems[0x18] = 0;
              result_55.m_backend.data._M_elems[0x19] = 0;
              result_55.m_backend.data._M_elems._104_5_ = 0;
              result_55.m_backend.data._M_elems[0x1b]._1_3_ = 0;
              result_55.m_backend.exp = 0;
              result_55.m_backend.neg = false;
              boost::multiprecision::default_ops::
              eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                        (&result_55.m_backend,&r_dbl_bounded.m_backend,&result_7.m_backend);
              result_8.m_backend.fpclass = cpp_dec_float_finite;
              result_8.m_backend.prec_elem = 0x1c;
              result_8.m_backend.data._M_elems[0] = 0;
              result_8.m_backend.data._M_elems[1] = 0;
              result_8.m_backend.data._M_elems[2] = 0;
              result_8.m_backend.data._M_elems[3] = 0;
              result_8.m_backend.data._M_elems[4] = 0;
              result_8.m_backend.data._M_elems[5] = 0;
              result_8.m_backend.data._M_elems[6] = 0;
              result_8.m_backend.data._M_elems[7] = 0;
              result_8.m_backend.data._M_elems[8] = 0;
              result_8.m_backend.data._M_elems[9] = 0;
              result_8.m_backend.data._M_elems[10] = 0;
              result_8.m_backend.data._M_elems[0xb] = 0;
              result_8.m_backend.data._M_elems[0xc] = 0;
              result_8.m_backend.data._M_elems[0xd] = 0;
              result_8.m_backend.data._M_elems[0xe] = 0;
              result_8.m_backend.data._M_elems[0xf] = 0;
              result_8.m_backend.data._M_elems[0x10] = 0;
              result_8.m_backend.data._M_elems[0x11] = 0;
              result_8.m_backend.data._M_elems[0x12] = 0;
              result_8.m_backend.data._M_elems[0x13] = 0;
              result_8.m_backend.data._M_elems[0x14] = 0;
              result_8.m_backend.data._M_elems[0x15] = 0;
              result_8.m_backend.data._M_elems[0x16] = 0;
              result_8.m_backend.data._M_elems[0x17] = 0;
              result_8.m_backend.data._M_elems[0x18] = 0;
              result_8.m_backend.data._M_elems[0x19] = 0;
              result_8.m_backend.data._M_elems._104_5_ = 0;
              result_8.m_backend.data._M_elems[0x1b]._1_3_ = 0;
              result_8.m_backend.exp = 0;
              result_8.m_backend.neg = false;
              boost::multiprecision::default_ops::
              eval_add_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                        (&result_8.m_backend,&result_55.m_backend,&result_5.m_backend);
              result_9.m_backend.fpclass = cpp_dec_float_finite;
              result_9.m_backend.prec_elem = 0x1c;
              result_9.m_backend.data._M_elems[0] = 0;
              result_9.m_backend.data._M_elems[1] = 0;
              result_9.m_backend.data._M_elems[2] = 0;
              result_9.m_backend.data._M_elems[3] = 0;
              result_9.m_backend.data._M_elems[4] = 0;
              result_9.m_backend.data._M_elems[5] = 0;
              result_9.m_backend.data._M_elems[6] = 0;
              result_9.m_backend.data._M_elems[7] = 0;
              result_9.m_backend.data._M_elems[8] = 0;
              result_9.m_backend.data._M_elems[9] = 0;
              result_9.m_backend.data._M_elems[10] = 0;
              result_9.m_backend.data._M_elems[0xb] = 0;
              result_9.m_backend.data._M_elems[0xc] = 0;
              result_9.m_backend.data._M_elems[0xd] = 0;
              result_9.m_backend.data._M_elems[0xe] = 0;
              result_9.m_backend.data._M_elems[0xf] = 0;
              result_9.m_backend.data._M_elems[0x10] = 0;
              result_9.m_backend.data._M_elems[0x11] = 0;
              result_9.m_backend.data._M_elems[0x12] = 0;
              result_9.m_backend.data._M_elems[0x13] = 0;
              result_9.m_backend.data._M_elems[0x14] = 0;
              result_9.m_backend.data._M_elems[0x15] = 0;
              result_9.m_backend.data._M_elems[0x16] = 0;
              result_9.m_backend.data._M_elems[0x17] = 0;
              result_9.m_backend.data._M_elems[0x18] = 0;
              result_9.m_backend.data._M_elems[0x19] = 0;
              result_9.m_backend.data._M_elems._104_5_ = 0;
              result_9.m_backend.data._M_elems[0x1b]._1_3_ = 0;
              result_9.m_backend.exp = 0;
              result_9.m_backend.neg = false;
              boost::multiprecision::default_ops::
              eval_add_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                        (&result_9.m_backend,&result_8.m_backend,&x.m_backend);
              puVar5 = (uint *)((long)&(this->rowWeight).data.
                                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data
                               + lVar17);
              lStack_15f0 = 0x1c;
              pcVar9 = &result_9.m_backend;
              puVar15 = puVar5;
              goto LAB_004355b9;
            }
            result_55.m_backend.fpclass = cpp_dec_float_finite;
            result_55.m_backend.prec_elem = 0x1c;
            result_55.m_backend.data._M_elems[0] = 0;
            result_55.m_backend.data._M_elems[1] = 0;
            result_55.m_backend.data._M_elems[2] = 0;
            result_55.m_backend.data._M_elems[3] = 0;
            result_55.m_backend.data._M_elems[4] = 0;
            result_55.m_backend.data._M_elems[5] = 0;
            result_55.m_backend.data._M_elems[6] = 0;
            result_55.m_backend.data._M_elems[7] = 0;
            result_55.m_backend.data._M_elems[8] = 0;
            result_55.m_backend.data._M_elems[9] = 0;
            result_55.m_backend.data._M_elems[10] = 0;
            result_55.m_backend.data._M_elems[0xb] = 0;
            result_55.m_backend.data._M_elems[0xc] = 0;
            result_55.m_backend.data._M_elems[0xd] = 0;
            result_55.m_backend.data._M_elems[0xe] = 0;
            result_55.m_backend.data._M_elems[0xf] = 0;
            result_55.m_backend.data._M_elems[0x10] = 0;
            result_55.m_backend.data._M_elems[0x11] = 0;
            result_55.m_backend.data._M_elems[0x12] = 0;
            result_55.m_backend.data._M_elems[0x13] = 0;
            result_55.m_backend.data._M_elems[0x14] = 0;
            result_55.m_backend.data._M_elems[0x15] = 0;
            result_55.m_backend.data._M_elems[0x16] = 0;
            result_55.m_backend.data._M_elems[0x17] = 0;
            result_55.m_backend.data._M_elems[0x18] = 0;
            result_55.m_backend.data._M_elems[0x19] = 0;
            result_55.m_backend.data._M_elems._104_5_ = 0;
            result_55.m_backend.data._M_elems[0x1b]._1_3_ = 0;
            result_55.m_backend.exp = 0;
            result_55.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_add_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                      (&result_55.m_backend,&r_dbl_bounded.m_backend,&result_7.m_backend);
            result_8.m_backend.fpclass = cpp_dec_float_finite;
            result_8.m_backend.prec_elem = 0x1c;
            result_8.m_backend.data._M_elems[0] = 0;
            result_8.m_backend.data._M_elems[1] = 0;
            result_8.m_backend.data._M_elems[2] = 0;
            result_8.m_backend.data._M_elems[3] = 0;
            result_8.m_backend.data._M_elems[4] = 0;
            result_8.m_backend.data._M_elems[5] = 0;
            result_8.m_backend.data._M_elems[6] = 0;
            result_8.m_backend.data._M_elems[7] = 0;
            result_8.m_backend.data._M_elems[8] = 0;
            result_8.m_backend.data._M_elems[9] = 0;
            result_8.m_backend.data._M_elems[10] = 0;
            result_8.m_backend.data._M_elems[0xb] = 0;
            result_8.m_backend.data._M_elems[0xc] = 0;
            result_8.m_backend.data._M_elems[0xd] = 0;
            result_8.m_backend.data._M_elems[0xe] = 0;
            result_8.m_backend.data._M_elems[0xf] = 0;
            result_8.m_backend.data._M_elems[0x10] = 0;
            result_8.m_backend.data._M_elems[0x11] = 0;
            result_8.m_backend.data._M_elems[0x12] = 0;
            result_8.m_backend.data._M_elems[0x13] = 0;
            result_8.m_backend.data._M_elems[0x14] = 0;
            result_8.m_backend.data._M_elems[0x15] = 0;
            result_8.m_backend.data._M_elems[0x16] = 0;
            result_8.m_backend.data._M_elems[0x17] = 0;
            result_8.m_backend.data._M_elems[0x18] = 0;
            result_8.m_backend.data._M_elems[0x19] = 0;
            result_8.m_backend.data._M_elems._104_5_ = 0;
            result_8.m_backend.data._M_elems[0x1b]._1_3_ = 0;
            result_8.m_backend.exp = 0;
            result_8.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                      (&result_8.m_backend,&result_55.m_backend,&result_4.m_backend);
            pcVar9 = &x.m_backend;
          }
          else {
            result_55.m_backend.fpclass = cpp_dec_float_finite;
            result_55.m_backend.prec_elem = 0x1c;
            result_55.m_backend.data._M_elems[0] = 0;
            result_55.m_backend.data._M_elems[1] = 0;
            result_55.m_backend.data._M_elems[2] = 0;
            result_55.m_backend.data._M_elems[3] = 0;
            result_55.m_backend.data._M_elems[4] = 0;
            result_55.m_backend.data._M_elems[5] = 0;
            result_55.m_backend.data._M_elems[6] = 0;
            result_55.m_backend.data._M_elems[7] = 0;
            result_55.m_backend.data._M_elems[8] = 0;
            result_55.m_backend.data._M_elems[9] = 0;
            result_55.m_backend.data._M_elems[10] = 0;
            result_55.m_backend.data._M_elems[0xb] = 0;
            result_55.m_backend.data._M_elems[0xc] = 0;
            result_55.m_backend.data._M_elems[0xd] = 0;
            result_55.m_backend.data._M_elems[0xe] = 0;
            result_55.m_backend.data._M_elems[0xf] = 0;
            result_55.m_backend.data._M_elems[0x10] = 0;
            result_55.m_backend.data._M_elems[0x11] = 0;
            result_55.m_backend.data._M_elems[0x12] = 0;
            result_55.m_backend.data._M_elems[0x13] = 0;
            result_55.m_backend.data._M_elems[0x14] = 0;
            result_55.m_backend.data._M_elems[0x15] = 0;
            result_55.m_backend.data._M_elems[0x16] = 0;
            result_55.m_backend.data._M_elems[0x17] = 0;
            result_55.m_backend.data._M_elems[0x18] = 0;
            result_55.m_backend.data._M_elems[0x19] = 0;
            result_55.m_backend.data._M_elems._104_5_ = 0;
            result_55.m_backend.data._M_elems[0x1b]._1_3_ = 0;
            result_55.m_backend.exp = 0;
            result_55.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                      (&result_55.m_backend,&r_bounded.m_backend,&result_4.m_backend);
            result_8.m_backend.fpclass = cpp_dec_float_finite;
            result_8.m_backend.prec_elem = 0x1c;
            result_8.m_backend.data._M_elems[0] = 0;
            result_8.m_backend.data._M_elems[1] = 0;
            result_8.m_backend.data._M_elems[2] = 0;
            result_8.m_backend.data._M_elems[3] = 0;
            result_8.m_backend.data._M_elems[4] = 0;
            result_8.m_backend.data._M_elems[5] = 0;
            result_8.m_backend.data._M_elems[6] = 0;
            result_8.m_backend.data._M_elems[7] = 0;
            result_8.m_backend.data._M_elems[8] = 0;
            result_8.m_backend.data._M_elems[9] = 0;
            result_8.m_backend.data._M_elems[10] = 0;
            result_8.m_backend.data._M_elems[0xb] = 0;
            result_8.m_backend.data._M_elems[0xc] = 0;
            result_8.m_backend.data._M_elems[0xd] = 0;
            result_8.m_backend.data._M_elems[0xe] = 0;
            result_8.m_backend.data._M_elems[0xf] = 0;
            result_8.m_backend.data._M_elems[0x10] = 0;
            result_8.m_backend.data._M_elems[0x11] = 0;
            result_8.m_backend.data._M_elems[0x12] = 0;
            result_8.m_backend.data._M_elems[0x13] = 0;
            result_8.m_backend.data._M_elems[0x14] = 0;
            result_8.m_backend.data._M_elems[0x15] = 0;
            result_8.m_backend.data._M_elems[0x16] = 0;
            result_8.m_backend.data._M_elems[0x17] = 0;
            result_8.m_backend.data._M_elems[0x18] = 0;
            result_8.m_backend.data._M_elems[0x19] = 0;
            result_8.m_backend.data._M_elems._104_5_ = 0;
            result_8.m_backend.data._M_elems[0x1b]._1_3_ = 0;
            result_8.m_backend.exp = 0;
            result_8.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_add_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                      (&result_8.m_backend,&result_55.m_backend,&x.m_backend);
            pcVar9 = &result_7.m_backend;
          }
          result_9.m_backend.fpclass = cpp_dec_float_finite;
          result_9.m_backend.prec_elem = 0x1c;
          result_9.m_backend.neg = false;
          result_9.m_backend.exp = 0;
          result_9.m_backend.data._M_elems[0x1b]._1_3_ = 0;
          result_9.m_backend.data._M_elems._104_5_ = 0;
          result_9.m_backend.data._M_elems[0x18] = 0;
          result_9.m_backend.data._M_elems[0x19] = 0;
          result_9.m_backend.data._M_elems[0x16] = 0;
          result_9.m_backend.data._M_elems[0x17] = 0;
          result_9.m_backend.data._M_elems[0x14] = 0;
          result_9.m_backend.data._M_elems[0x15] = 0;
          result_9.m_backend.data._M_elems[0x12] = 0;
          result_9.m_backend.data._M_elems[0x13] = 0;
          result_9.m_backend.data._M_elems[0x10] = 0;
          result_9.m_backend.data._M_elems[0x11] = 0;
          result_9.m_backend.data._M_elems[0xe] = 0;
          result_9.m_backend.data._M_elems[0xf] = 0;
          result_9.m_backend.data._M_elems[0xc] = 0;
          result_9.m_backend.data._M_elems[0xd] = 0;
          result_9.m_backend.data._M_elems[10] = 0;
          result_9.m_backend.data._M_elems[0xb] = 0;
          result_9.m_backend.data._M_elems[8] = 0;
          result_9.m_backend.data._M_elems[9] = 0;
          result_9.m_backend.data._M_elems[6] = 0;
          result_9.m_backend.data._M_elems[7] = 0;
          result_9.m_backend.data._M_elems[4] = 0;
          result_9.m_backend.data._M_elems[5] = 0;
          result_9.m_backend.data._M_elems[2] = 0;
          result_9.m_backend.data._M_elems[3] = 0;
          result_9.m_backend.data._M_elems[0] = 0;
          result_9.m_backend.data._M_elems[1] = 0;
          boost::multiprecision::default_ops::
          eval_add_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    (&result_9.m_backend,&result_8.m_backend,pcVar9);
          pnVar1 = (this->rowWeight).data.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pcVar9 = &result_9.m_backend;
          puVar15 = (uint *)((long)&pnVar1[-1].m_backend.data + lVar17);
          for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
            *puVar15 = (pcVar9->data)._M_elems[0];
            pcVar9 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar9 + (ulong)bVar19 * -8 + 4);
            puVar15 = puVar15 + (ulong)bVar19 * -2 + 1;
          }
          *(int *)((long)&(pnVar1->m_backend).data + lVar17 + -0x10) = result_9.m_backend.exp;
          *(bool *)((long)&(pnVar1->m_backend).data + lVar17 + -0xc) = result_9.m_backend.neg;
          *(undefined8 *)((long)&(pnVar1->m_backend).data + lVar17 + -8) =
               result_9.m_backend._120_8_;
          (this->rowRight).data[uVar16 - 1] = true;
        }
      }
      else {
        pnVar1 = (base->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .left.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pdVar3 = (double *)infinity();
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                  (&result_9.m_backend,-*pdVar3,(type *)0x0);
        tVar2 = boost::multiprecision::operator>
                          ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)((long)&pnVar1[-1].m_backend.data + lVar17),&result_9);
        if (!tVar2) {
          result_8.m_backend.fpclass = cpp_dec_float_finite;
          result_8.m_backend.prec_elem = 0x1c;
          result_8.m_backend.data._M_elems[0] = 0;
          result_8.m_backend.data._M_elems[1] = 0;
          result_8.m_backend.data._M_elems[2] = 0;
          result_8.m_backend.data._M_elems[3] = 0;
          result_8.m_backend.data._M_elems[4] = 0;
          result_8.m_backend.data._M_elems[5] = 0;
          result_8.m_backend.data._M_elems[6] = 0;
          result_8.m_backend.data._M_elems[7] = 0;
          result_8.m_backend.data._M_elems[8] = 0;
          result_8.m_backend.data._M_elems[9] = 0;
          result_8.m_backend.data._M_elems[10] = 0;
          result_8.m_backend.data._M_elems[0xb] = 0;
          result_8.m_backend.data._M_elems[0xc] = 0;
          result_8.m_backend.data._M_elems[0xd] = 0;
          result_8.m_backend.data._M_elems[0xe] = 0;
          result_8.m_backend.data._M_elems[0xf] = 0;
          result_8.m_backend.data._M_elems[0x10] = 0;
          result_8.m_backend.data._M_elems[0x11] = 0;
          result_8.m_backend.data._M_elems[0x12] = 0;
          result_8.m_backend.data._M_elems[0x13] = 0;
          result_8.m_backend.data._M_elems[0x14] = 0;
          result_8.m_backend.data._M_elems[0x15] = 0;
          result_8.m_backend.data._M_elems[0x16] = 0;
          result_8.m_backend.data._M_elems[0x17] = 0;
          result_8.m_backend.data._M_elems[0x18] = 0;
          result_8.m_backend.data._M_elems[0x19] = 0;
          result_8.m_backend.data._M_elems._104_5_ = 0;
          result_8.m_backend.data._M_elems[0x1b]._1_3_ = 0;
          result_8.m_backend.exp = 0;
          result_8.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_add_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    (&result_8.m_backend,&r_free.m_backend,&x.m_backend);
          pnVar12 = &result_7;
          pmVar14 = local_9b0;
          for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
            *(uint *)pmVar14 = (pnVar12->m_backend).data._M_elems[0];
            pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar12 + ((ulong)bVar19 * -2 + 1) * 4);
            pmVar14 = pmVar14 + (ulong)bVar19 * -8 + 4;
          }
          local_940 = result_7.m_backend.exp;
          local_93c = result_7.m_backend.neg;
          local_938 = result_7.m_backend.fpclass;
          iStack_934 = result_7.m_backend.prec_elem;
          boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    ((type *)&result_55.m_backend,local_9b0,
                     (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)local_9b0);
          result_9.m_backend.fpclass = cpp_dec_float_finite;
          result_9.m_backend.prec_elem = 0x1c;
          result_9.m_backend.data._M_elems[0] = 0;
          result_9.m_backend.data._M_elems[1] = 0;
          result_9.m_backend.data._M_elems[2] = 0;
          result_9.m_backend.data._M_elems[3] = 0;
          result_9.m_backend.data._M_elems[4] = 0;
          result_9.m_backend.data._M_elems[5] = 0;
          result_9.m_backend.data._M_elems[6] = 0;
          result_9.m_backend.data._M_elems[7] = 0;
          result_9.m_backend.data._M_elems[8] = 0;
          result_9.m_backend.data._M_elems[9] = 0;
          result_9.m_backend.data._M_elems[10] = 0;
          result_9.m_backend.data._M_elems[0xb] = 0;
          result_9.m_backend.data._M_elems[0xc] = 0;
          result_9.m_backend.data._M_elems[0xd] = 0;
          result_9.m_backend.data._M_elems[0xe] = 0;
          result_9.m_backend.data._M_elems[0xf] = 0;
          result_9.m_backend.data._M_elems[0x10] = 0;
          result_9.m_backend.data._M_elems[0x11] = 0;
          result_9.m_backend.data._M_elems[0x12] = 0;
          result_9.m_backend.data._M_elems[0x13] = 0;
          result_9.m_backend.data._M_elems[0x14] = 0;
          result_9.m_backend.data._M_elems[0x15] = 0;
          result_9.m_backend.data._M_elems[0x16] = 0;
          result_9.m_backend.data._M_elems[0x17] = 0;
          result_9.m_backend.data._M_elems[0x18] = 0;
          result_9.m_backend.data._M_elems[0x19] = 0;
          result_9.m_backend.data._M_elems._104_5_ = 0;
          result_9.m_backend.data._M_elems[0x1b]._1_3_ = 0;
          result_9.m_backend.exp = 0;
          result_9.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    (&result_9.m_backend,&result_8.m_backend,&result_55.m_backend);
          goto LAB_00435872;
        }
        result_55.m_backend.fpclass = cpp_dec_float_finite;
        result_55.m_backend.prec_elem = 0x1c;
        result_55.m_backend.data._M_elems[0] = 0;
        result_55.m_backend.data._M_elems[1] = 0;
        result_55.m_backend.data._M_elems[2] = 0;
        result_55.m_backend.data._M_elems[3] = 0;
        result_55.m_backend.data._M_elems[4] = 0;
        result_55.m_backend.data._M_elems[5] = 0;
        result_55.m_backend.data._M_elems[6] = 0;
        result_55.m_backend.data._M_elems[7] = 0;
        result_55.m_backend.data._M_elems[8] = 0;
        result_55.m_backend.data._M_elems[9] = 0;
        result_55.m_backend.data._M_elems[10] = 0;
        result_55.m_backend.data._M_elems[0xb] = 0;
        result_55.m_backend.data._M_elems[0xc] = 0;
        result_55.m_backend.data._M_elems[0xd] = 0;
        result_55.m_backend.data._M_elems[0xe] = 0;
        result_55.m_backend.data._M_elems[0xf] = 0;
        result_55.m_backend.data._M_elems[0x10] = 0;
        result_55.m_backend.data._M_elems[0x11] = 0;
        result_55.m_backend.data._M_elems[0x12] = 0;
        result_55.m_backend.data._M_elems[0x13] = 0;
        result_55.m_backend.data._M_elems[0x14] = 0;
        result_55.m_backend.data._M_elems[0x15] = 0;
        result_55.m_backend.data._M_elems[0x16] = 0;
        result_55.m_backend.data._M_elems[0x17] = 0;
        result_55.m_backend.data._M_elems[0x18] = 0;
        result_55.m_backend.data._M_elems[0x19] = 0;
        result_55.m_backend.data._M_elems._104_5_ = 0;
        result_55.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        result_55.m_backend.exp = 0;
        result_55.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_add_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (&result_55.m_backend,&r_bounded.m_backend,&result_5.m_backend);
        result_8.m_backend.fpclass = cpp_dec_float_finite;
        result_8.m_backend.prec_elem = 0x1c;
        result_8.m_backend.data._M_elems[0] = 0;
        result_8.m_backend.data._M_elems[1] = 0;
        result_8.m_backend.data._M_elems[2] = 0;
        result_8.m_backend.data._M_elems[3] = 0;
        result_8.m_backend.data._M_elems[4] = 0;
        result_8.m_backend.data._M_elems[5] = 0;
        result_8.m_backend.data._M_elems[6] = 0;
        result_8.m_backend.data._M_elems[7] = 0;
        result_8.m_backend.data._M_elems[8] = 0;
        result_8.m_backend.data._M_elems[9] = 0;
        result_8.m_backend.data._M_elems[10] = 0;
        result_8.m_backend.data._M_elems[0xb] = 0;
        result_8.m_backend.data._M_elems[0xc] = 0;
        result_8.m_backend.data._M_elems[0xd] = 0;
        result_8.m_backend.data._M_elems[0xe] = 0;
        result_8.m_backend.data._M_elems[0xf] = 0;
        result_8.m_backend.data._M_elems[0x10] = 0;
        result_8.m_backend.data._M_elems[0x11] = 0;
        result_8.m_backend.data._M_elems[0x12] = 0;
        result_8.m_backend.data._M_elems[0x13] = 0;
        result_8.m_backend.data._M_elems[0x14] = 0;
        result_8.m_backend.data._M_elems[0x15] = 0;
        result_8.m_backend.data._M_elems[0x16] = 0;
        result_8.m_backend.data._M_elems[0x17] = 0;
        result_8.m_backend.data._M_elems[0x18] = 0;
        result_8.m_backend.data._M_elems[0x19] = 0;
        result_8.m_backend.data._M_elems._104_5_ = 0;
        result_8.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        result_8.m_backend.exp = 0;
        result_8.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_add_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (&result_8.m_backend,&result_55.m_backend,&x.m_backend);
        result_9.m_backend.fpclass = cpp_dec_float_finite;
        result_9.m_backend.prec_elem = 0x1c;
        result_9.m_backend.data._M_elems[0] = 0;
        result_9.m_backend.data._M_elems[1] = 0;
        result_9.m_backend.data._M_elems[2] = 0;
        result_9.m_backend.data._M_elems[3] = 0;
        result_9.m_backend.data._M_elems[4] = 0;
        result_9.m_backend.data._M_elems[5] = 0;
        result_9.m_backend.data._M_elems[6] = 0;
        result_9.m_backend.data._M_elems[7] = 0;
        result_9.m_backend.data._M_elems[8] = 0;
        result_9.m_backend.data._M_elems[9] = 0;
        result_9.m_backend.data._M_elems[10] = 0;
        result_9.m_backend.data._M_elems[0xb] = 0;
        result_9.m_backend.data._M_elems[0xc] = 0;
        result_9.m_backend.data._M_elems[0xd] = 0;
        result_9.m_backend.data._M_elems[0xe] = 0;
        result_9.m_backend.data._M_elems[0xf] = 0;
        result_9.m_backend.data._M_elems[0x10] = 0;
        result_9.m_backend.data._M_elems[0x11] = 0;
        result_9.m_backend.data._M_elems[0x12] = 0;
        result_9.m_backend.data._M_elems[0x13] = 0;
        result_9.m_backend.data._M_elems[0x14] = 0;
        result_9.m_backend.data._M_elems[0x15] = 0;
        result_9.m_backend.data._M_elems[0x16] = 0;
        result_9.m_backend.data._M_elems[0x17] = 0;
        result_9.m_backend.data._M_elems[0x18] = 0;
        result_9.m_backend.data._M_elems[0x19] = 0;
        result_9.m_backend.data._M_elems._104_5_ = 0;
        result_9.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        result_9.m_backend.exp = 0;
        result_9.m_backend.neg = false;
        pcVar9 = &result_9.m_backend;
        boost::multiprecision::default_ops::
        eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (pcVar9,&result_8.m_backend,&result_7.m_backend);
        puVar5 = (uint *)((long)&(this->rowWeight).data.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data +
                         lVar17);
        lStack_15f0 = 0x1c;
        puVar15 = puVar5;
LAB_004355b9:
        for (; lStack_15f0 != 0; lStack_15f0 = lStack_15f0 + -1) {
          *puVar15 = (pcVar9->data)._M_elems[0];
          pcVar9 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar9 + (ulong)bVar19 * -8 + 4);
          puVar15 = puVar15 + (ulong)bVar19 * -2 + 1;
        }
        puVar5[0x1c] = result_9.m_backend.exp;
        *(bool *)(puVar5 + 0x1d) = result_9.m_backend.neg;
        puVar5[0x1e] = result_9.m_backend.fpclass;
        puVar5[0x1f] = result_9.m_backend.prec_elem;
        (this->rowRight).data[uVar16 - 1] = false;
      }
      lVar17 = lVar17 + -0x80;
    }
  }
  else {
    nne.m_backend.data._M_elems[0] = 0xd2f1a9fc;
    nne.m_backend.data._M_elems[1] = 0x3f50624d;
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::maxAbs((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)&bx.m_backend,this_00);
    ax.m_backend.fpclass = cpp_dec_float_finite;
    ax.m_backend.prec_elem = 0x1c;
    ax.m_backend.data._M_elems[0] = 0;
    ax.m_backend.data._M_elems[1] = 0;
    ax.m_backend.data._M_elems[2] = 0;
    ax.m_backend.data._M_elems[3] = 0;
    ax.m_backend.data._M_elems[4] = 0;
    ax.m_backend.data._M_elems[5] = 0;
    ax.m_backend.data._M_elems[6] = 0;
    ax.m_backend.data._M_elems[7] = 0;
    ax.m_backend.data._M_elems[8] = 0;
    ax.m_backend.data._M_elems[9] = 0;
    ax.m_backend.data._M_elems[10] = 0;
    ax.m_backend.data._M_elems[0xb] = 0;
    ax.m_backend.data._M_elems[0xc] = 0;
    ax.m_backend.data._M_elems[0xd] = 0;
    ax.m_backend.data._M_elems[0xe] = 0;
    ax.m_backend.data._M_elems[0xf] = 0;
    ax.m_backend.data._M_elems[0x10] = 0;
    ax.m_backend.data._M_elems[0x11] = 0;
    ax.m_backend.data._M_elems[0x12] = 0;
    ax.m_backend.data._M_elems[0x13] = 0;
    ax.m_backend.data._M_elems[0x14] = 0;
    ax.m_backend.data._M_elems[0x15] = 0;
    ax.m_backend.data._M_elems[0x16] = 0;
    ax.m_backend.data._M_elems[0x17] = 0;
    ax.m_backend.data._M_elems[0x18] = 0;
    ax.m_backend.data._M_elems[0x19] = 0;
    ax.m_backend.data._M_elems._104_5_ = 0;
    ax.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    ax.m_backend.exp = 0;
    ax.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,double>
              (&ax.m_backend,(double *)&nne,&bx.m_backend);
    nne.m_backend.data._M_elems[0] = 0;
    nne.m_backend.data._M_elems[1] = 0x3ff00000;
    bx.m_backend.fpclass = cpp_dec_float_finite;
    bx.m_backend.prec_elem = 0x1c;
    bx.m_backend.data._M_elems[0] = 0;
    bx.m_backend.data._M_elems[1] = 0;
    bx.m_backend.data._M_elems[2] = 0;
    bx.m_backend.data._M_elems[3] = 0;
    bx.m_backend.data._M_elems[4] = 0;
    bx.m_backend.data._M_elems[5] = 0;
    bx.m_backend.data._M_elems[6] = 0;
    bx.m_backend.data._M_elems[7] = 0;
    bx.m_backend.data._M_elems[8] = 0;
    bx.m_backend.data._M_elems[9] = 0;
    bx.m_backend.data._M_elems[10] = 0;
    bx.m_backend.data._M_elems[0xb] = 0;
    bx.m_backend.data._M_elems[0xc] = 0;
    bx.m_backend.data._M_elems[0xd] = 0;
    bx.m_backend.data._M_elems[0xe] = 0;
    bx.m_backend.data._M_elems[0xf] = 0;
    bx.m_backend.data._M_elems[0x10] = 0;
    bx.m_backend.data._M_elems[0x11] = 0;
    bx.m_backend.data._M_elems[0x12] = 0;
    bx.m_backend.data._M_elems[0x13] = 0;
    bx.m_backend.data._M_elems[0x14] = 0;
    bx.m_backend.data._M_elems[0x15] = 0;
    bx.m_backend.data._M_elems[0x16] = 0;
    bx.m_backend.data._M_elems[0x17] = 0;
    bx.m_backend.data._M_elems[0x18] = 0;
    bx.m_backend.data._M_elems[0x19] = 0;
    bx.m_backend.data._M_elems._104_5_ = 0;
    bx.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    bx.m_backend.exp = 0;
    bx.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,double>
              (&bx.m_backend,(double *)&nne,&local_11b8);
    c_fixed.m_backend.data._M_elems._0_8_ =
         SEXT48((base->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.thenum);
    nne.m_backend.fpclass = cpp_dec_float_finite;
    nne.m_backend.prec_elem = 0x1c;
    nne.m_backend.data._M_elems[0] = 0;
    nne.m_backend.data._M_elems[1] = 0;
    nne.m_backend.data._M_elems[2] = 0;
    nne.m_backend.data._M_elems[3] = 0;
    nne.m_backend.data._M_elems[4] = 0;
    nne.m_backend.data._M_elems[5] = 0;
    nne.m_backend.data._M_elems[6] = 0;
    nne.m_backend.data._M_elems[7] = 0;
    nne.m_backend.data._M_elems[8] = 0;
    nne.m_backend.data._M_elems[9] = 0;
    nne.m_backend.data._M_elems[10] = 0;
    nne.m_backend.data._M_elems[0xb] = 0;
    nne.m_backend.data._M_elems[0xc] = 0;
    nne.m_backend.data._M_elems[0xd] = 0;
    nne.m_backend.data._M_elems[0xe] = 0;
    nne.m_backend.data._M_elems[0xf] = 0;
    nne.m_backend.data._M_elems[0x18] = 0;
    nne.m_backend.data._M_elems[0x19] = 0;
    nne.m_backend.data._M_elems._104_5_ = 0;
    nne.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    nne.m_backend.exp = 0;
    nne.m_backend.neg = false;
    nne.m_backend.data._M_elems[0x10] = 0;
    nne.m_backend.data._M_elems[0x11] = 0;
    nne.m_backend.data._M_elems[0x12] = 0;
    nne.m_backend.data._M_elems[0x13] = 0;
    nne.m_backend.data._M_elems[0x14] = 0;
    nne.m_backend.data._M_elems[0x15] = 0;
    nne.m_backend.data._M_elems[0x16] = 0;
    nne.m_backend.data._M_elems[0x17] = 0;
    boost::multiprecision::default_ops::
    eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,long_long>
              (&nne.m_backend,&ax.m_backend,(longlong *)&c_fixed);
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (&c_fixed.m_backend,100000.0,(type *)0x0);
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
              (&r_fixed.m_backend,0,(type *)0x0);
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (&c_dbl_bounded.m_backend,10.0,(type *)0x0);
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
              (&r_dbl_bounded.m_backend,0,(type *)0x0);
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (&c_bounded.m_backend,10.0,(type *)0x0);
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
              (&r_bounded.m_backend,0,(type *)0x0);
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (&c_free.m_backend,-10000.0,(type *)0x0);
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (&r_free.m_backend,-100000.0,(type *)0x0);
    uVar16 = (ulong)(uint)(base->
                          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .
                          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .set.thenum;
    lVar17 = uVar16 << 7;
    while( true ) {
      if ((int)uVar16 < 1) break;
      x.m_backend.data._M_elems._0_8_ =
           (long)(base->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.theitem
                 [(base->
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .set.thekey[uVar16 - 1].idx].data.
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .memused + -1;
      n.m_backend.fpclass = cpp_dec_float_finite;
      n.m_backend.prec_elem = 0x1c;
      n.m_backend.data._M_elems[0] = 0;
      n.m_backend.data._M_elems[1] = 0;
      n.m_backend.data._M_elems[2] = 0;
      n.m_backend.data._M_elems[3] = 0;
      n.m_backend.data._M_elems[4] = 0;
      n.m_backend.data._M_elems[5] = 0;
      n.m_backend.data._M_elems[6] = 0;
      n.m_backend.data._M_elems[7] = 0;
      n.m_backend.data._M_elems[8] = 0;
      n.m_backend.data._M_elems[9] = 0;
      n.m_backend.data._M_elems[10] = 0;
      n.m_backend.data._M_elems[0xb] = 0;
      n.m_backend.data._M_elems[0xc] = 0;
      n.m_backend.data._M_elems[0xd] = 0;
      n.m_backend.data._M_elems[0xe] = 0;
      n.m_backend.data._M_elems[0xf] = 0;
      n.m_backend.data._M_elems[0x10] = 0;
      n.m_backend.data._M_elems[0x11] = 0;
      n.m_backend.data._M_elems[0x12] = 0;
      n.m_backend.data._M_elems[0x13] = 0;
      n.m_backend.data._M_elems[0x14] = 0;
      n.m_backend.data._M_elems[0x15] = 0;
      n.m_backend.data._M_elems[0x16] = 0;
      n.m_backend.data._M_elems[0x17] = 0;
      n.m_backend.data._M_elems[0x18] = 0;
      n.m_backend.data._M_elems[0x19] = 0;
      n.m_backend.data._M_elems._104_5_ = 0;
      n.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      n.m_backend.exp = 0;
      n.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,long_long>
                (&n.m_backend,&nne.m_backend,(longlong *)&x.m_backend);
      x.m_backend.fpclass = cpp_dec_float_finite;
      x.m_backend.prec_elem = 0x1c;
      x.m_backend.data._M_elems[0] = 0;
      x.m_backend.data._M_elems[1] = 0;
      x.m_backend.data._M_elems[2] = 0;
      x.m_backend.data._M_elems[3] = 0;
      x.m_backend.data._M_elems[4] = 0;
      x.m_backend.data._M_elems[5] = 0;
      x.m_backend.data._M_elems[6] = 0;
      x.m_backend.data._M_elems[7] = 0;
      x.m_backend.data._M_elems[8] = 0;
      x.m_backend.data._M_elems[9] = 0;
      x.m_backend.data._M_elems[10] = 0;
      x.m_backend.data._M_elems[0xb] = 0;
      x.m_backend.data._M_elems[0xc] = 0;
      x.m_backend.data._M_elems[0xd] = 0;
      x.m_backend.data._M_elems[0xe] = 0;
      x.m_backend.data._M_elems[0xf] = 0;
      x.m_backend.data._M_elems[0x10] = 0;
      x.m_backend.data._M_elems[0x11] = 0;
      x.m_backend.data._M_elems[0x12] = 0;
      x.m_backend.data._M_elems[0x13] = 0;
      x.m_backend.data._M_elems[0x14] = 0;
      x.m_backend.data._M_elems[0x15] = 0;
      x.m_backend.data._M_elems[0x16] = 0;
      x.m_backend.data._M_elems[0x17] = 0;
      x.m_backend.data._M_elems[0x18] = 0;
      x.m_backend.data._M_elems[0x19] = 0;
      x.m_backend.data._M_elems._104_5_ = 0;
      x.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      x.m_backend.exp = 0;
      x.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&x.m_backend,&ax.m_backend,
                 (cpp_dec_float<200U,_int,_void> *)
                 ((long)&(base->
                         super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).
                         super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .object.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar17));
      result_4.m_backend.fpclass = cpp_dec_float_finite;
      result_4.m_backend.prec_elem = 0x1c;
      result_4.m_backend.data._M_elems[0] = 0;
      result_4.m_backend.data._M_elems[1] = 0;
      result_4.m_backend.data._M_elems[2] = 0;
      result_4.m_backend.data._M_elems[3] = 0;
      result_4.m_backend.data._M_elems[4] = 0;
      result_4.m_backend.data._M_elems[5] = 0;
      result_4.m_backend.data._M_elems[6] = 0;
      result_4.m_backend.data._M_elems[7] = 0;
      result_4.m_backend.data._M_elems[8] = 0;
      result_4.m_backend.data._M_elems[9] = 0;
      result_4.m_backend.data._M_elems[10] = 0;
      result_4.m_backend.data._M_elems[0xb] = 0;
      result_4.m_backend.data._M_elems[0xc] = 0;
      result_4.m_backend.data._M_elems[0xd] = 0;
      result_4.m_backend.data._M_elems[0xe] = 0;
      result_4.m_backend.data._M_elems[0xf] = 0;
      result_4.m_backend.data._M_elems[0x10] = 0;
      result_4.m_backend.data._M_elems[0x11] = 0;
      result_4.m_backend.data._M_elems[0x12] = 0;
      result_4.m_backend.data._M_elems[0x13] = 0;
      result_4.m_backend.data._M_elems[0x14] = 0;
      result_4.m_backend.data._M_elems[0x15] = 0;
      result_4.m_backend.data._M_elems[0x16] = 0;
      result_4.m_backend.data._M_elems[0x17] = 0;
      result_4.m_backend.data._M_elems[0x18] = 0;
      result_4.m_backend.data._M_elems[0x19] = 0;
      result_4.m_backend.data._M_elems._104_5_ = 0;
      result_4.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      result_4.m_backend.exp = 0;
      result_4.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&result_4.m_backend,&bx.m_backend,
                 (cpp_dec_float<200U,_int,_void> *)
                 ((long)&(base->
                         super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).
                         super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .up.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar17));
      result_5.m_backend.fpclass = cpp_dec_float_finite;
      result_5.m_backend.prec_elem = 0x1c;
      result_5.m_backend.data._M_elems[0] = 0;
      result_5.m_backend.data._M_elems[1] = 0;
      result_5.m_backend.data._M_elems[2] = 0;
      result_5.m_backend.data._M_elems[3] = 0;
      result_5.m_backend.data._M_elems[4] = 0;
      result_5.m_backend.data._M_elems[5] = 0;
      result_5.m_backend.data._M_elems[6] = 0;
      result_5.m_backend.data._M_elems[7] = 0;
      result_5.m_backend.data._M_elems[8] = 0;
      result_5.m_backend.data._M_elems[9] = 0;
      result_5.m_backend.data._M_elems[10] = 0;
      result_5.m_backend.data._M_elems[0xb] = 0;
      result_5.m_backend.data._M_elems[0xc] = 0;
      result_5.m_backend.data._M_elems[0xd] = 0;
      result_5.m_backend.data._M_elems[0xe] = 0;
      result_5.m_backend.data._M_elems[0xf] = 0;
      result_5.m_backend.data._M_elems[0x10] = 0;
      result_5.m_backend.data._M_elems[0x11] = 0;
      result_5.m_backend.data._M_elems[0x12] = 0;
      result_5.m_backend.data._M_elems[0x13] = 0;
      result_5.m_backend.data._M_elems[0x14] = 0;
      result_5.m_backend.data._M_elems[0x15] = 0;
      result_5.m_backend.data._M_elems[0x16] = 0;
      result_5.m_backend.data._M_elems[0x17] = 0;
      result_5.m_backend.data._M_elems[0x18] = 0;
      result_5.m_backend.data._M_elems[0x19] = 0;
      result_5.m_backend.data._M_elems._104_5_ = 0;
      result_5.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      result_5.m_backend.exp = 0;
      result_5.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&result_5.m_backend,&bx.m_backend,
                 (cpp_dec_float<200U,_int,_void> *)
                 ((long)&(base->
                         super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).
                         super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .low.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar17));
      pnVar1 = (base->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .up.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pdVar3 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                (&result_7.m_backend,*pdVar3,(type *)0x0);
      tVar2 = boost::multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)((long)&pnVar1[-1].m_backend.data + lVar17),
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&result_7.m_backend);
      if (tVar2) {
        result_6.m_backend.fpclass = cpp_dec_float_finite;
        result_6.m_backend.prec_elem = 0x1c;
        result_6.m_backend.data._M_elems[0] = 0;
        result_6.m_backend.data._M_elems[1] = 0;
        result_6.m_backend.data._M_elems[2] = 0;
        result_6.m_backend.data._M_elems[3] = 0;
        result_6.m_backend.data._M_elems[4] = 0;
        result_6.m_backend.data._M_elems[5] = 0;
        result_6.m_backend.data._M_elems[6] = 0;
        result_6.m_backend.data._M_elems[7] = 0;
        result_6.m_backend.data._M_elems[8] = 0;
        result_6.m_backend.data._M_elems[9] = 0;
        result_6.m_backend.data._M_elems[10] = 0;
        result_6.m_backend.data._M_elems[0xb] = 0;
        result_6.m_backend.data._M_elems[0xc] = 0;
        result_6.m_backend.data._M_elems[0xd] = 0;
        result_6.m_backend.data._M_elems[0xe] = 0;
        result_6.m_backend.data._M_elems[0xf] = 0;
        result_6.m_backend.data._M_elems[0x10] = 0;
        result_6.m_backend.data._M_elems[0x11] = 0;
        result_6.m_backend.data._M_elems[0x12] = 0;
        result_6.m_backend.data._M_elems[0x13] = 0;
        result_6.m_backend.data._M_elems[0x14] = 0;
        result_6.m_backend.data._M_elems[0x15] = 0;
        result_6.m_backend.data._M_elems[0x16] = 0;
        result_6.m_backend.data._M_elems[0x17] = 0;
        result_6.m_backend.data._M_elems[0x18] = 0;
        result_6.m_backend.data._M_elems[0x19] = 0;
        result_6.m_backend.data._M_elems._104_5_ = 0;
        result_6.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        result_6.m_backend.exp = 0;
        result_6.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (&result_6.m_backend,
                   (cpp_dec_float<200U,_int,_void> *)
                   ((long)&(base->
                           super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).
                           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .low.val.
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar17),
                   (cpp_dec_float<200U,_int,_void> *)
                   ((long)&(base->
                           super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).
                           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .up.val.
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar17));
        boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  ((type *)&result_7.m_backend,(multiprecision *)&result_6.m_backend,arg);
        tVar2 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&result_7.m_backend,&eps);
        if (tVar2) {
          result_9.m_backend.fpclass = cpp_dec_float_finite;
          result_9.m_backend.prec_elem = 0x1c;
          result_9.m_backend.data._M_elems[0] = 0;
          result_9.m_backend.data._M_elems[1] = 0;
          result_9.m_backend.data._M_elems[2] = 0;
          result_9.m_backend.data._M_elems[3] = 0;
          result_9.m_backend.data._M_elems[4] = 0;
          result_9.m_backend.data._M_elems[5] = 0;
          result_9.m_backend.data._M_elems[6] = 0;
          result_9.m_backend.data._M_elems[7] = 0;
          result_9.m_backend.data._M_elems[8] = 0;
          result_9.m_backend.data._M_elems[9] = 0;
          result_9.m_backend.data._M_elems[10] = 0;
          result_9.m_backend.data._M_elems[0xb] = 0;
          result_9.m_backend.data._M_elems[0xc] = 0;
          result_9.m_backend.data._M_elems[0xd] = 0;
          result_9.m_backend.data._M_elems[0xe] = 0;
          result_9.m_backend.data._M_elems[0xf] = 0;
          result_9.m_backend.data._M_elems[0x10] = 0;
          result_9.m_backend.data._M_elems[0x11] = 0;
          result_9.m_backend.data._M_elems[0x12] = 0;
          result_9.m_backend.data._M_elems[0x13] = 0;
          result_9.m_backend.data._M_elems[0x14] = 0;
          result_9.m_backend.data._M_elems[0x15] = 0;
          result_9.m_backend.data._M_elems[0x16] = 0;
          result_9.m_backend.data._M_elems[0x17] = 0;
          result_9.m_backend.data._M_elems[0x18] = 0;
          result_9.m_backend.data._M_elems[0x19] = 0;
          result_9.m_backend.data._M_elems._104_5_ = 0;
          result_9.m_backend.data._M_elems[0x1b]._1_3_ = 0;
          result_9.m_backend.exp = 0;
          result_9.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_add_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    (&result_9.m_backend,&c_fixed.m_backend,&n.m_backend);
          pnVar12 = &x;
          pmVar14 = local_530;
          for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
            *(uint *)pmVar14 = (pnVar12->m_backend).data._M_elems[0];
            pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar12 + ((ulong)bVar19 * -2 + 1) * 4);
            pmVar14 = pmVar14 + (ulong)bVar19 * -8 + 4;
          }
          local_4c0 = x.m_backend.exp;
          local_4bc = x.m_backend.neg;
          local_4b8 = x.m_backend.fpclass;
          iStack_4b4 = x.m_backend.prec_elem;
          boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    (&result_8,local_530,
                     (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)local_530);
          result_7.m_backend.fpclass = cpp_dec_float_finite;
          result_7.m_backend.prec_elem = 0x1c;
          result_7.m_backend.data._M_elems[0] = 0;
          result_7.m_backend.data._M_elems[1] = 0;
          result_7.m_backend.data._M_elems[2] = 0;
          result_7.m_backend.data._M_elems[3] = 0;
          result_7.m_backend.data._M_elems[4] = 0;
          result_7.m_backend.data._M_elems[5] = 0;
          result_7.m_backend.data._M_elems[6] = 0;
          result_7.m_backend.data._M_elems[7] = 0;
          result_7.m_backend.data._M_elems[8] = 0;
          result_7.m_backend.data._M_elems[9] = 0;
          result_7.m_backend.data._M_elems[10] = 0;
          result_7.m_backend.data._M_elems[0xb] = 0;
          result_7.m_backend.data._M_elems[0xc] = 0;
          result_7.m_backend.data._M_elems[0xd] = 0;
          result_7.m_backend.data._M_elems[0xe] = 0;
          result_7.m_backend.data._M_elems[0xf] = 0;
          result_7.m_backend.data._M_elems[0x10] = 0;
          result_7.m_backend.data._M_elems[0x11] = 0;
          result_7.m_backend.data._M_elems[0x12] = 0;
          result_7.m_backend.data._M_elems[0x13] = 0;
          result_7.m_backend.data._M_elems[0x14] = 0;
          result_7.m_backend.data._M_elems[0x15] = 0;
          result_7.m_backend.data._M_elems[0x16] = 0;
          result_7.m_backend.data._M_elems[0x17] = 0;
          result_7.m_backend.data._M_elems[0x18] = 0;
          result_7.m_backend.data._M_elems[0x19] = 0;
          result_7.m_backend.data._M_elems._104_5_ = 0;
          result_7.m_backend.data._M_elems[0x1b]._1_3_ = 0;
          result_7.m_backend.exp = 0;
          result_7.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_add_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    (&result_7.m_backend,&result_9.m_backend,&result_8.m_backend);
LAB_004339d5:
          pnVar1 = (this->colWeight).data.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pnVar12 = &result_7;
          puVar15 = (uint *)((long)&pnVar1[-1].m_backend.data + lVar17);
          for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
            *puVar15 = (pnVar12->m_backend).data._M_elems[0];
            pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar12 + ((ulong)bVar19 * -2 + 1) * 4);
            puVar15 = puVar15 + (ulong)bVar19 * -2 + 1;
          }
          *(int *)((long)&(pnVar1->m_backend).data + lVar17 + -0x10) = result_7.m_backend.exp;
          *(bool *)((long)&(pnVar1->m_backend).data + lVar17 + -0xc) = result_7.m_backend.neg;
          *(undefined8 *)((long)&(pnVar1->m_backend).data + lVar17 + -8) =
               result_7.m_backend._120_8_;
        }
        else {
          pnVar1 = (base->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .low.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pdVar3 = (double *)infinity();
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                    (&result_7.m_backend,-*pdVar3,(type *)0x0);
          tVar2 = boost::multiprecision::operator>
                            ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)((long)&pnVar1[-1].m_backend.data + lVar17),
                             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&result_7.m_backend);
          if (tVar2) {
            result_8.m_backend.fpclass = cpp_dec_float_finite;
            result_8.m_backend.prec_elem = 0x1c;
            result_8.m_backend.data._M_elems[0] = 0;
            result_8.m_backend.data._M_elems[1] = 0;
            result_8.m_backend.data._M_elems[2] = 0;
            result_8.m_backend.data._M_elems[3] = 0;
            result_8.m_backend.data._M_elems[4] = 0;
            result_8.m_backend.data._M_elems[5] = 0;
            result_8.m_backend.data._M_elems[6] = 0;
            result_8.m_backend.data._M_elems[7] = 0;
            result_8.m_backend.data._M_elems[8] = 0;
            result_8.m_backend.data._M_elems[9] = 0;
            result_8.m_backend.data._M_elems[10] = 0;
            result_8.m_backend.data._M_elems[0xb] = 0;
            result_8.m_backend.data._M_elems[0xc] = 0;
            result_8.m_backend.data._M_elems[0xd] = 0;
            result_8.m_backend.data._M_elems[0xe] = 0;
            result_8.m_backend.data._M_elems[0xf] = 0;
            result_8.m_backend.data._M_elems[0x10] = 0;
            result_8.m_backend.data._M_elems[0x11] = 0;
            result_8.m_backend.data._M_elems[0x12] = 0;
            result_8.m_backend.data._M_elems[0x13] = 0;
            result_8.m_backend.data._M_elems[0x14] = 0;
            result_8.m_backend.data._M_elems[0x15] = 0;
            result_8.m_backend.data._M_elems[0x16] = 0;
            result_8.m_backend.data._M_elems[0x17] = 0;
            result_8.m_backend.data._M_elems[0x18] = 0;
            result_8.m_backend.data._M_elems[0x19] = 0;
            result_8.m_backend.data._M_elems._104_5_ = 0;
            result_8.m_backend.data._M_elems[0x1b]._1_3_ = 0;
            result_8.m_backend.exp = 0;
            result_8.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_add_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                      (&result_8.m_backend,&c_dbl_bounded.m_backend,&result_5.m_backend);
            result_9.m_backend.fpclass = cpp_dec_float_finite;
            result_9.m_backend.prec_elem = 0x1c;
            result_9.m_backend.data._M_elems[0] = 0;
            result_9.m_backend.data._M_elems[1] = 0;
            result_9.m_backend.data._M_elems[2] = 0;
            result_9.m_backend.data._M_elems[3] = 0;
            result_9.m_backend.data._M_elems[4] = 0;
            result_9.m_backend.data._M_elems[5] = 0;
            result_9.m_backend.data._M_elems[6] = 0;
            result_9.m_backend.data._M_elems[7] = 0;
            result_9.m_backend.data._M_elems[8] = 0;
            result_9.m_backend.data._M_elems[9] = 0;
            result_9.m_backend.data._M_elems[10] = 0;
            result_9.m_backend.data._M_elems[0xb] = 0;
            result_9.m_backend.data._M_elems[0xc] = 0;
            result_9.m_backend.data._M_elems[0xd] = 0;
            result_9.m_backend.data._M_elems[0xe] = 0;
            result_9.m_backend.data._M_elems[0xf] = 0;
            result_9.m_backend.data._M_elems[0x10] = 0;
            result_9.m_backend.data._M_elems[0x11] = 0;
            result_9.m_backend.data._M_elems[0x12] = 0;
            result_9.m_backend.data._M_elems[0x13] = 0;
            result_9.m_backend.data._M_elems[0x14] = 0;
            result_9.m_backend.data._M_elems[0x15] = 0;
            result_9.m_backend.data._M_elems[0x16] = 0;
            result_9.m_backend.data._M_elems[0x17] = 0;
            result_9.m_backend.data._M_elems[0x18] = 0;
            result_9.m_backend.data._M_elems[0x19] = 0;
            result_9.m_backend.data._M_elems._104_5_ = 0;
            result_9.m_backend.data._M_elems[0x1b]._1_3_ = 0;
            result_9.m_backend.exp = 0;
            result_9.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                      (&result_9.m_backend,&result_8.m_backend,&result_4.m_backend);
            result_7.m_backend.fpclass = cpp_dec_float_finite;
            result_7.m_backend.prec_elem = 0x1c;
            result_7.m_backend.data._M_elems[0] = 0;
            result_7.m_backend.data._M_elems[1] = 0;
            result_7.m_backend.data._M_elems[2] = 0;
            result_7.m_backend.data._M_elems[3] = 0;
            result_7.m_backend.data._M_elems[4] = 0;
            result_7.m_backend.data._M_elems[5] = 0;
            result_7.m_backend.data._M_elems[6] = 0;
            result_7.m_backend.data._M_elems[7] = 0;
            result_7.m_backend.data._M_elems[8] = 0;
            result_7.m_backend.data._M_elems[9] = 0;
            result_7.m_backend.data._M_elems[10] = 0;
            result_7.m_backend.data._M_elems[0xb] = 0;
            result_7.m_backend.data._M_elems[0xc] = 0;
            result_7.m_backend.data._M_elems[0xd] = 0;
            result_7.m_backend.data._M_elems[0xe] = 0;
            result_7.m_backend.data._M_elems[0xf] = 0;
            result_7.m_backend.data._M_elems[0x10] = 0;
            result_7.m_backend.data._M_elems[0x11] = 0;
            result_7.m_backend.data._M_elems[0x12] = 0;
            result_7.m_backend.data._M_elems[0x13] = 0;
            result_7.m_backend.data._M_elems[0x14] = 0;
            result_7.m_backend.data._M_elems[0x15] = 0;
            result_7.m_backend.data._M_elems[0x16] = 0;
            result_7.m_backend.data._M_elems[0x17] = 0;
            result_7.m_backend.data._M_elems[0x18] = 0;
            result_7.m_backend.data._M_elems[0x19] = 0;
            result_7.m_backend.data._M_elems._104_5_ = 0;
            result_7.m_backend.data._M_elems[0x1b]._1_3_ = 0;
            result_7.m_backend.exp = 0;
            result_7.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_add_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                      (&result_7.m_backend,&result_9.m_backend,&n.m_backend);
            pnVar1 = (this->colWeight).data.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            lVar18 = 0x1c;
            pcVar9 = &result_7.m_backend;
            puVar15 = (uint *)((long)&pnVar1[-1].m_backend.data + lVar17);
            for (lVar6 = lVar18; lVar6 != 0; lVar6 = lVar6 + -1) {
              *puVar15 = (pcVar9->data)._M_elems[0];
              pcVar9 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar9 + (ulong)bVar19 * -8 + 4);
              puVar15 = puVar15 + (ulong)bVar19 * -2 + 1;
            }
            *(int *)((long)&(pnVar1->m_backend).data + lVar17 + -0x10) = result_7.m_backend.exp;
            *(bool *)((long)&(pnVar1->m_backend).data + lVar17 + -0xc) = result_7.m_backend.neg;
            *(undefined8 *)((long)&(pnVar1->m_backend).data + lVar17 + -8) =
                 result_7.m_backend._120_8_;
            pnVar12 = &result_5;
            pmVar14 = local_5b0;
            for (lVar6 = lVar18; lVar6 != 0; lVar6 = lVar6 + -1) {
              *(uint *)pmVar14 = (pnVar12->m_backend).data._M_elems[0];
              pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar12 + ((ulong)bVar19 * -2 + 1) * 4);
              pmVar14 = pmVar14 + (ulong)bVar19 * -8 + 4;
            }
            local_540 = result_5.m_backend.exp;
            local_53c = result_5.m_backend.neg;
            local_538 = result_5.m_backend.fpclass;
            iStack_534 = result_5.m_backend.prec_elem;
            boost::multiprecision::
            abs<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                      ((type *)&result_7.m_backend,local_5b0,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)local_5b0);
            pcVar9 = &result_7.m_backend;
            pnVar12 = &result_5;
            for (lVar6 = lVar18; lVar6 != 0; lVar6 = lVar6 + -1) {
              (pnVar12->m_backend).data._M_elems[0] = (pcVar9->data)._M_elems[0];
              pcVar9 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar9 + (ulong)bVar19 * -8 + 4);
              pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar12 + ((ulong)bVar19 * -2 + 1) * 4);
            }
            result_5.m_backend.exp = result_7.m_backend.exp;
            result_5.m_backend.neg = result_7.m_backend.neg;
            result_5.m_backend.fpclass = result_7.m_backend.fpclass;
            result_5.m_backend.prec_elem = result_7.m_backend.prec_elem;
            pnVar12 = &result_4;
            pmVar14 = local_630;
            for (lVar6 = lVar18; lVar6 != 0; lVar6 = lVar6 + -1) {
              *(uint *)pmVar14 = (pnVar12->m_backend).data._M_elems[0];
              pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar12 + ((ulong)bVar19 * -2 + 1) * 4);
              pmVar14 = pmVar14 + (ulong)bVar19 * -8 + 4;
            }
            local_5c0 = result_4.m_backend.exp;
            local_5bc = result_4.m_backend.neg;
            local_5b8 = result_4.m_backend.fpclass;
            iStack_5b4 = result_4.m_backend.prec_elem;
            boost::multiprecision::
            abs<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                      ((type *)&result_7.m_backend,local_630,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)local_630);
            pcVar9 = &result_7.m_backend;
            pnVar12 = &result_4;
            for (; lVar18 != 0; lVar18 = lVar18 + -1) {
              (pnVar12->m_backend).data._M_elems[0] = (pcVar9->data)._M_elems[0];
              pcVar9 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar9 + (ulong)bVar19 * -8 + 4);
              pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar12 + ((ulong)bVar19 * -2 + 1) * 4);
            }
            result_4.m_backend.exp = result_7.m_backend.exp;
            result_4.m_backend.neg = result_7.m_backend.neg;
            result_4.m_backend.fpclass = result_7.m_backend.fpclass;
            result_4.m_backend.prec_elem = result_7.m_backend.prec_elem;
            tVar2 = boost::multiprecision::operator<(&result_4,&result_5);
            pbVar4 = (this->colUp).data;
            if (tVar2) {
              pbVar4[uVar16 - 1] = true;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                        ((cpp_dec_float<200U,_int,_void> *)
                         ((long)&(this->colWeight).data.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data +
                         lVar17),&x.m_backend);
            }
            else {
              pbVar4[uVar16 - 1] = false;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                        ((cpp_dec_float<200U,_int,_void> *)
                         ((long)&(this->colWeight).data.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data +
                         lVar17),&x.m_backend);
            }
          }
          else {
            result_8.m_backend.fpclass = cpp_dec_float_finite;
            result_8.m_backend.prec_elem = 0x1c;
            result_8.m_backend.data._M_elems[0] = 0;
            result_8.m_backend.data._M_elems[1] = 0;
            result_8.m_backend.data._M_elems[2] = 0;
            result_8.m_backend.data._M_elems[3] = 0;
            result_8.m_backend.data._M_elems[4] = 0;
            result_8.m_backend.data._M_elems[5] = 0;
            result_8.m_backend.data._M_elems[6] = 0;
            result_8.m_backend.data._M_elems[7] = 0;
            result_8.m_backend.data._M_elems[8] = 0;
            result_8.m_backend.data._M_elems[9] = 0;
            result_8.m_backend.data._M_elems[10] = 0;
            result_8.m_backend.data._M_elems[0xb] = 0;
            result_8.m_backend.data._M_elems[0xc] = 0;
            result_8.m_backend.data._M_elems[0xd] = 0;
            result_8.m_backend.data._M_elems[0xe] = 0;
            result_8.m_backend.data._M_elems[0xf] = 0;
            result_8.m_backend.data._M_elems[0x10] = 0;
            result_8.m_backend.data._M_elems[0x11] = 0;
            result_8.m_backend.data._M_elems[0x12] = 0;
            result_8.m_backend.data._M_elems[0x13] = 0;
            result_8.m_backend.data._M_elems[0x14] = 0;
            result_8.m_backend.data._M_elems[0x15] = 0;
            result_8.m_backend.data._M_elems[0x16] = 0;
            result_8.m_backend.data._M_elems[0x17] = 0;
            result_8.m_backend.data._M_elems[0x18] = 0;
            result_8.m_backend.data._M_elems[0x19] = 0;
            result_8.m_backend.data._M_elems._104_5_ = 0;
            result_8.m_backend.data._M_elems[0x1b]._1_3_ = 0;
            result_8.m_backend.exp = 0;
            result_8.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                      (&result_8.m_backend,&c_bounded.m_backend,&result_4.m_backend);
            result_9.m_backend.fpclass = cpp_dec_float_finite;
            result_9.m_backend.prec_elem = 0x1c;
            result_9.m_backend.data._M_elems[0] = 0;
            result_9.m_backend.data._M_elems[1] = 0;
            result_9.m_backend.data._M_elems[2] = 0;
            result_9.m_backend.data._M_elems[3] = 0;
            result_9.m_backend.data._M_elems[4] = 0;
            result_9.m_backend.data._M_elems[5] = 0;
            result_9.m_backend.data._M_elems[6] = 0;
            result_9.m_backend.data._M_elems[7] = 0;
            result_9.m_backend.data._M_elems[8] = 0;
            result_9.m_backend.data._M_elems[9] = 0;
            result_9.m_backend.data._M_elems[10] = 0;
            result_9.m_backend.data._M_elems[0xb] = 0;
            result_9.m_backend.data._M_elems[0xc] = 0;
            result_9.m_backend.data._M_elems[0xd] = 0;
            result_9.m_backend.data._M_elems[0xe] = 0;
            result_9.m_backend.data._M_elems[0xf] = 0;
            result_9.m_backend.data._M_elems[0x10] = 0;
            result_9.m_backend.data._M_elems[0x11] = 0;
            result_9.m_backend.data._M_elems[0x12] = 0;
            result_9.m_backend.data._M_elems[0x13] = 0;
            result_9.m_backend.data._M_elems[0x14] = 0;
            result_9.m_backend.data._M_elems[0x15] = 0;
            result_9.m_backend.data._M_elems[0x16] = 0;
            result_9.m_backend.data._M_elems[0x17] = 0;
            result_9.m_backend.data._M_elems[0x18] = 0;
            result_9.m_backend.data._M_elems[0x19] = 0;
            result_9.m_backend.data._M_elems._104_5_ = 0;
            result_9.m_backend.data._M_elems[0x1b]._1_3_ = 0;
            result_9.m_backend.exp = 0;
            result_9.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_add_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                      (&result_9.m_backend,&result_8.m_backend,&x.m_backend);
            result_7.m_backend.fpclass = cpp_dec_float_finite;
            result_7.m_backend.prec_elem = 0x1c;
            result_7.m_backend.data._M_elems[0] = 0;
            result_7.m_backend.data._M_elems[1] = 0;
            result_7.m_backend.data._M_elems[2] = 0;
            result_7.m_backend.data._M_elems[3] = 0;
            result_7.m_backend.data._M_elems[4] = 0;
            result_7.m_backend.data._M_elems[5] = 0;
            result_7.m_backend.data._M_elems[6] = 0;
            result_7.m_backend.data._M_elems[7] = 0;
            result_7.m_backend.data._M_elems[8] = 0;
            result_7.m_backend.data._M_elems[9] = 0;
            result_7.m_backend.data._M_elems[10] = 0;
            result_7.m_backend.data._M_elems[0xb] = 0;
            result_7.m_backend.data._M_elems[0xc] = 0;
            result_7.m_backend.data._M_elems[0xd] = 0;
            result_7.m_backend.data._M_elems[0xe] = 0;
            result_7.m_backend.data._M_elems[0xf] = 0;
            result_7.m_backend.data._M_elems[0x10] = 0;
            result_7.m_backend.data._M_elems[0x11] = 0;
            result_7.m_backend.data._M_elems[0x12] = 0;
            result_7.m_backend.data._M_elems[0x13] = 0;
            result_7.m_backend.data._M_elems[0x14] = 0;
            result_7.m_backend.data._M_elems[0x15] = 0;
            result_7.m_backend.data._M_elems[0x16] = 0;
            result_7.m_backend.data._M_elems[0x17] = 0;
            result_7.m_backend.data._M_elems[0x18] = 0;
            result_7.m_backend.data._M_elems[0x19] = 0;
            result_7.m_backend.data._M_elems._104_5_ = 0;
            result_7.m_backend.data._M_elems[0x1b]._1_3_ = 0;
            result_7.m_backend.exp = 0;
            result_7.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_add_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                      (&result_7.m_backend,&result_9.m_backend,&n.m_backend);
            pnVar1 = (this->colWeight).data.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pcVar9 = &result_7.m_backend;
            puVar15 = (uint *)((long)&pnVar1[-1].m_backend.data + lVar17);
            for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
              *puVar15 = (pcVar9->data)._M_elems[0];
              pcVar9 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar9 + (ulong)bVar19 * -8 + 4);
              puVar15 = puVar15 + (ulong)bVar19 * -2 + 1;
            }
            *(int *)((long)&(pnVar1->m_backend).data + lVar17 + -0x10) = result_7.m_backend.exp;
            *(bool *)((long)&(pnVar1->m_backend).data + lVar17 + -0xc) = result_7.m_backend.neg;
            *(undefined8 *)((long)&(pnVar1->m_backend).data + lVar17 + -8) =
                 result_7.m_backend._120_8_;
            (this->colUp).data[uVar16 - 1] = true;
          }
        }
      }
      else {
        pnVar1 = (base->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .low.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pdVar3 = (double *)infinity();
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                  (&result_7.m_backend,-*pdVar3,(type *)0x0);
        tVar2 = boost::multiprecision::operator>
                          ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)((long)&pnVar1[-1].m_backend.data + lVar17),
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&result_7.m_backend);
        if (!tVar2) {
          result_9.m_backend.fpclass = cpp_dec_float_finite;
          result_9.m_backend.prec_elem = 0x1c;
          result_9.m_backend.data._M_elems[0] = 0;
          result_9.m_backend.data._M_elems[1] = 0;
          result_9.m_backend.data._M_elems[2] = 0;
          result_9.m_backend.data._M_elems[3] = 0;
          result_9.m_backend.data._M_elems[4] = 0;
          result_9.m_backend.data._M_elems[5] = 0;
          result_9.m_backend.data._M_elems[6] = 0;
          result_9.m_backend.data._M_elems[7] = 0;
          result_9.m_backend.data._M_elems[8] = 0;
          result_9.m_backend.data._M_elems[9] = 0;
          result_9.m_backend.data._M_elems[10] = 0;
          result_9.m_backend.data._M_elems[0xb] = 0;
          result_9.m_backend.data._M_elems[0xc] = 0;
          result_9.m_backend.data._M_elems[0xd] = 0;
          result_9.m_backend.data._M_elems[0xe] = 0;
          result_9.m_backend.data._M_elems[0xf] = 0;
          result_9.m_backend.data._M_elems[0x10] = 0;
          result_9.m_backend.data._M_elems[0x11] = 0;
          result_9.m_backend.data._M_elems[0x12] = 0;
          result_9.m_backend.data._M_elems[0x13] = 0;
          result_9.m_backend.data._M_elems[0x14] = 0;
          result_9.m_backend.data._M_elems[0x15] = 0;
          result_9.m_backend.data._M_elems[0x16] = 0;
          result_9.m_backend.data._M_elems[0x17] = 0;
          result_9.m_backend.data._M_elems[0x18] = 0;
          result_9.m_backend.data._M_elems[0x19] = 0;
          result_9.m_backend.data._M_elems._104_5_ = 0;
          result_9.m_backend.data._M_elems[0x1b]._1_3_ = 0;
          result_9.m_backend.exp = 0;
          result_9.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_add_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    (&result_9.m_backend,&c_free.m_backend,&n.m_backend);
          pnVar12 = &x;
          pmVar14 = local_6b0;
          for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
            *(uint *)pmVar14 = (pnVar12->m_backend).data._M_elems[0];
            pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar12 + ((ulong)bVar19 * -2 + 1) * 4);
            pmVar14 = pmVar14 + (ulong)bVar19 * -8 + 4;
          }
          local_640 = x.m_backend.exp;
          local_63c = x.m_backend.neg;
          local_638 = x.m_backend.fpclass;
          iStack_634 = x.m_backend.prec_elem;
          boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    ((type *)&result_8.m_backend,local_6b0,
                     (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)local_6b0);
          result_7.m_backend.fpclass = cpp_dec_float_finite;
          result_7.m_backend.prec_elem = 0x1c;
          result_7.m_backend.data._M_elems[0] = 0;
          result_7.m_backend.data._M_elems[1] = 0;
          result_7.m_backend.data._M_elems[2] = 0;
          result_7.m_backend.data._M_elems[3] = 0;
          result_7.m_backend.data._M_elems[4] = 0;
          result_7.m_backend.data._M_elems[5] = 0;
          result_7.m_backend.data._M_elems[6] = 0;
          result_7.m_backend.data._M_elems[7] = 0;
          result_7.m_backend.data._M_elems[8] = 0;
          result_7.m_backend.data._M_elems[9] = 0;
          result_7.m_backend.data._M_elems[10] = 0;
          result_7.m_backend.data._M_elems[0xb] = 0;
          result_7.m_backend.data._M_elems[0xc] = 0;
          result_7.m_backend.data._M_elems[0xd] = 0;
          result_7.m_backend.data._M_elems[0xe] = 0;
          result_7.m_backend.data._M_elems[0xf] = 0;
          result_7.m_backend.data._M_elems[0x10] = 0;
          result_7.m_backend.data._M_elems[0x11] = 0;
          result_7.m_backend.data._M_elems[0x12] = 0;
          result_7.m_backend.data._M_elems[0x13] = 0;
          result_7.m_backend.data._M_elems[0x14] = 0;
          result_7.m_backend.data._M_elems[0x15] = 0;
          result_7.m_backend.data._M_elems[0x16] = 0;
          result_7.m_backend.data._M_elems[0x17] = 0;
          result_7.m_backend.data._M_elems[0x18] = 0;
          result_7.m_backend.data._M_elems[0x19] = 0;
          result_7.m_backend.data._M_elems._104_5_ = 0;
          result_7.m_backend.data._M_elems[0x1b]._1_3_ = 0;
          result_7.m_backend.exp = 0;
          result_7.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    (&result_7.m_backend,&result_9.m_backend,&result_8.m_backend);
          goto LAB_004339d5;
        }
        result_8.m_backend.fpclass = cpp_dec_float_finite;
        result_8.m_backend.prec_elem = 0x1c;
        result_8.m_backend.data._M_elems[0] = 0;
        result_8.m_backend.data._M_elems[1] = 0;
        result_8.m_backend.data._M_elems[2] = 0;
        result_8.m_backend.data._M_elems[3] = 0;
        result_8.m_backend.data._M_elems[4] = 0;
        result_8.m_backend.data._M_elems[5] = 0;
        result_8.m_backend.data._M_elems[6] = 0;
        result_8.m_backend.data._M_elems[7] = 0;
        result_8.m_backend.data._M_elems[8] = 0;
        result_8.m_backend.data._M_elems[9] = 0;
        result_8.m_backend.data._M_elems[10] = 0;
        result_8.m_backend.data._M_elems[0xb] = 0;
        result_8.m_backend.data._M_elems[0xc] = 0;
        result_8.m_backend.data._M_elems[0xd] = 0;
        result_8.m_backend.data._M_elems[0xe] = 0;
        result_8.m_backend.data._M_elems[0xf] = 0;
        result_8.m_backend.data._M_elems[0x10] = 0;
        result_8.m_backend.data._M_elems[0x11] = 0;
        result_8.m_backend.data._M_elems[0x12] = 0;
        result_8.m_backend.data._M_elems[0x13] = 0;
        result_8.m_backend.data._M_elems[0x14] = 0;
        result_8.m_backend.data._M_elems[0x15] = 0;
        result_8.m_backend.data._M_elems[0x16] = 0;
        result_8.m_backend.data._M_elems[0x17] = 0;
        result_8.m_backend.data._M_elems[0x18] = 0;
        result_8.m_backend.data._M_elems[0x19] = 0;
        result_8.m_backend.data._M_elems._104_5_ = 0;
        result_8.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        result_8.m_backend.exp = 0;
        result_8.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_add_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (&result_8.m_backend,&c_bounded.m_backend,&result_5.m_backend);
        result_9.m_backend.fpclass = cpp_dec_float_finite;
        result_9.m_backend.prec_elem = 0x1c;
        result_9.m_backend.data._M_elems[0] = 0;
        result_9.m_backend.data._M_elems[1] = 0;
        result_9.m_backend.data._M_elems[2] = 0;
        result_9.m_backend.data._M_elems[3] = 0;
        result_9.m_backend.data._M_elems[4] = 0;
        result_9.m_backend.data._M_elems[5] = 0;
        result_9.m_backend.data._M_elems[6] = 0;
        result_9.m_backend.data._M_elems[7] = 0;
        result_9.m_backend.data._M_elems[8] = 0;
        result_9.m_backend.data._M_elems[9] = 0;
        result_9.m_backend.data._M_elems[10] = 0;
        result_9.m_backend.data._M_elems[0xb] = 0;
        result_9.m_backend.data._M_elems[0xc] = 0;
        result_9.m_backend.data._M_elems[0xd] = 0;
        result_9.m_backend.data._M_elems[0xe] = 0;
        result_9.m_backend.data._M_elems[0xf] = 0;
        result_9.m_backend.data._M_elems[0x10] = 0;
        result_9.m_backend.data._M_elems[0x11] = 0;
        result_9.m_backend.data._M_elems[0x12] = 0;
        result_9.m_backend.data._M_elems[0x13] = 0;
        result_9.m_backend.data._M_elems[0x14] = 0;
        result_9.m_backend.data._M_elems[0x15] = 0;
        result_9.m_backend.data._M_elems[0x16] = 0;
        result_9.m_backend.data._M_elems[0x17] = 0;
        result_9.m_backend.data._M_elems[0x18] = 0;
        result_9.m_backend.data._M_elems[0x19] = 0;
        result_9.m_backend.data._M_elems._104_5_ = 0;
        result_9.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        result_9.m_backend.exp = 0;
        result_9.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_add_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (&result_9.m_backend,&result_8.m_backend,&n.m_backend);
        result_7.m_backend.fpclass = cpp_dec_float_finite;
        result_7.m_backend.prec_elem = 0x1c;
        result_7.m_backend.data._M_elems[0] = 0;
        result_7.m_backend.data._M_elems[1] = 0;
        result_7.m_backend.data._M_elems[2] = 0;
        result_7.m_backend.data._M_elems[3] = 0;
        result_7.m_backend.data._M_elems[4] = 0;
        result_7.m_backend.data._M_elems[5] = 0;
        result_7.m_backend.data._M_elems[6] = 0;
        result_7.m_backend.data._M_elems[7] = 0;
        result_7.m_backend.data._M_elems[8] = 0;
        result_7.m_backend.data._M_elems[9] = 0;
        result_7.m_backend.data._M_elems[10] = 0;
        result_7.m_backend.data._M_elems[0xb] = 0;
        result_7.m_backend.data._M_elems[0xc] = 0;
        result_7.m_backend.data._M_elems[0xd] = 0;
        result_7.m_backend.data._M_elems[0xe] = 0;
        result_7.m_backend.data._M_elems[0xf] = 0;
        result_7.m_backend.data._M_elems[0x10] = 0;
        result_7.m_backend.data._M_elems[0x11] = 0;
        result_7.m_backend.data._M_elems[0x12] = 0;
        result_7.m_backend.data._M_elems[0x13] = 0;
        result_7.m_backend.data._M_elems[0x14] = 0;
        result_7.m_backend.data._M_elems[0x15] = 0;
        result_7.m_backend.data._M_elems[0x16] = 0;
        result_7.m_backend.data._M_elems[0x17] = 0;
        result_7.m_backend.data._M_elems[0x18] = 0;
        result_7.m_backend.data._M_elems[0x19] = 0;
        result_7.m_backend.data._M_elems._104_5_ = 0;
        result_7.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        result_7.m_backend.exp = 0;
        result_7.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (&result_7.m_backend,&result_9.m_backend,&x.m_backend);
        pnVar1 = (this->colWeight).data.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pcVar9 = &result_7.m_backend;
        puVar15 = (uint *)((long)&pnVar1[-1].m_backend.data + lVar17);
        for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
          *puVar15 = (pcVar9->data)._M_elems[0];
          pcVar9 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar9 + (ulong)bVar19 * -8 + 4);
          puVar15 = puVar15 + (ulong)bVar19 * -2 + 1;
        }
        *(int *)((long)&(pnVar1->m_backend).data + lVar17 + -0x10) = result_7.m_backend.exp;
        *(bool *)((long)&(pnVar1->m_backend).data + lVar17 + -0xc) = result_7.m_backend.neg;
        *(undefined8 *)((long)&(pnVar1->m_backend).data + lVar17 + -8) = result_7.m_backend._120_8_;
        (this->colUp).data[uVar16 - 1] = false;
      }
      lVar17 = lVar17 + -0x80;
      uVar16 = uVar16 - 1;
    }
    uVar16 = (ulong)(uint)(base->
                          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .
                          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .set.thenum;
    lVar17 = uVar16 << 7;
    for (; 0 < (int)uVar16; uVar16 = uVar16 - 1) {
      pnVar1 = (base->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .right.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pdVar3 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                (&n.m_backend,*pdVar3,(type *)0x0);
      tVar2 = boost::multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)((long)&pnVar1[-1].m_backend.data + lVar17),
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&n.m_backend);
      if (tVar2) {
        result_17.m_backend.fpclass = cpp_dec_float_finite;
        result_17.m_backend.prec_elem = 0x1c;
        result_17.m_backend.data._M_elems[0] = 0;
        result_17.m_backend.data._M_elems[1] = 0;
        result_17.m_backend.data._M_elems[2] = 0;
        result_17.m_backend.data._M_elems[3] = 0;
        result_17.m_backend.data._M_elems[4] = 0;
        result_17.m_backend.data._M_elems[5] = 0;
        result_17.m_backend.data._M_elems[6] = 0;
        result_17.m_backend.data._M_elems[7] = 0;
        result_17.m_backend.data._M_elems[8] = 0;
        result_17.m_backend.data._M_elems[9] = 0;
        result_17.m_backend.data._M_elems[10] = 0;
        result_17.m_backend.data._M_elems[0xb] = 0;
        result_17.m_backend.data._M_elems[0xc] = 0;
        result_17.m_backend.data._M_elems[0xd] = 0;
        result_17.m_backend.data._M_elems[0xe] = 0;
        result_17.m_backend.data._M_elems[0xf] = 0;
        result_17.m_backend.data._M_elems[0x10] = 0;
        result_17.m_backend.data._M_elems[0x11] = 0;
        result_17.m_backend.data._M_elems[0x12] = 0;
        result_17.m_backend.data._M_elems[0x13] = 0;
        result_17.m_backend.data._M_elems[0x14] = 0;
        result_17.m_backend.data._M_elems[0x15] = 0;
        result_17.m_backend.data._M_elems[0x16] = 0;
        result_17.m_backend.data._M_elems[0x17] = 0;
        result_17.m_backend.data._M_elems[0x18] = 0;
        result_17.m_backend.data._M_elems[0x19] = 0;
        result_17.m_backend.data._M_elems._104_5_ = 0;
        result_17.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        result_17.m_backend.exp = 0;
        result_17.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (&result_17.m_backend,
                   (cpp_dec_float<200U,_int,_void> *)
                   ((long)&(base->
                           super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).
                           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .left.val.
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar17),
                   (cpp_dec_float<200U,_int,_void> *)
                   ((long)&(base->
                           super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).
                           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .right.val.
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar17));
        boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  ((type *)&n.m_backend,(multiprecision *)&result_17.m_backend,arg_00);
        tVar2 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&n.m_backend,&eps);
        if (tVar2) {
          pnVar1 = (this->rowWeight).data.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          puVar5 = (uint *)((long)&pnVar1[-1].m_backend.data + lVar17);
          pnVar12 = &r_fixed;
          puVar15 = puVar5;
          for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
            *puVar15 = (pnVar12->m_backend).data._M_elems[0];
            pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar12 + ((ulong)bVar19 * -2 + 1) * 4);
            puVar15 = puVar15 + (ulong)bVar19 * -2 + 1;
          }
          *(int *)((long)&(pnVar1->m_backend).data + lVar17 + -0x10) = r_fixed.m_backend.exp;
          *(bool *)((long)&(pnVar1->m_backend).data + lVar17 + -0xc) = r_fixed.m_backend.neg;
          uVar8 = r_fixed.m_backend._120_8_;
LAB_00434171:
          puVar5[0x1e] = (fpclass_type)uVar8;
          puVar5[0x1f] = SUB84(uVar8,4);
        }
        else {
          pnVar1 = (base->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .left.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pdVar3 = (double *)infinity();
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                    (&n.m_backend,-*pdVar3,(type *)0x0);
          tVar2 = boost::multiprecision::operator>
                            ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)((long)&pnVar1[-1].m_backend.data + lVar17),
                             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&n.m_backend);
          if (tVar2) {
            n.m_backend.fpclass = cpp_dec_float_finite;
            n.m_backend.prec_elem = 0x1c;
            n.m_backend.data._M_elems[0] = 0;
            n.m_backend.data._M_elems[1] = 0;
            n.m_backend.data._M_elems[2] = 0;
            n.m_backend.data._M_elems[3] = 0;
            n.m_backend.data._M_elems[4] = 0;
            n.m_backend.data._M_elems[5] = 0;
            n.m_backend.data._M_elems[6] = 0;
            n.m_backend.data._M_elems[7] = 0;
            n.m_backend.data._M_elems[8] = 0;
            n.m_backend.data._M_elems[9] = 0;
            n.m_backend.data._M_elems[10] = 0;
            n.m_backend.data._M_elems[0xb] = 0;
            n.m_backend.data._M_elems[0xc] = 0;
            n.m_backend.data._M_elems[0xd] = 0;
            n.m_backend.data._M_elems[0xe] = 0;
            n.m_backend.data._M_elems[0xf] = 0;
            n.m_backend.data._M_elems[0x10] = 0;
            n.m_backend.data._M_elems[0x11] = 0;
            n.m_backend.data._M_elems[0x12] = 0;
            n.m_backend.data._M_elems[0x13] = 0;
            n.m_backend.data._M_elems[0x14] = 0;
            n.m_backend.data._M_elems[0x15] = 0;
            n.m_backend.data._M_elems[0x16] = 0;
            n.m_backend.data._M_elems[0x17] = 0;
            n.m_backend.data._M_elems[0x18] = 0;
            n.m_backend.data._M_elems[0x19] = 0;
            n.m_backend.data._M_elems._104_5_ = 0;
            n.m_backend.data._M_elems[0x1b]._1_3_ = 0;
            n.m_backend.exp = 0;
            n.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                      (&n.m_backend,&bx.m_backend,
                       (cpp_dec_float<200U,_int,_void> *)
                       ((long)&(base->
                               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ).
                               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               .right.val.
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar17
                       ));
            x.m_backend.fpclass = cpp_dec_float_finite;
            x.m_backend.prec_elem = 0x1c;
            x.m_backend.data._M_elems[0] = 0;
            x.m_backend.data._M_elems[1] = 0;
            x.m_backend.data._M_elems[2] = 0;
            x.m_backend.data._M_elems[3] = 0;
            x.m_backend.data._M_elems[4] = 0;
            x.m_backend.data._M_elems[5] = 0;
            x.m_backend.data._M_elems[6] = 0;
            x.m_backend.data._M_elems[7] = 0;
            x.m_backend.data._M_elems[8] = 0;
            x.m_backend.data._M_elems[9] = 0;
            x.m_backend.data._M_elems[10] = 0;
            x.m_backend.data._M_elems[0xb] = 0;
            x.m_backend.data._M_elems[0xc] = 0;
            x.m_backend.data._M_elems[0xd] = 0;
            x.m_backend.data._M_elems[0xe] = 0;
            x.m_backend.data._M_elems[0xf] = 0;
            x.m_backend.data._M_elems[0x10] = 0;
            x.m_backend.data._M_elems[0x11] = 0;
            x.m_backend.data._M_elems[0x12] = 0;
            x.m_backend.data._M_elems[0x13] = 0;
            x.m_backend.data._M_elems[0x14] = 0;
            x.m_backend.data._M_elems[0x15] = 0;
            x.m_backend.data._M_elems[0x16] = 0;
            x.m_backend.data._M_elems[0x17] = 0;
            x.m_backend.data._M_elems[0x18] = 0;
            x.m_backend.data._M_elems[0x19] = 0;
            x.m_backend.data._M_elems._104_5_ = 0;
            x.m_backend.data._M_elems[0x1b]._1_3_ = 0;
            x.m_backend.exp = 0;
            x.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                      (&x.m_backend,&bx.m_backend,
                       (cpp_dec_float<200U,_int,_void> *)
                       ((long)&(base->
                               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ).
                               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               .left.val.
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar17
                       ));
            result_5.m_backend.fpclass = cpp_dec_float_finite;
            result_5.m_backend.prec_elem = 0x1c;
            result_5.m_backend.data._M_elems[0] = 0;
            result_5.m_backend.data._M_elems[1] = 0;
            result_5.m_backend.data._M_elems[2] = 0;
            result_5.m_backend.data._M_elems[3] = 0;
            result_5.m_backend.data._M_elems[4] = 0;
            result_5.m_backend.data._M_elems[5] = 0;
            result_5.m_backend.data._M_elems[6] = 0;
            result_5.m_backend.data._M_elems[7] = 0;
            result_5.m_backend.data._M_elems[8] = 0;
            result_5.m_backend.data._M_elems[9] = 0;
            result_5.m_backend.data._M_elems[10] = 0;
            result_5.m_backend.data._M_elems[0xb] = 0;
            result_5.m_backend.data._M_elems[0xc] = 0;
            result_5.m_backend.data._M_elems[0xd] = 0;
            result_5.m_backend.data._M_elems[0xe] = 0;
            result_5.m_backend.data._M_elems[0xf] = 0;
            result_5.m_backend.data._M_elems[0x10] = 0;
            result_5.m_backend.data._M_elems[0x11] = 0;
            result_5.m_backend.data._M_elems[0x12] = 0;
            result_5.m_backend.data._M_elems[0x13] = 0;
            result_5.m_backend.data._M_elems[0x14] = 0;
            result_5.m_backend.data._M_elems[0x15] = 0;
            result_5.m_backend.data._M_elems[0x16] = 0;
            result_5.m_backend.data._M_elems[0x17] = 0;
            result_5.m_backend.data._M_elems[0x18] = 0;
            result_5.m_backend.data._M_elems[0x19] = 0;
            result_5.m_backend.data._M_elems._104_5_ = 0;
            result_5.m_backend.data._M_elems[0x1b]._1_3_ = 0;
            result_5.m_backend.exp = 0;
            result_5.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_add_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                      (&result_5.m_backend,&r_dbl_bounded.m_backend,&x.m_backend);
            result_4.m_backend.fpclass = cpp_dec_float_finite;
            result_4.m_backend.prec_elem = 0x1c;
            result_4.m_backend.data._M_elems[0] = 0;
            result_4.m_backend.data._M_elems[1] = 0;
            result_4.m_backend.data._M_elems[2] = 0;
            result_4.m_backend.data._M_elems[3] = 0;
            result_4.m_backend.data._M_elems[4] = 0;
            result_4.m_backend.data._M_elems[5] = 0;
            result_4.m_backend.data._M_elems[6] = 0;
            result_4.m_backend.data._M_elems[7] = 0;
            result_4.m_backend.data._M_elems[8] = 0;
            result_4.m_backend.data._M_elems[9] = 0;
            result_4.m_backend.data._M_elems[10] = 0;
            result_4.m_backend.data._M_elems[0xb] = 0;
            result_4.m_backend.data._M_elems[0xc] = 0;
            result_4.m_backend.data._M_elems[0xd] = 0;
            result_4.m_backend.data._M_elems[0xe] = 0;
            result_4.m_backend.data._M_elems[0xf] = 0;
            result_4.m_backend.data._M_elems[0x10] = 0;
            result_4.m_backend.data._M_elems[0x11] = 0;
            result_4.m_backend.data._M_elems[0x12] = 0;
            result_4.m_backend.data._M_elems[0x13] = 0;
            result_4.m_backend.data._M_elems[0x14] = 0;
            result_4.m_backend.data._M_elems[0x15] = 0;
            result_4.m_backend.data._M_elems[0x16] = 0;
            result_4.m_backend.data._M_elems[0x17] = 0;
            result_4.m_backend.data._M_elems[0x18] = 0;
            result_4.m_backend.data._M_elems[0x19] = 0;
            result_4.m_backend.data._M_elems._104_5_ = 0;
            result_4.m_backend.data._M_elems[0x1b]._1_3_ = 0;
            result_4.m_backend.exp = 0;
            result_4.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                      (&result_4.m_backend,&result_5.m_backend,&n.m_backend);
            pnVar1 = (this->rowWeight).data.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            lVar18 = 0x1c;
            ptVar11 = &result_4;
            puVar15 = (uint *)((long)&pnVar1[-1].m_backend.data + lVar17);
            for (lVar6 = lVar18; lVar6 != 0; lVar6 = lVar6 + -1) {
              *puVar15 = (ptVar11->m_backend).data._M_elems[0];
              ptVar11 = (type *)((long)ptVar11 + ((ulong)bVar19 * -2 + 1) * 4);
              puVar15 = puVar15 + (ulong)bVar19 * -2 + 1;
            }
            *(int *)((long)&(pnVar1->m_backend).data + lVar17 + -0x10) = result_4.m_backend.exp;
            *(bool *)((long)&(pnVar1->m_backend).data + lVar17 + -0xc) = result_4.m_backend.neg;
            *(undefined8 *)((long)&(pnVar1->m_backend).data + lVar17 + -8) =
                 result_4.m_backend._120_8_;
            pcVar9 = &n.m_backend;
            pmVar14 = local_730;
            for (lVar6 = lVar18; lVar6 != 0; lVar6 = lVar6 + -1) {
              *(uint *)pmVar14 = (pcVar9->data)._M_elems[0];
              pcVar9 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar9 + (ulong)bVar19 * -8 + 4);
              pmVar14 = pmVar14 + (ulong)bVar19 * -8 + 4;
            }
            local_6c0 = n.m_backend.exp;
            local_6bc = n.m_backend.neg;
            local_6b8 = n.m_backend.fpclass;
            iStack_6b4 = n.m_backend.prec_elem;
            boost::multiprecision::
            abs<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                      (&result_4,local_730,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)local_730);
            pnVar12 = &x;
            pmVar14 = local_7b0;
            for (; lVar18 != 0; lVar18 = lVar18 + -1) {
              *(uint *)pmVar14 = (pnVar12->m_backend).data._M_elems[0];
              pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar12 + ((ulong)bVar19 * -2 + 1) * 4);
              pmVar14 = pmVar14 + (ulong)bVar19 * -8 + 4;
            }
            local_740 = x.m_backend.exp;
            local_73c = x.m_backend.neg;
            local_738 = x.m_backend.fpclass;
            iStack_734 = x.m_backend.prec_elem;
            boost::multiprecision::
            abs<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                      (&result_5,local_7b0,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)local_7b0);
            tVar2 = boost::multiprecision::operator<(&result_4,&result_5);
            (this->rowRight).data[uVar16 - 1] = tVar2;
          }
          else {
            x.m_backend.fpclass = cpp_dec_float_finite;
            x.m_backend.prec_elem = 0x1c;
            x.m_backend.data._M_elems[0] = 0;
            x.m_backend.data._M_elems[1] = 0;
            x.m_backend.data._M_elems[2] = 0;
            x.m_backend.data._M_elems[3] = 0;
            x.m_backend.data._M_elems[4] = 0;
            x.m_backend.data._M_elems[5] = 0;
            x.m_backend.data._M_elems[6] = 0;
            x.m_backend.data._M_elems[7] = 0;
            x.m_backend.data._M_elems[8] = 0;
            x.m_backend.data._M_elems[9] = 0;
            x.m_backend.data._M_elems[10] = 0;
            x.m_backend.data._M_elems[0xb] = 0;
            x.m_backend.data._M_elems[0xc] = 0;
            x.m_backend.data._M_elems[0xd] = 0;
            x.m_backend.data._M_elems[0xe] = 0;
            x.m_backend.data._M_elems[0xf] = 0;
            x.m_backend.data._M_elems[0x10] = 0;
            x.m_backend.data._M_elems[0x11] = 0;
            x.m_backend.data._M_elems[0x12] = 0;
            x.m_backend.data._M_elems[0x13] = 0;
            x.m_backend.data._M_elems[0x14] = 0;
            x.m_backend.data._M_elems[0x15] = 0;
            x.m_backend.data._M_elems[0x16] = 0;
            x.m_backend.data._M_elems[0x17] = 0;
            x.m_backend.data._M_elems[0x18] = 0;
            x.m_backend.data._M_elems[0x19] = 0;
            x.m_backend.data._M_elems._104_5_ = 0;
            x.m_backend.data._M_elems[0x1b]._1_3_ = 0;
            x.m_backend.exp = 0;
            x.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                      (&x.m_backend,&bx.m_backend,
                       (cpp_dec_float<200U,_int,_void> *)
                       ((long)&(base->
                               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ).
                               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               .right.val.
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar17
                       ));
            n.m_backend.fpclass = cpp_dec_float_finite;
            n.m_backend.prec_elem = 0x1c;
            n.m_backend.data._M_elems[0] = 0;
            n.m_backend.data._M_elems[1] = 0;
            n.m_backend.data._M_elems[2] = 0;
            n.m_backend.data._M_elems[3] = 0;
            n.m_backend.data._M_elems[4] = 0;
            n.m_backend.data._M_elems[5] = 0;
            n.m_backend.data._M_elems[6] = 0;
            n.m_backend.data._M_elems[7] = 0;
            n.m_backend.data._M_elems[8] = 0;
            n.m_backend.data._M_elems[9] = 0;
            n.m_backend.data._M_elems[10] = 0;
            n.m_backend.data._M_elems[0xb] = 0;
            n.m_backend.data._M_elems[0xc] = 0;
            n.m_backend.data._M_elems[0xd] = 0;
            n.m_backend.data._M_elems[0xe] = 0;
            n.m_backend.data._M_elems[0xf] = 0;
            n.m_backend.data._M_elems[0x10] = 0;
            n.m_backend.data._M_elems[0x11] = 0;
            n.m_backend.data._M_elems[0x12] = 0;
            n.m_backend.data._M_elems[0x13] = 0;
            n.m_backend.data._M_elems[0x14] = 0;
            n.m_backend.data._M_elems[0x15] = 0;
            n.m_backend.data._M_elems[0x16] = 0;
            n.m_backend.data._M_elems[0x17] = 0;
            n.m_backend.data._M_elems[0x18] = 0;
            n.m_backend.data._M_elems[0x19] = 0;
            n.m_backend.data._M_elems._104_5_ = 0;
            n.m_backend.data._M_elems[0x1b]._1_3_ = 0;
            n.m_backend.exp = 0;
            n.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                      (&n.m_backend,&r_bounded.m_backend,&x.m_backend);
            pnVar1 = (this->rowWeight).data.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pcVar9 = &n.m_backend;
            puVar15 = (uint *)((long)&pnVar1[-1].m_backend.data + lVar17);
            for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
              *puVar15 = (pcVar9->data)._M_elems[0];
              pcVar9 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar9 + (ulong)bVar19 * -8 + 4);
              puVar15 = puVar15 + (ulong)bVar19 * -2 + 1;
            }
            *(int *)((long)&(pnVar1->m_backend).data + lVar17 + -0x10) = n.m_backend.exp;
            *(bool *)((long)&(pnVar1->m_backend).data + lVar17 + -0xc) = n.m_backend.neg;
            *(undefined8 *)((long)&(pnVar1->m_backend).data + lVar17 + -8) = n.m_backend._120_8_;
            (this->rowRight).data[uVar16 - 1] = true;
          }
        }
      }
      else {
        pnVar1 = (base->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .left.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pdVar3 = (double *)infinity();
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                  (&n.m_backend,-*pdVar3,(type *)0x0);
        tVar2 = boost::multiprecision::operator>
                          ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)((long)&pnVar1[-1].m_backend.data + lVar17),
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&n.m_backend);
        if (!tVar2) {
          pnVar1 = (this->rowWeight).data.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          puVar5 = (uint *)((long)&pnVar1[-1].m_backend.data + lVar17);
          pnVar12 = &r_free;
          puVar15 = puVar5;
          for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
            *puVar15 = (pnVar12->m_backend).data._M_elems[0];
            pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar12 + ((ulong)bVar19 * -2 + 1) * 4);
            puVar15 = puVar15 + (ulong)bVar19 * -2 + 1;
          }
          *(int *)((long)&(pnVar1->m_backend).data + lVar17 + -0x10) = r_free.m_backend.exp;
          *(bool *)((long)&(pnVar1->m_backend).data + lVar17 + -0xc) = r_free.m_backend.neg;
          uVar8 = r_free.m_backend._120_8_;
          goto LAB_00434171;
        }
        x.m_backend.fpclass = cpp_dec_float_finite;
        x.m_backend.prec_elem = 0x1c;
        x.m_backend.data._M_elems[0] = 0;
        x.m_backend.data._M_elems[1] = 0;
        x.m_backend.data._M_elems[2] = 0;
        x.m_backend.data._M_elems[3] = 0;
        x.m_backend.data._M_elems[4] = 0;
        x.m_backend.data._M_elems[5] = 0;
        x.m_backend.data._M_elems[6] = 0;
        x.m_backend.data._M_elems[7] = 0;
        x.m_backend.data._M_elems[8] = 0;
        x.m_backend.data._M_elems[9] = 0;
        x.m_backend.data._M_elems[10] = 0;
        x.m_backend.data._M_elems[0xb] = 0;
        x.m_backend.data._M_elems[0xc] = 0;
        x.m_backend.data._M_elems[0xd] = 0;
        x.m_backend.data._M_elems[0xe] = 0;
        x.m_backend.data._M_elems[0xf] = 0;
        x.m_backend.data._M_elems[0x10] = 0;
        x.m_backend.data._M_elems[0x11] = 0;
        x.m_backend.data._M_elems[0x12] = 0;
        x.m_backend.data._M_elems[0x13] = 0;
        x.m_backend.data._M_elems[0x14] = 0;
        x.m_backend.data._M_elems[0x15] = 0;
        x.m_backend.data._M_elems[0x16] = 0;
        x.m_backend.data._M_elems[0x17] = 0;
        x.m_backend.data._M_elems[0x18] = 0;
        x.m_backend.data._M_elems[0x19] = 0;
        x.m_backend.data._M_elems._104_5_ = 0;
        x.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        x.m_backend.exp = 0;
        x.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (&x.m_backend,&bx.m_backend,
                   (cpp_dec_float<200U,_int,_void> *)
                   ((long)&(base->
                           super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).
                           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .left.val.
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar17));
        n.m_backend.fpclass = cpp_dec_float_finite;
        n.m_backend.prec_elem = 0x1c;
        n.m_backend.data._M_elems[0] = 0;
        n.m_backend.data._M_elems[1] = 0;
        n.m_backend.data._M_elems[2] = 0;
        n.m_backend.data._M_elems[3] = 0;
        n.m_backend.data._M_elems[4] = 0;
        n.m_backend.data._M_elems[5] = 0;
        n.m_backend.data._M_elems[6] = 0;
        n.m_backend.data._M_elems[7] = 0;
        n.m_backend.data._M_elems[8] = 0;
        n.m_backend.data._M_elems[9] = 0;
        n.m_backend.data._M_elems[10] = 0;
        n.m_backend.data._M_elems[0xb] = 0;
        n.m_backend.data._M_elems[0xc] = 0;
        n.m_backend.data._M_elems[0xd] = 0;
        n.m_backend.data._M_elems[0xe] = 0;
        n.m_backend.data._M_elems[0xf] = 0;
        n.m_backend.data._M_elems[0x10] = 0;
        n.m_backend.data._M_elems[0x11] = 0;
        n.m_backend.data._M_elems[0x12] = 0;
        n.m_backend.data._M_elems[0x13] = 0;
        n.m_backend.data._M_elems[0x14] = 0;
        n.m_backend.data._M_elems[0x15] = 0;
        n.m_backend.data._M_elems[0x16] = 0;
        n.m_backend.data._M_elems[0x17] = 0;
        n.m_backend.data._M_elems[0x18] = 0;
        n.m_backend.data._M_elems[0x19] = 0;
        n.m_backend.data._M_elems._104_5_ = 0;
        n.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        n.m_backend.exp = 0;
        n.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_add_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (&n.m_backend,&r_bounded.m_backend,&x.m_backend);
        pnVar1 = (this->rowWeight).data.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pcVar9 = &n.m_backend;
        puVar15 = (uint *)((long)&pnVar1[-1].m_backend.data + lVar17);
        for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
          *puVar15 = (pcVar9->data)._M_elems[0];
          pcVar9 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar9 + (ulong)bVar19 * -8 + 4);
          puVar15 = puVar15 + (ulong)bVar19 * -2 + 1;
        }
        *(int *)((long)&(pnVar1->m_backend).data + lVar17 + -0x10) = n.m_backend.exp;
        *(bool *)((long)&(pnVar1->m_backend).data + lVar17 + -0xc) = n.m_backend.neg;
        *(undefined8 *)((long)&(pnVar1->m_backend).data + lVar17 + -8) = n.m_backend._120_8_;
        (this->rowRight).data[uVar16 - 1] = false;
      }
      lVar17 = lVar17 + -0x80;
    }
  }
  return;
}

Assistant:

void SPxWeightST<R>::setupWeights(SPxSolverBase<R>& base)
{
   const VectorBase<R>& obj  = base.maxObj();
   const VectorBase<R>& low  = base.lower();
   const VectorBase<R>& up   = base.upper();
   const VectorBase<R>& rhs  = base.rhs();
   const VectorBase<R>& lhs  = base.lhs();
   int    i;

   R eps    = base.epsilon();
   R maxabs = 1.0;

   // find absolut biggest entry in bounds and left-/right hand side
   for(i = 0; i < base.nCols(); i++)
   {
      if((up[i] < R(infinity)) && (spxAbs(up[i]) > maxabs))
         maxabs = spxAbs(up[i]);

      if((low[i] > R(-infinity)) && (spxAbs(low[i]) > maxabs))
         maxabs = spxAbs(low[i]);
   }

   for(i = 0; i < base.nRows(); i++)
   {
      if((rhs[i] < R(infinity)) && (spxAbs(rhs[i]) > maxabs))
         maxabs = spxAbs(rhs[i]);

      if((lhs[i] > R(-infinity)) && (spxAbs(lhs[i]) > maxabs))
         maxabs = spxAbs(lhs[i]);
   }

   /**@todo The comments are wrong. The first is for dual simplex and
    *       the secound for primal one. Is anything else wrong?
    *       Also the values are nearly the same for both cases.
    *       Should this be ? Changed the values for
    *       r_fixed to 0 because of maros-r7. It is not clear why
    *       this makes a difference because all constraints in that
    *       instance are of equality type.
    *       Why is rowRight sometimes not set?
    */
   if(base.rep() * base.type() > 0)             // primal simplex
   {
      const R ax            = 1e-3 / obj.maxAbs();
      const R bx            = 1.0 / maxabs;
      const R nne           = ax / base.nRows();  // 1e-4 * ax;
      const R c_fixed       = 1e+5;
      const R r_fixed       = 0; // TK20010103: was 1e+4 (maros-r7)
      const R c_dbl_bounded = 1e+1;
      const R r_dbl_bounded = 0;
      const R c_bounded     = 1e+1;
      const R r_bounded     = 0;
      const R c_free        = -1e+4;
      const R r_free        = -1e+5;

      for(i = base.nCols() - 1; i >= 0; i--)
      {
         R n = nne * (base.colVector(i).size() - 1); // very small value that is zero for col singletons
         R x = ax * obj[i]; // this is at most 1e-3, probably a lot smaller
         R u = bx * up [i]; // this is at most 1, probably a lot smaller
         R l = bx * low[i]; // this is at most 1, probably a lot smaller

         if(up[i] < R(infinity))
         {
            if(spxAbs(low[i] - up[i]) < eps)
               colWeight[i] = c_fixed + n + spxAbs(x);
            else if(low[i] > R(-infinity))
            {
               colWeight[i] = c_dbl_bounded + l - u + n;

               l = spxAbs(l);
               u = spxAbs(u);

               if(u < l)
               {
                  colUp[i]      = true;
                  colWeight[i] += x;
               }
               else
               {
                  colUp[i]      = false;
                  colWeight[i] -= x;
               }
            }
            else
            {
               colWeight[i] = c_bounded - u + x + n;
               colUp[i]     = true;
            }
         }
         else
         {
            if(low[i] > R(-infinity))
            {
               colWeight[i] = c_bounded + l + n - x;
               colUp[i]     = false;
            }
            else
            {
               colWeight[i] = c_free + n - spxAbs(x);
            }
         }
      }

      for(i = base.nRows() - 1; i >= 0; i--)
      {
         if(rhs[i] < R(infinity))
         {
            if(spxAbs(lhs[i] - rhs[i]) < eps)
            {
               rowWeight[i] = r_fixed;
            }
            else if(lhs[i] > R(-infinity))
            {
               R u = bx * rhs[i];
               R l = bx * lhs[i];

               rowWeight[i] = r_dbl_bounded + l - u;
               rowRight[i]  = spxAbs(u) < spxAbs(l);
            }
            else
            {
               rowWeight[i] = r_bounded - bx * rhs[i];
               rowRight[i]  = true;
            }
         }
         else
         {
            if(lhs[i] > R(-infinity))
            {
               rowWeight[i] = r_bounded + bx * lhs[i];
               rowRight[i]  = false;
            }
            else
            {
               rowWeight[i] = r_free;
            }
         }
      }
   }
   else
   {
      assert(base.rep() * base.type() < 0);           // dual simplex

      const R ax            = 1.0  / obj.maxAbs();
      const R bx            = 1e-2 / maxabs;
      const R nne           = 1e-4 * bx;
      const R c_fixed       = 1e+5;
      const R r_fixed       = 1e+4;
      const R c_dbl_bounded = 1;
      const R r_dbl_bounded = 0;
      const R c_bounded     = 0;
      const R r_bounded     = 0;
      const R c_free        = -1e+4;
      const R r_free        = -1e+5;

      for(i = base.nCols() - 1; i >= 0; i--)
      {
         R n = nne * (base.colVector(i).size() - 1);
         R x = ax  * obj[i];
         R u = bx  * up [i];
         R l = bx  * low[i];

         if(up[i] < R(infinity))
         {
            if(spxAbs(low[i] - up[i]) < eps)
               colWeight[i] = c_fixed + n + spxAbs(x);
            else if(low[i] > R(-infinity))
            {
               if(x > 0)
               {
                  colWeight[i] = c_dbl_bounded + x - u + n;
                  colUp[i]     = true;
               }
               else
               {
                  colWeight[i] = c_dbl_bounded - x + l + n;
                  colUp[i]     = false;
               }
            }
            else
            {
               colWeight[i] = c_bounded - u + x + n;
               colUp[i]     = true;
            }
         }
         else
         {
            if(low[i] > R(-infinity))
            {
               colWeight[i] = c_bounded - x + l + n;
               colUp[i]     = false;
            }
            else
               colWeight[i] = c_free + n - spxAbs(x);
         }
      }

      for(i = base.nRows() - 1; i >= 0; i--)
      {
         const R len1 = 1; // (base.rowVector(i).length() + base.epsilon());
         R n    = 0;  // nne * (base.rowVector(i).size() - 1);
         R u    = bx * len1 * rhs[i];
         R l    = bx * len1 * lhs[i];
         R x    = ax * len1 * (obj * base.rowVector(i));

         if(rhs[i] < R(infinity))
         {
            if(spxAbs(lhs[i] - rhs[i]) < eps)
               rowWeight[i] = r_fixed + n + spxAbs(x);
            else if(lhs[i] > R(-infinity))
            {
               if(x > 0)
               {
                  rowWeight[i] = r_dbl_bounded + x - u + n;
                  rowRight[i]  = true;
               }
               else
               {
                  rowWeight[i] = r_dbl_bounded - x + l + n;
                  rowRight[i]  = false;
               }
            }
            else
            {
               rowWeight[i] = r_bounded - u + n + x;
               rowRight[i]  = true;
            }
         }
         else
         {
            if(lhs[i] > R(-infinity))
            {
               rowWeight[i] = r_bounded + l + n - x;
               rowRight[i]  = false;
            }
            else
            {
               rowWeight[i] = r_free + n - spxAbs(x);
            }
         }
      }
   }

   SPX_DEBUG(
   {
      for(i = 0; i < base.nCols(); i++)
         std::cout << "C i= " << i
                   << " up= " << colUp[i]
                   << " w= " << colWeight[i]
                   << std::endl;
      for(i = 0; i < base.nRows(); i++)
         std::cout << "R i= " << i
                   << " rr= " << rowRight[i]
                   << " w= " << rowWeight[i]
                   << std::endl;
   })
}